

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_avx512::forward
          (BinaryOp_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  uint uVar3;
  Mat *this_00;
  _func_int **pp_Var4;
  size_t sVar5;
  Allocator *pAVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  undefined1 (*pauVar39) [64];
  float *pfVar40;
  int iVar41;
  undefined1 (*pauVar42) [64];
  float *pfVar43;
  uint uVar44;
  __m512 *pafVar45;
  undefined1 (*pauVar46) [32];
  undefined1 (*pauVar47) [16];
  long lVar48;
  Mat *pMVar49;
  undefined1 (*pauVar50) [64];
  float *pfVar51;
  undefined1 (*pauVar52) [32];
  undefined1 (*pauVar53) [16];
  Mat *b;
  __m512 *pafVar54;
  ulong uVar55;
  Mat *a;
  ulong uVar56;
  int y;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  size_t sVar60;
  ulong uVar61;
  uint uVar62;
  int z_2;
  ulong uVar63;
  ulong uVar64;
  __m512 *pafVar65;
  long lVar66;
  long lVar67;
  ulong uVar68;
  void *pvVar69;
  int y_32;
  uint uVar70;
  undefined8 *puVar71;
  undefined1 (*pauVar72) [32];
  long lVar73;
  undefined1 (*pauVar74) [16];
  void *pvVar75;
  bool bVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  __m512 afVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined8 uVar111;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined1 auVar110 [56];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined8 uVar108;
  undefined8 uVar109;
  undefined8 uVar112;
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  float in_register_0000125c;
  __m128 afVar117;
  binary_op_pow op;
  __m512 _p1;
  __m512 _a0;
  binary_op_pow local_161;
  Mat *local_160;
  __m512 *local_158;
  __m512 *local_150;
  __m512 *local_148;
  Mat *local_140;
  size_t local_138;
  undefined8 local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  size_t local_108;
  __m512 local_100;
  __m512 local_c0;
  size_t local_80;
  
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  b = a + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar34 = a->elempack;
  uVar35 = a[1].elempack;
  pp_Var4 = this->_vptr_BinaryOp_x86_avx512;
  local_160 = a;
  local_140 = b;
  if (uVar35 != 0x10 && iVar34 != 0x10) {
switchD_0037553d_default:
    if (uVar35 != 8 && iVar34 != 8) {
switchD_0037569f_default:
      if (uVar35 != 4 && iVar34 != 4) {
switchD_0037581f_default:
        iVar34 = BinaryOp::forward((BinaryOp *)
                                   ((long)&this->_vptr_BinaryOp_x86_avx512 + (long)pp_Var4[-3]),
                                   bottom_blobs,top_blobs,opt);
        return iVar34;
      }
      switch(*(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3])) {
      case 0:
        if (3 < a->dims - 1U) {
          return 0;
        }
        local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
        uVar57 = a->w;
        uVar70 = a->h;
        uVar58 = a->d;
        uVar44 = a->c;
        local_158 = (__m512 *)(ulong)uVar44;
        local_138 = CONCAT44(local_138._4_4_,uVar70 * uVar57 * uVar58);
        sVar60 = a->elemsize;
        uVar62 = a[1].w;
        uVar37 = a[1].h;
        uVar59 = a[1].d;
        uVar3 = a[1].c;
        local_148 = (__m512 *)(ulong)uVar3;
        local_130 = (Option *)CONCAT44(local_130._4_4_,uVar37 * uVar62 * uVar59);
        sVar5 = a[1].elemsize;
        switch(a->dims) {
        case 1:
          if (iVar34 != 1 || uVar57 != 1) {
            switch(a[1].dims) {
            case 1:
              goto switchD_00375756_caseD_1;
            case 2:
              Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
              pfVar40 = (float *)this_00->data;
              if (pfVar40 == (float *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                pfVar51 = (float *)local_160->data;
                pfVar43 = (float *)local_160[1].data;
                if ((int)uVar62 < 1) {
                  uVar62 = 0;
                }
                if ((int)uVar37 < 1) {
                  uVar37 = 0;
                }
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  fVar2 = *pfVar51;
                  fVar20 = pfVar51[1];
                  fVar21 = pfVar51[2];
                  fVar22 = pfVar51[3];
                  uVar57 = uVar62;
                  while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                    fVar23 = pfVar43[1];
                    fVar24 = pfVar43[2];
                    fVar25 = pfVar43[3];
                    *pfVar40 = fVar2 + *pfVar43;
                    pfVar40[1] = fVar20 + fVar23;
                    pfVar40[2] = fVar21 + fVar24;
                    pfVar40[3] = fVar22 + fVar25;
                    pfVar43 = pfVar43 + 4;
                    pfVar40 = pfVar40 + 4;
                  }
                  pfVar51 = pfVar51 + 4;
                }
                return 0;
              }
              return -100;
            case 3:
              Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)local_130 & 0xffffffff;
                if ((int)(uint)local_130 < 1) {
                  uVar68 = uVar64;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  sVar60 = local_160[1].cstep;
                  sVar5 = local_160[1].elemsize;
                  pfVar40 = (float *)((long)local_160->data + uVar64 * 0x10);
                  fVar2 = *pfVar40;
                  fVar20 = pfVar40[1];
                  fVar21 = pfVar40[2];
                  fVar22 = pfVar40[3];
                  pvVar9 = local_160[1].data;
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar69 = this_00->data;
                  lVar48 = 0;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                    fVar23 = pfVar40[1];
                    fVar24 = pfVar40[2];
                    fVar25 = pfVar40[3];
                    pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                    *pfVar51 = fVar2 + *pfVar40;
                    pfVar51[1] = fVar20 + fVar23;
                    pfVar51[2] = fVar21 + fVar24;
                    pfVar51[3] = fVar22 + fVar25;
                    lVar48 = lVar48 + 0x10;
                  }
                }
                return 0;
              }
              return -100;
            case 4:
              Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)local_130 & 0xffffffff;
                if ((int)(uint)local_130 < 1) {
                  uVar68 = uVar64;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  sVar60 = local_160[1].cstep;
                  sVar5 = local_160[1].elemsize;
                  pfVar40 = (float *)((long)local_160->data + uVar64 * 0x10);
                  fVar2 = *pfVar40;
                  fVar20 = pfVar40[1];
                  fVar21 = pfVar40[2];
                  fVar22 = pfVar40[3];
                  pvVar9 = local_160[1].data;
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar69 = this_00->data;
                  lVar48 = 0;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                    fVar23 = pfVar40[1];
                    fVar24 = pfVar40[2];
                    fVar25 = pfVar40[3];
                    pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                    *pfVar51 = fVar2 + *pfVar40;
                    pfVar51[1] = fVar20 + fVar23;
                    pfVar51[2] = fVar21 + fVar24;
                    pfVar51[3] = fVar22 + fVar25;
                    lVar48 = lVar48 + 0x10;
                  }
                }
                return 0;
              }
              return -100;
            default:
              return 0;
            }
          }
LAB_003758b0:
          local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
          iVar34 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                             (a,b,this_00,opt);
          return iVar34;
        case 2:
          pAVar6 = opt->blob_allocator;
          if (a[1].dims == 3) {
            Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           ((long)local_160->w * uVar64 * local_160->elemsize +
                           (long)local_160->data);
                pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                   (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  auVar77 = *pauVar47;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    fVar2 = pfVar40[1];
                    fVar20 = pfVar40[2];
                    fVar21 = pfVar40[3];
                    *pfVar51 = auVar77._0_4_ + *pfVar40;
                    pfVar51[1] = auVar77._4_4_ + fVar2;
                    pfVar51[2] = auVar77._8_4_ + fVar20;
                    pfVar51[3] = auVar77._12_4_ + fVar21;
                    pfVar40 = pfVar40 + 4;
                    pfVar51 = pfVar51 + 4;
                  }
                  pauVar47 = pauVar47 + 1;
                }
              }
              return 0;
            }
            return -100;
          }
          if (a[1].dims == 4) {
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           ((long)local_160->w * uVar64 * local_160->elemsize +
                           (long)local_160->data);
                pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                   (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                  auVar77 = *pauVar47;
                  for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                    while ((int)uVar55 != 0) {
                      fVar2 = pfVar40[1];
                      fVar20 = pfVar40[2];
                      fVar21 = pfVar40[3];
                      *pfVar51 = auVar77._0_4_ + *pfVar40;
                      pfVar51[1] = auVar77._4_4_ + fVar2;
                      pfVar51[2] = auVar77._8_4_ + fVar20;
                      pfVar51[3] = auVar77._12_4_ + fVar21;
                      pfVar40 = pfVar40 + 4;
                      pfVar51 = pfVar51 + 4;
                      uVar55 = (ulong)((int)uVar55 - 1);
                    }
                  }
                  pauVar47 = pauVar47 + 1;
                }
              }
              return 0;
            }
            return -100;
          }
          local_118 = CONCAT44(local_118._4_4_,uVar35);
          Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar34 = local_160[1].dims;
          if (iVar34 == 1) {
            Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
            pfVar40 = (float *)this_00->data;
            if (pfVar40 == (float *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_118 != 1 || local_160[1].w != 1) {
              pfVar51 = (float *)local_160->data;
              pfVar43 = (float *)local_160[1].data;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                fVar2 = *pfVar43;
                fVar20 = pfVar43[1];
                fVar21 = pfVar43[2];
                fVar22 = pfVar43[3];
                uVar58 = uVar57;
                while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                  fVar23 = pfVar51[1];
                  fVar24 = pfVar51[2];
                  fVar25 = pfVar51[3];
                  *pfVar40 = fVar2 + *pfVar51;
                  pfVar40[1] = fVar20 + fVar23;
                  pfVar40[2] = fVar21 + fVar24;
                  pfVar40[3] = fVar22 + fVar25;
                  pfVar51 = pfVar51 + 4;
                  pfVar40 = pfVar40 + 4;
                }
                pfVar43 = pfVar43 + 4;
              }
              return 0;
            }
LAB_00385822:
            iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                               (local_160,local_140,this_00,opt);
            return iVar34;
          }
          break;
        case 3:
          if (a[1].dims != 3) {
            if (a[1].dims == 4) {
              Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)uVar62;
                if ((int)uVar62 < 1) {
                  uVar68 = uVar64;
                }
                if ((int)uVar37 < 1) {
                  uVar37 = 0;
                }
                if ((int)uVar59 < 1) {
                  uVar59 = 0;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  pauVar47 = (undefined1 (*) [16])
                             (local_160->cstep * uVar64 * local_160->elemsize +
                             (long)local_160->data);
                  pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                     (long)local_160[1].data);
                  pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize +
                                     (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                    for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                      auVar77 = *pauVar47;
                      uVar55 = uVar68;
                      while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                        fVar2 = pfVar40[1];
                        fVar20 = pfVar40[2];
                        fVar21 = pfVar40[3];
                        *pfVar51 = auVar77._0_4_ + *pfVar40;
                        pfVar51[1] = auVar77._4_4_ + fVar2;
                        pfVar51[2] = auVar77._8_4_ + fVar20;
                        pfVar51[3] = auVar77._12_4_ + fVar21;
                        pfVar40 = pfVar40 + 4;
                        pfVar51 = pfVar51 + 4;
                      }
                      pauVar47 = pauVar47 + 1;
                    }
                  }
                }
                return 0;
              }
              return -100;
            }
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (local_160[1].dims != 1) {
              if (local_160[1].dims == 2) {
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = 0;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = 0;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if ((int)local_158 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                     (long)local_160->data);
                  pauVar47 = (undefined1 (*) [16])
                             ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                     (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                    auVar77 = *pauVar47;
                    uVar58 = uVar57;
                    while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                      fVar2 = pfVar40[1];
                      fVar20 = pfVar40[2];
                      fVar21 = pfVar40[3];
                      *pfVar51 = auVar77._0_4_ + *pfVar40;
                      pfVar51[1] = auVar77._4_4_ + fVar2;
                      pfVar51[2] = auVar77._8_4_ + fVar20;
                      pfVar51[3] = auVar77._12_4_ + fVar21;
                      pfVar40 = pfVar40 + 4;
                      pfVar51 = pfVar51 + 4;
                    }
                    pauVar47 = pauVar47 + 1;
                  }
                }
                return 0;
              }
              return 0;
            }
            if (uVar35 != 1 || local_160[1].w != 1) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                pfVar40 = (float *)((long)local_160[1].data + uVar68 * 0x10);
                fVar2 = *pfVar40;
                fVar20 = pfVar40[1];
                fVar21 = pfVar40[2];
                fVar22 = pfVar40[3];
                pvVar9 = local_160->data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68);
                  fVar23 = pfVar40[1];
                  fVar24 = pfVar40[2];
                  fVar25 = pfVar40[3];
                  pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68);
                  *pfVar51 = fVar2 + *pfVar40;
                  pfVar51[1] = fVar20 + fVar23;
                  pfVar51[2] = fVar21 + fVar24;
                  pfVar51[3] = fVar22 + fVar25;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            goto LAB_00385822;
          }
          uVar58 = uVar3 ^ uVar44;
          if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = local_138 & 0xffffffff;
              if ((int)local_138 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = this_00->cstep;
                sVar5 = local_160->cstep;
                sVar7 = local_160->elemsize;
                pvVar9 = local_160->data;
                pfVar40 = (float *)((long)local_160[1].data +
                                   local_160[1].cstep * uVar64 * local_160[1].elemsize);
                fVar2 = *pfVar40;
                fVar20 = pfVar40[1];
                fVar21 = pfVar40[2];
                fVar22 = pfVar40[3];
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar64);
                  fVar23 = pfVar40[1];
                  fVar24 = pfVar40[2];
                  fVar25 = pfVar40[3];
                  pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar64);
                  *pfVar51 = fVar2 + *pfVar40;
                  pfVar51[1] = fVar20 + fVar23;
                  pfVar51[2] = fVar21 + fVar24;
                  pfVar51[3] = fVar22 + fVar25;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = uVar68;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                pvVar9 = local_160[1].data;
                pvVar69 = local_160->data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar75 = this_00->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  fVar2 = *(float *)((long)pvVar9 + lVar48);
                  pfVar40 = (float *)((long)pvVar69 + lVar48 * 4 + sVar60 * sVar5 * uVar68);
                  auVar83._0_4_ = fVar2 + *pfVar40;
                  auVar83._4_4_ = fVar2 + pfVar40[1];
                  auVar83._8_4_ = fVar2 + pfVar40[2];
                  auVar83._12_4_ = fVar2 + pfVar40[3];
                  *(undefined1 (*) [16])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) =
                       auVar83;
                  lVar48 = lVar48 + 4;
                }
              }
              return 0;
            }
            return -100;
          }
          local_138 = sVar60;
          if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
            Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)local_130 & 0xffffffff;
              if ((int)(uint)local_130 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = this_00->cstep;
                sVar5 = this_00->elemsize;
                sVar7 = local_160[1].cstep;
                pvVar9 = this_00->data;
                pfVar40 = (float *)((long)local_160->data +
                                   local_160->cstep * uVar64 * local_160->elemsize);
                fVar2 = *pfVar40;
                fVar20 = pfVar40[1];
                fVar21 = pfVar40[2];
                fVar22 = pfVar40[3];
                sVar8 = local_160[1].elemsize;
                pvVar69 = local_160[1].data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  pfVar40 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                  fVar23 = pfVar40[1];
                  fVar24 = pfVar40[2];
                  fVar25 = pfVar40[3];
                  pfVar51 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                  *pfVar51 = fVar2 + *pfVar40;
                  pfVar51[1] = fVar20 + fVar23;
                  pfVar51[2] = fVar21 + fVar24;
                  pfVar51[3] = fVar22 + fVar25;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          }
          local_118 = CONCAT44(local_118._4_4_,uVar35);
          if (((uVar62 == uVar57) && (iVar34 == 1)) && ((uVar37 == uVar70 && (uVar44 == 1)))) {
            Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)(uint)local_130 < 1) {
                local_130._0_4_ = 0;
              }
              uVar64 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar64 = uVar68;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160->data;
                pvVar69 = local_160[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar75 = this_00->data;
                lVar48 = 0;
                iVar34 = (uint)local_130;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  fVar2 = *(float *)((long)pvVar9 + lVar48);
                  pfVar40 = (float *)((long)pvVar69 + lVar48 * 4 + sVar60 * sVar5 * uVar68);
                  auVar86._0_4_ = fVar2 + *pfVar40;
                  auVar86._4_4_ = fVar2 + pfVar40[1];
                  auVar86._8_4_ = fVar2 + pfVar40[2];
                  auVar86._12_4_ = fVar2 + pfVar40[3];
                  *(undefined1 (*) [16])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) =
                       auVar86;
                  lVar48 = lVar48 + 4;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              uVar64 = (ulong)uVar70;
              if ((int)uVar70 < 1) {
                uVar64 = uVar68;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar68;
              }
              for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
                pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                   (long)local_160->data);
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160[1].data;
                pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
                  auVar77 = *(undefined1 (*) [16])
                             ((long)pvVar9 + uVar55 * 0x10 + sVar60 * uVar68 * sVar5);
                  uVar35 = uVar57;
                  while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                    fVar2 = pfVar40[1];
                    fVar20 = pfVar40[2];
                    fVar21 = pfVar40[3];
                    *pfVar51 = auVar77._0_4_ + *pfVar40;
                    pfVar51[1] = auVar77._4_4_ + fVar2;
                    pfVar51[2] = auVar77._8_4_ + fVar20;
                    pfVar51[3] = auVar77._12_4_ + fVar21;
                    pfVar40 = pfVar40 + 4;
                    pfVar51 = pfVar51 + 4;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar57;
              if ((int)uVar57 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                                  (long)local_160->data);
                sVar60 = local_160[1].cstep;
                pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data
                                  );
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160[1].data;
                for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                  for (lVar48 = 0; uVar68 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                    pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                    pfVar51 = (float *)((long)pvVar69 + lVar48);
                    auVar89._0_4_ = *pfVar40 + *pfVar51;
                    auVar89._4_4_ = pfVar40[1] + pfVar51[1];
                    auVar89._8_4_ = pfVar40[2] + pfVar51[2];
                    auVar89._12_4_ = pfVar40[3] + pfVar51[3];
                    *(undefined1 (*) [16])((long)pvVar75 + lVar48) = auVar89;
                  }
                  pvVar69 = (void *)((long)pvVar69 + lVar48);
                  pvVar75 = (void *)((long)pvVar75 + lVar48);
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
            Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)uVar70;
              if ((int)uVar70 < 1) {
                uVar63 = uVar64;
              }
              uVar55 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar55 = uVar64;
              }
              for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                pvVar9 = local_160->data;
                pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                   (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
                  auVar77 = *(undefined1 (*) [16])
                             ((long)pvVar9 + uVar56 * 0x10 + sVar60 * uVar64 * sVar5);
                  uVar61 = uVar68;
                  while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    fVar2 = pfVar40[1];
                    fVar20 = pfVar40[2];
                    fVar21 = pfVar40[3];
                    *pfVar51 = auVar77._0_4_ + *pfVar40;
                    pfVar51[1] = auVar77._4_4_ + fVar2;
                    pfVar51[2] = auVar77._8_4_ + fVar20;
                    pfVar51[3] = auVar77._12_4_ + fVar21;
                    pfVar40 = pfVar40 + 4;
                    pfVar51 = pfVar51 + 4;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
            Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar57;
              if ((int)uVar57 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = local_160->cstep;
                pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                  (long)local_160[1].data);
                pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data
                                  );
                sVar5 = local_160->elemsize;
                pvVar9 = local_160->data;
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  for (lVar48 = 0; uVar68 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                    pfVar40 = (float *)((long)pvVar69 + lVar48);
                    pfVar51 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                    auVar91._0_4_ = *pfVar40 + *pfVar51;
                    auVar91._4_4_ = pfVar40[1] + pfVar51[1];
                    auVar91._8_4_ = pfVar40[2] + pfVar51[2];
                    auVar91._12_4_ = pfVar40[3] + pfVar51[3];
                    *(undefined1 (*) [16])((long)pvVar75 + lVar48) = auVar91;
                  }
                  pvVar69 = (void *)((long)pvVar69 + lVar48);
                  pvVar75 = (void *)((long)pvVar75 + lVar48);
                }
              }
              return 0;
            }
            return -100;
          }
          goto LAB_003889f9;
        case 4:
          if (a[1].dims != 4) {
            local_130 = opt;
            Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            iVar34 = local_160[1].dims;
            iVar38 = (int)local_158;
            if (iVar34 != 1) {
              if (iVar34 == 3) {
                uVar35 = 0;
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = uVar35;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = uVar35;
                }
                if ((int)uVar58 < 1) {
                  uVar58 = uVar35;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if (iVar38 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                     (long)local_160->data);
                  pauVar47 = (undefined1 (*) [16])
                             (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                     (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                    for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                      auVar77 = *pauVar47;
                      uVar62 = uVar57;
                      while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                        fVar2 = pfVar40[1];
                        fVar20 = pfVar40[2];
                        fVar21 = pfVar40[3];
                        *pfVar51 = auVar77._0_4_ + *pfVar40;
                        pfVar51[1] = auVar77._4_4_ + fVar2;
                        pfVar51[2] = auVar77._8_4_ + fVar20;
                        pfVar51[3] = auVar77._12_4_ + fVar21;
                        pfVar40 = pfVar40 + 4;
                        pfVar51 = pfVar51 + 4;
                      }
                      pauVar47 = pauVar47 + 1;
                    }
                  }
                }
                return 0;
              }
              if (iVar34 == 2) {
                uVar35 = 0;
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = uVar35;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = uVar35;
                }
                if ((int)uVar58 < 1) {
                  uVar58 = uVar35;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if (iVar38 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                     (long)local_160->data);
                  pauVar47 = (undefined1 (*) [16])
                             ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                     (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                    auVar77 = *pauVar47;
                    for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                      while (uVar62 != 0) {
                        fVar2 = pfVar40[1];
                        fVar20 = pfVar40[2];
                        fVar21 = pfVar40[3];
                        *pfVar51 = auVar77._0_4_ + *pfVar40;
                        pfVar51[1] = auVar77._4_4_ + fVar2;
                        pfVar51[2] = auVar77._8_4_ + fVar20;
                        pfVar51[3] = auVar77._12_4_ + fVar21;
                        pfVar40 = pfVar40 + 4;
                        pfVar51 = pfVar51 + 4;
                        uVar62 = uVar62 - 1;
                      }
                    }
                    pauVar47 = pauVar47 + 1;
                  }
                }
                return 0;
              }
              return 0;
            }
            opt = local_130;
            if (uVar35 != 1 || local_160[1].w != 1) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pvVar9 = this_00->data;
                pfVar40 = (float *)((long)local_160[1].data + uVar68 * 0x10);
                fVar2 = *pfVar40;
                fVar20 = pfVar40[1];
                fVar21 = pfVar40[2];
                fVar22 = pfVar40[3];
                sVar8 = local_160->elemsize;
                pvVar69 = local_160->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  pfVar40 = (float *)((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68);
                  fVar23 = pfVar40[1];
                  fVar24 = pfVar40[2];
                  fVar25 = pfVar40[3];
                  pfVar51 = (float *)((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68);
                  *pfVar51 = fVar2 + *pfVar40;
                  pfVar51[1] = fVar20 + fVar23;
                  pfVar51[2] = fVar21 + fVar24;
                  pfVar51[3] = fVar22 + fVar25;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            goto LAB_00385822;
          }
          goto LAB_0037a150;
        }
        goto LAB_0037df07;
      case 1:
        pMVar49 = b;
        b = a;
        break;
      case 2:
        if (3 < a->dims - 1U) {
          return 0;
        }
        local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
        uVar57 = a->w;
        uVar70 = a->h;
        uVar58 = a->d;
        uVar44 = a->c;
        local_158 = (__m512 *)(ulong)uVar44;
        local_138 = CONCAT44(local_138._4_4_,uVar70 * uVar57 * uVar58);
        sVar60 = a->elemsize;
        uVar62 = a[1].w;
        uVar37 = a[1].h;
        uVar59 = a[1].d;
        uVar3 = a[1].c;
        local_148 = (__m512 *)(ulong)uVar3;
        local_130 = (Option *)CONCAT44(local_130._4_4_,uVar37 * uVar62 * uVar59);
        sVar5 = a[1].elemsize;
        switch(a->dims) {
        case 1:
          if (iVar34 != 1 || uVar57 != 1) {
            switch(a[1].dims) {
            case 1:
              goto switchD_0037c555_caseD_1;
            case 2:
              Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
              pfVar40 = (float *)this_00->data;
              if (pfVar40 == (float *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                pfVar51 = (float *)local_160->data;
                pfVar43 = (float *)local_160[1].data;
                if ((int)uVar62 < 1) {
                  uVar62 = 0;
                }
                if ((int)uVar37 < 1) {
                  uVar37 = 0;
                }
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  fVar2 = *pfVar51;
                  fVar20 = pfVar51[1];
                  fVar21 = pfVar51[2];
                  fVar22 = pfVar51[3];
                  uVar57 = uVar62;
                  while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                    fVar23 = pfVar43[1];
                    fVar24 = pfVar43[2];
                    fVar25 = pfVar43[3];
                    *pfVar40 = fVar2 * *pfVar43;
                    pfVar40[1] = fVar20 * fVar23;
                    pfVar40[2] = fVar21 * fVar24;
                    pfVar40[3] = fVar22 * fVar25;
                    pfVar43 = pfVar43 + 4;
                    pfVar40 = pfVar40 + 4;
                  }
                  pfVar51 = pfVar51 + 4;
                }
                return 0;
              }
              return -100;
            case 3:
              Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)local_130 & 0xffffffff;
                if ((int)(uint)local_130 < 1) {
                  uVar68 = uVar64;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  sVar60 = local_160[1].cstep;
                  sVar5 = local_160[1].elemsize;
                  pfVar40 = (float *)((long)local_160->data + uVar64 * 0x10);
                  fVar2 = *pfVar40;
                  fVar20 = pfVar40[1];
                  fVar21 = pfVar40[2];
                  fVar22 = pfVar40[3];
                  pvVar9 = local_160[1].data;
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar69 = this_00->data;
                  lVar48 = 0;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                    fVar23 = pfVar40[1];
                    fVar24 = pfVar40[2];
                    fVar25 = pfVar40[3];
                    pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                    *pfVar51 = fVar2 * *pfVar40;
                    pfVar51[1] = fVar20 * fVar23;
                    pfVar51[2] = fVar21 * fVar24;
                    pfVar51[3] = fVar22 * fVar25;
                    lVar48 = lVar48 + 0x10;
                  }
                }
                return 0;
              }
              return -100;
            case 4:
              Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)local_130 & 0xffffffff;
                if ((int)(uint)local_130 < 1) {
                  uVar68 = uVar64;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  sVar60 = local_160[1].cstep;
                  sVar5 = local_160[1].elemsize;
                  pfVar40 = (float *)((long)local_160->data + uVar64 * 0x10);
                  fVar2 = *pfVar40;
                  fVar20 = pfVar40[1];
                  fVar21 = pfVar40[2];
                  fVar22 = pfVar40[3];
                  pvVar9 = local_160[1].data;
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar69 = this_00->data;
                  lVar48 = 0;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                    fVar23 = pfVar40[1];
                    fVar24 = pfVar40[2];
                    fVar25 = pfVar40[3];
                    pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                    *pfVar51 = fVar2 * *pfVar40;
                    pfVar51[1] = fVar20 * fVar23;
                    pfVar51[2] = fVar21 * fVar24;
                    pfVar51[3] = fVar22 * fVar25;
                    lVar48 = lVar48 + 0x10;
                  }
                }
                return 0;
              }
              return -100;
            default:
              return 0;
            }
          }
LAB_00376322:
          local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
          iVar34 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                             (a,b,this_00,opt);
          return iVar34;
        case 2:
          pAVar6 = opt->blob_allocator;
          if (a[1].dims == 3) {
            Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           ((long)local_160->w * uVar64 * local_160->elemsize +
                           (long)local_160->data);
                pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                   (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  auVar77 = *pauVar47;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    fVar2 = pfVar40[1];
                    fVar20 = pfVar40[2];
                    fVar21 = pfVar40[3];
                    *pfVar51 = auVar77._0_4_ * *pfVar40;
                    pfVar51[1] = auVar77._4_4_ * fVar2;
                    pfVar51[2] = auVar77._8_4_ * fVar20;
                    pfVar51[3] = auVar77._12_4_ * fVar21;
                    pfVar40 = pfVar40 + 4;
                    pfVar51 = pfVar51 + 4;
                  }
                  pauVar47 = pauVar47 + 1;
                }
              }
              return 0;
            }
            return -100;
          }
          if (a[1].dims == 4) {
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           ((long)local_160->w * uVar64 * local_160->elemsize +
                           (long)local_160->data);
                pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                   (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                  auVar77 = *pauVar47;
                  for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                    while ((int)uVar55 != 0) {
                      fVar2 = pfVar40[1];
                      fVar20 = pfVar40[2];
                      fVar21 = pfVar40[3];
                      *pfVar51 = auVar77._0_4_ * *pfVar40;
                      pfVar51[1] = auVar77._4_4_ * fVar2;
                      pfVar51[2] = auVar77._8_4_ * fVar20;
                      pfVar51[3] = auVar77._12_4_ * fVar21;
                      pfVar40 = pfVar40 + 4;
                      pfVar51 = pfVar51 + 4;
                      uVar55 = (ulong)((int)uVar55 - 1);
                    }
                  }
                  pauVar47 = pauVar47 + 1;
                }
              }
              return 0;
            }
            return -100;
          }
          local_118 = CONCAT44(local_118._4_4_,uVar35);
          Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar34 = local_160[1].dims;
          if (iVar34 == 1) {
            Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
            pfVar40 = (float *)this_00->data;
            if (pfVar40 == (float *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_118 != 1 || local_160[1].w != 1) {
              pfVar51 = (float *)local_160->data;
              pfVar43 = (float *)local_160[1].data;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                fVar2 = *pfVar43;
                fVar20 = pfVar43[1];
                fVar21 = pfVar43[2];
                fVar22 = pfVar43[3];
                uVar58 = uVar57;
                while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                  fVar23 = pfVar51[1];
                  fVar24 = pfVar51[2];
                  fVar25 = pfVar51[3];
                  *pfVar40 = fVar2 * *pfVar51;
                  pfVar40[1] = fVar20 * fVar23;
                  pfVar40[2] = fVar21 * fVar24;
                  pfVar40[3] = fVar22 * fVar25;
                  pfVar51 = pfVar51 + 4;
                  pfVar40 = pfVar40 + 4;
                }
                pfVar43 = pfVar43 + 4;
              }
              return 0;
            }
            goto LAB_0038571c;
          }
          break;
        case 3:
          if (a[1].dims != 3) {
            if (a[1].dims == 4) {
              Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)uVar62;
                if ((int)uVar62 < 1) {
                  uVar68 = uVar64;
                }
                if ((int)uVar37 < 1) {
                  uVar37 = 0;
                }
                if ((int)uVar59 < 1) {
                  uVar59 = 0;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  pauVar47 = (undefined1 (*) [16])
                             (local_160->cstep * uVar64 * local_160->elemsize +
                             (long)local_160->data);
                  pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                     (long)local_160[1].data);
                  pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize +
                                     (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                    for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                      auVar77 = *pauVar47;
                      uVar55 = uVar68;
                      while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                        fVar2 = pfVar40[1];
                        fVar20 = pfVar40[2];
                        fVar21 = pfVar40[3];
                        *pfVar51 = auVar77._0_4_ * *pfVar40;
                        pfVar51[1] = auVar77._4_4_ * fVar2;
                        pfVar51[2] = auVar77._8_4_ * fVar20;
                        pfVar51[3] = auVar77._12_4_ * fVar21;
                        pfVar40 = pfVar40 + 4;
                        pfVar51 = pfVar51 + 4;
                      }
                      pauVar47 = pauVar47 + 1;
                    }
                  }
                }
                return 0;
              }
              return -100;
            }
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (local_160[1].dims != 1) {
              if (local_160[1].dims == 2) {
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = 0;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = 0;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if ((int)local_158 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                     (long)local_160->data);
                  pauVar47 = (undefined1 (*) [16])
                             ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                     (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                    auVar77 = *pauVar47;
                    uVar58 = uVar57;
                    while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                      fVar2 = pfVar40[1];
                      fVar20 = pfVar40[2];
                      fVar21 = pfVar40[3];
                      *pfVar51 = auVar77._0_4_ * *pfVar40;
                      pfVar51[1] = auVar77._4_4_ * fVar2;
                      pfVar51[2] = auVar77._8_4_ * fVar20;
                      pfVar51[3] = auVar77._12_4_ * fVar21;
                      pfVar40 = pfVar40 + 4;
                      pfVar51 = pfVar51 + 4;
                    }
                    pauVar47 = pauVar47 + 1;
                  }
                }
                return 0;
              }
              return 0;
            }
            if (uVar35 != 1 || local_160[1].w != 1) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                pfVar40 = (float *)((long)local_160[1].data + uVar68 * 0x10);
                fVar2 = *pfVar40;
                fVar20 = pfVar40[1];
                fVar21 = pfVar40[2];
                fVar22 = pfVar40[3];
                pvVar9 = local_160->data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68);
                  fVar23 = pfVar40[1];
                  fVar24 = pfVar40[2];
                  fVar25 = pfVar40[3];
                  pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68);
                  *pfVar51 = fVar2 * *pfVar40;
                  pfVar51[1] = fVar20 * fVar23;
                  pfVar51[2] = fVar21 * fVar24;
                  pfVar51[3] = fVar22 * fVar25;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            goto LAB_0038571c;
          }
          uVar58 = uVar3 ^ uVar44;
          if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = local_138 & 0xffffffff;
              if ((int)local_138 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = this_00->cstep;
                sVar5 = local_160->cstep;
                sVar7 = local_160->elemsize;
                pvVar9 = local_160->data;
                pfVar40 = (float *)((long)local_160[1].data +
                                   local_160[1].cstep * uVar64 * local_160[1].elemsize);
                fVar2 = *pfVar40;
                fVar20 = pfVar40[1];
                fVar21 = pfVar40[2];
                fVar22 = pfVar40[3];
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar64);
                  fVar23 = pfVar40[1];
                  fVar24 = pfVar40[2];
                  fVar25 = pfVar40[3];
                  pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar64);
                  *pfVar51 = fVar2 * *pfVar40;
                  pfVar51[1] = fVar20 * fVar23;
                  pfVar51[2] = fVar21 * fVar24;
                  pfVar51[3] = fVar22 * fVar25;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = uVar68;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                pvVar9 = local_160[1].data;
                pvVar69 = local_160->data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar75 = this_00->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  fVar2 = *(float *)((long)pvVar9 + lVar48);
                  pfVar40 = (float *)((long)pvVar69 + lVar48 * 4 + sVar60 * sVar5 * uVar68);
                  auVar82._0_4_ = fVar2 * *pfVar40;
                  auVar82._4_4_ = fVar2 * pfVar40[1];
                  auVar82._8_4_ = fVar2 * pfVar40[2];
                  auVar82._12_4_ = fVar2 * pfVar40[3];
                  *(undefined1 (*) [16])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) =
                       auVar82;
                  lVar48 = lVar48 + 4;
                }
              }
              return 0;
            }
            return -100;
          }
          local_138 = sVar60;
          if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
            Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)local_130 & 0xffffffff;
              if ((int)(uint)local_130 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = this_00->cstep;
                sVar5 = this_00->elemsize;
                sVar7 = local_160[1].cstep;
                pvVar9 = this_00->data;
                pfVar40 = (float *)((long)local_160->data +
                                   local_160->cstep * uVar64 * local_160->elemsize);
                fVar2 = *pfVar40;
                fVar20 = pfVar40[1];
                fVar21 = pfVar40[2];
                fVar22 = pfVar40[3];
                sVar8 = local_160[1].elemsize;
                pvVar69 = local_160[1].data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  pfVar40 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                  fVar23 = pfVar40[1];
                  fVar24 = pfVar40[2];
                  fVar25 = pfVar40[3];
                  pfVar51 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                  *pfVar51 = fVar2 * *pfVar40;
                  pfVar51[1] = fVar20 * fVar23;
                  pfVar51[2] = fVar21 * fVar24;
                  pfVar51[3] = fVar22 * fVar25;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          }
          local_118 = CONCAT44(local_118._4_4_,uVar35);
          if ((((uVar62 == uVar57) && (iVar34 == 1)) && (uVar37 == uVar70)) && (uVar44 == 1)) {
            Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)(uint)local_130 < 1) {
                local_130._0_4_ = 0;
              }
              uVar64 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar64 = uVar68;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160->data;
                pvVar69 = local_160[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar75 = this_00->data;
                lVar48 = 0;
                iVar34 = (uint)local_130;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  fVar2 = *(float *)((long)pvVar9 + lVar48);
                  pfVar40 = (float *)((long)pvVar69 + lVar48 * 4 + sVar60 * sVar5 * uVar68);
                  auVar85._0_4_ = fVar2 * *pfVar40;
                  auVar85._4_4_ = fVar2 * pfVar40[1];
                  auVar85._8_4_ = fVar2 * pfVar40[2];
                  auVar85._12_4_ = fVar2 * pfVar40[3];
                  *(undefined1 (*) [16])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) =
                       auVar85;
                  lVar48 = lVar48 + 4;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              uVar64 = (ulong)uVar70;
              if ((int)uVar70 < 1) {
                uVar64 = uVar68;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar68;
              }
              for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
                pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                   (long)local_160->data);
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160[1].data;
                pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
                  auVar77 = *(undefined1 (*) [16])
                             ((long)pvVar9 + uVar55 * 0x10 + sVar60 * uVar68 * sVar5);
                  uVar35 = uVar57;
                  while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                    fVar2 = pfVar40[1];
                    fVar20 = pfVar40[2];
                    fVar21 = pfVar40[3];
                    *pfVar51 = auVar77._0_4_ * *pfVar40;
                    pfVar51[1] = auVar77._4_4_ * fVar2;
                    pfVar51[2] = auVar77._8_4_ * fVar20;
                    pfVar51[3] = auVar77._12_4_ * fVar21;
                    pfVar40 = pfVar40 + 4;
                    pfVar51 = pfVar51 + 4;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar57;
              if ((int)uVar57 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                                  (long)local_160->data);
                sVar60 = local_160[1].cstep;
                pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data
                                  );
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160[1].data;
                for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                  for (lVar48 = 0; uVar68 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                    pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                    pfVar51 = (float *)((long)pvVar69 + lVar48);
                    auVar88._0_4_ = *pfVar40 * *pfVar51;
                    auVar88._4_4_ = pfVar40[1] * pfVar51[1];
                    auVar88._8_4_ = pfVar40[2] * pfVar51[2];
                    auVar88._12_4_ = pfVar40[3] * pfVar51[3];
                    *(undefined1 (*) [16])((long)pvVar75 + lVar48) = auVar88;
                  }
                  pvVar69 = (void *)((long)pvVar69 + lVar48);
                  pvVar75 = (void *)((long)pvVar75 + lVar48);
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
            Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)uVar70;
              if ((int)uVar70 < 1) {
                uVar63 = uVar64;
              }
              uVar55 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar55 = uVar64;
              }
              for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                pvVar9 = local_160->data;
                pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                   (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
                  auVar77 = *(undefined1 (*) [16])
                             ((long)pvVar9 + uVar56 * 0x10 + sVar60 * uVar64 * sVar5);
                  uVar61 = uVar68;
                  while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    fVar2 = pfVar40[1];
                    fVar20 = pfVar40[2];
                    fVar21 = pfVar40[3];
                    *pfVar51 = auVar77._0_4_ * *pfVar40;
                    pfVar51[1] = auVar77._4_4_ * fVar2;
                    pfVar51[2] = auVar77._8_4_ * fVar20;
                    pfVar51[3] = auVar77._12_4_ * fVar21;
                    pfVar40 = pfVar40 + 4;
                    pfVar51 = pfVar51 + 4;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
            Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar57;
              if ((int)uVar57 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = local_160->cstep;
                pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                  (long)local_160[1].data);
                pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data
                                  );
                sVar5 = local_160->elemsize;
                pvVar9 = local_160->data;
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  for (lVar48 = 0; uVar68 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                    pfVar40 = (float *)((long)pvVar69 + lVar48);
                    pfVar51 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                    auVar90._0_4_ = *pfVar40 * *pfVar51;
                    auVar90._4_4_ = pfVar40[1] * pfVar51[1];
                    auVar90._8_4_ = pfVar40[2] * pfVar51[2];
                    auVar90._12_4_ = pfVar40[3] * pfVar51[3];
                    *(undefined1 (*) [16])((long)pvVar75 + lVar48) = auVar90;
                  }
                  pvVar69 = (void *)((long)pvVar69 + lVar48);
                  pvVar75 = (void *)((long)pvVar75 + lVar48);
                }
              }
              return 0;
            }
            return -100;
          }
          goto LAB_003888f1;
        case 4:
          if (a[1].dims != 4) {
            local_130 = opt;
            Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            iVar34 = local_160[1].dims;
            iVar38 = (int)local_158;
            if (iVar34 != 1) {
              if (iVar34 == 3) {
                uVar35 = 0;
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = uVar35;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = uVar35;
                }
                if ((int)uVar58 < 1) {
                  uVar58 = uVar35;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if (iVar38 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                     (long)local_160->data);
                  pauVar47 = (undefined1 (*) [16])
                             (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                     (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                    for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                      auVar77 = *pauVar47;
                      uVar62 = uVar57;
                      while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                        fVar2 = pfVar40[1];
                        fVar20 = pfVar40[2];
                        fVar21 = pfVar40[3];
                        *pfVar51 = auVar77._0_4_ * *pfVar40;
                        pfVar51[1] = auVar77._4_4_ * fVar2;
                        pfVar51[2] = auVar77._8_4_ * fVar20;
                        pfVar51[3] = auVar77._12_4_ * fVar21;
                        pfVar40 = pfVar40 + 4;
                        pfVar51 = pfVar51 + 4;
                      }
                      pauVar47 = pauVar47 + 1;
                    }
                  }
                }
                return 0;
              }
              if (iVar34 == 2) {
                uVar35 = 0;
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = uVar35;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = uVar35;
                }
                if ((int)uVar58 < 1) {
                  uVar58 = uVar35;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if (iVar38 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                     (long)local_160->data);
                  pauVar47 = (undefined1 (*) [16])
                             ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                     (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                    auVar77 = *pauVar47;
                    for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                      while (uVar62 != 0) {
                        fVar2 = pfVar40[1];
                        fVar20 = pfVar40[2];
                        fVar21 = pfVar40[3];
                        *pfVar51 = auVar77._0_4_ * *pfVar40;
                        pfVar51[1] = auVar77._4_4_ * fVar2;
                        pfVar51[2] = auVar77._8_4_ * fVar20;
                        pfVar51[3] = auVar77._12_4_ * fVar21;
                        pfVar40 = pfVar40 + 4;
                        pfVar51 = pfVar51 + 4;
                        uVar62 = uVar62 - 1;
                      }
                    }
                    pauVar47 = pauVar47 + 1;
                  }
                }
                return 0;
              }
              return 0;
            }
            opt = local_130;
            if (uVar35 != 1 || local_160[1].w != 1) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pvVar9 = this_00->data;
                pfVar40 = (float *)((long)local_160[1].data + uVar68 * 0x10);
                fVar2 = *pfVar40;
                fVar20 = pfVar40[1];
                fVar21 = pfVar40[2];
                fVar22 = pfVar40[3];
                sVar8 = local_160->elemsize;
                pvVar69 = local_160->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  pfVar40 = (float *)((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68);
                  fVar23 = pfVar40[1];
                  fVar24 = pfVar40[2];
                  fVar25 = pfVar40[3];
                  pfVar51 = (float *)((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68);
                  *pfVar51 = fVar2 * *pfVar40;
                  pfVar51[1] = fVar20 * fVar23;
                  pfVar51[2] = fVar21 * fVar24;
                  pfVar51[3] = fVar22 * fVar25;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            goto LAB_0038571c;
          }
          goto LAB_00379f1d;
        }
        goto LAB_0037dd91;
      case 3:
        pMVar49 = b;
        b = a;
        goto LAB_003764ce;
      case 4:
        if (3 < a->dims - 1U) {
          return 0;
        }
        local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
        uVar57 = a->w;
        uVar70 = a->h;
        uVar58 = a->d;
        uVar44 = a->c;
        local_158 = (__m512 *)(ulong)uVar44;
        local_138 = CONCAT44(local_138._4_4_,uVar70 * uVar57 * uVar58);
        sVar60 = a->elemsize;
        uVar62 = a[1].w;
        uVar37 = a[1].h;
        uVar59 = a[1].d;
        uVar3 = a[1].c;
        local_148 = (__m512 *)(ulong)uVar3;
        local_130 = (Option *)CONCAT44(local_130._4_4_,uVar37 * uVar62 * uVar59);
        sVar5 = a[1].elemsize;
        switch(a->dims) {
        case 1:
          if (iVar34 != 1 || uVar57 != 1) {
            switch(a[1].dims) {
            case 1:
              goto switchD_0037c3a0_caseD_1;
            case 2:
              Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
              pauVar47 = (undefined1 (*) [16])this_00->data;
              if (pauVar47 == (undefined1 (*) [16])0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                pauVar74 = (undefined1 (*) [16])local_160->data;
                pauVar53 = (undefined1 (*) [16])local_160[1].data;
                if ((int)uVar62 < 1) {
                  uVar62 = 0;
                }
                if ((int)uVar37 < 1) {
                  uVar37 = 0;
                }
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  auVar77 = *pauVar74;
                  uVar57 = uVar62;
                  while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                    auVar10 = vmaxps_avx(auVar77,*pauVar53);
                    *pauVar47 = auVar10;
                    pauVar53 = pauVar53 + 1;
                    pauVar47 = pauVar47 + 1;
                  }
                  pauVar74 = pauVar74 + 1;
                }
                return 0;
              }
              return -100;
            case 3:
              Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)local_130 & 0xffffffff;
                if ((int)(uint)local_130 < 1) {
                  uVar68 = uVar64;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  sVar60 = local_160[1].cstep;
                  sVar5 = local_160[1].elemsize;
                  auVar77 = *(undefined1 (*) [16])((long)local_160->data + uVar64 * 0x10);
                  pvVar9 = local_160[1].data;
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar69 = this_00->data;
                  lVar48 = 0;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar10 = vmaxps_avx(auVar77,*(undefined1 (*) [16])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                    ;
                    *(undefined1 (*) [16])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) =
                         auVar10;
                    lVar48 = lVar48 + 0x10;
                  }
                }
                return 0;
              }
              return -100;
            case 4:
              Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)local_130 & 0xffffffff;
                if ((int)(uint)local_130 < 1) {
                  uVar68 = uVar64;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  sVar60 = local_160[1].cstep;
                  sVar5 = local_160[1].elemsize;
                  auVar77 = *(undefined1 (*) [16])((long)local_160->data + uVar64 * 0x10);
                  pvVar9 = local_160[1].data;
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar69 = this_00->data;
                  lVar48 = 0;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar10 = vmaxps_avx(auVar77,*(undefined1 (*) [16])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                    ;
                    *(undefined1 (*) [16])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) =
                         auVar10;
                    lVar48 = lVar48 + 0x10;
                  }
                }
                return 0;
              }
              return -100;
            default:
              return 0;
            }
          }
LAB_00376277:
          local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
          iVar34 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                             (a,b,this_00,opt);
          return iVar34;
        case 2:
          pAVar6 = opt->blob_allocator;
          if (a[1].dims == 3) {
            Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           ((long)local_160->w * uVar64 * local_160->elemsize +
                           (long)local_160->data);
                pauVar74 = (undefined1 (*) [16])
                           (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  auVar77 = *pauVar47;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar10 = vmaxps_avx(auVar77,*pauVar74);
                    *pauVar53 = auVar10;
                    pauVar74 = pauVar74 + 1;
                    pauVar53 = pauVar53 + 1;
                  }
                  pauVar47 = pauVar47 + 1;
                }
              }
              return 0;
            }
            return -100;
          }
          if (a[1].dims == 4) {
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           ((long)local_160->w * uVar64 * local_160->elemsize +
                           (long)local_160->data);
                pauVar74 = (undefined1 (*) [16])
                           (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                  auVar77 = *pauVar47;
                  for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                    while ((int)uVar55 != 0) {
                      auVar10 = vmaxps_avx(auVar77,*pauVar74);
                      *pauVar53 = auVar10;
                      pauVar74 = pauVar74 + 1;
                      pauVar53 = pauVar53 + 1;
                      uVar55 = (ulong)((int)uVar55 - 1);
                    }
                  }
                  pauVar47 = pauVar47 + 1;
                }
              }
              return 0;
            }
            return -100;
          }
          local_118 = CONCAT44(local_118._4_4_,uVar35);
          Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar34 = local_160[1].dims;
          if (iVar34 == 1) {
            Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
            pauVar47 = (undefined1 (*) [16])this_00->data;
            if (pauVar47 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_118 != 1 || local_160[1].w != 1) {
              pauVar74 = (undefined1 (*) [16])local_160->data;
              pauVar53 = (undefined1 (*) [16])local_160[1].data;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                auVar77 = *pauVar53;
                uVar58 = uVar57;
                while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                  auVar10 = vmaxps_avx(auVar77,*pauVar74);
                  *pauVar47 = auVar10;
                  pauVar74 = pauVar74 + 1;
                  pauVar47 = pauVar47 + 1;
                }
                pauVar53 = pauVar53 + 1;
              }
              return 0;
            }
            goto LAB_00385589;
          }
          break;
        case 3:
          if (a[1].dims != 3) {
            if (a[1].dims == 4) {
              Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)uVar62;
                if ((int)uVar62 < 1) {
                  uVar68 = uVar64;
                }
                if ((int)uVar37 < 1) {
                  uVar37 = 0;
                }
                if ((int)uVar59 < 1) {
                  uVar59 = 0;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  pauVar47 = (undefined1 (*) [16])
                             (local_160->cstep * uVar64 * local_160->elemsize +
                             (long)local_160->data);
                  pauVar74 = (undefined1 (*) [16])
                             (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                    for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                      auVar77 = *pauVar47;
                      uVar55 = uVar68;
                      while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                        auVar10 = vmaxps_avx(auVar77,*pauVar74);
                        *pauVar53 = auVar10;
                        pauVar74 = pauVar74 + 1;
                        pauVar53 = pauVar53 + 1;
                      }
                      pauVar47 = pauVar47 + 1;
                    }
                  }
                }
                return 0;
              }
              return -100;
            }
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (local_160[1].dims != 1) {
              if (local_160[1].dims == 2) {
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = 0;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = 0;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if ((int)local_158 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pauVar47 = (undefined1 (*) [16])
                             (local_160->cstep * uVar68 * local_160->elemsize +
                             (long)local_160->data);
                  pauVar74 = (undefined1 (*) [16])
                             ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                    auVar77 = *pauVar74;
                    uVar58 = uVar57;
                    while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                      auVar10 = vmaxps_avx(auVar77,*pauVar47);
                      *pauVar53 = auVar10;
                      pauVar47 = pauVar47 + 1;
                      pauVar53 = pauVar53 + 1;
                    }
                    pauVar74 = pauVar74 + 1;
                  }
                }
                return 0;
              }
              return 0;
            }
            if (uVar35 != 1 || local_160[1].w != 1) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                auVar77 = *(undefined1 (*) [16])((long)local_160[1].data + uVar68 * 0x10);
                pvVar9 = local_160->data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  auVar10 = vmaxps_avx(auVar77,*(undefined1 (*) [16])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68));
                  *(undefined1 (*) [16])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68) = auVar10;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            goto LAB_00385589;
          }
          uVar58 = uVar3 ^ uVar44;
          if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = local_138 & 0xffffffff;
              if ((int)local_138 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = this_00->cstep;
                sVar5 = local_160->cstep;
                sVar7 = local_160->elemsize;
                pvVar9 = local_160->data;
                auVar77 = *(undefined1 (*) [16])
                           ((long)local_160[1].data +
                           local_160[1].cstep * uVar64 * local_160[1].elemsize);
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar10 = vmaxps_avx(auVar77,*(undefined1 (*) [16])
                                                ((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar64));
                  *(undefined1 (*) [16])((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar64) = auVar10
                  ;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = uVar68;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                pvVar9 = local_160[1].data;
                pvVar69 = local_160->data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar75 = this_00->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  uVar1 = *(undefined4 *)((long)pvVar9 + lVar48);
                  auVar12._4_4_ = uVar1;
                  auVar12._0_4_ = uVar1;
                  auVar12._8_4_ = uVar1;
                  auVar12._12_4_ = uVar1;
                  auVar77 = vmaxps_avx512vl(*(undefined1 (*) [16])
                                             ((long)pvVar69 + lVar48 * 4 + sVar60 * sVar5 * uVar68),
                                            auVar12);
                  *(undefined1 (*) [16])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) =
                       auVar77;
                  lVar48 = lVar48 + 4;
                }
              }
              return 0;
            }
            return -100;
          }
          local_138 = sVar60;
          if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
            Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)local_130 & 0xffffffff;
              if ((int)(uint)local_130 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = this_00->cstep;
                sVar5 = this_00->elemsize;
                sVar7 = local_160[1].cstep;
                pvVar9 = this_00->data;
                auVar77 = *(undefined1 (*) [16])
                           ((long)local_160->data + local_160->cstep * uVar64 * local_160->elemsize)
                ;
                sVar8 = local_160[1].elemsize;
                pvVar69 = local_160[1].data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar10 = vmaxps_avx(auVar77,*(undefined1 (*) [16])
                                                ((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64));
                  *(undefined1 (*) [16])((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64) = auVar10;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          }
          local_118 = CONCAT44(local_118._4_4_,uVar35);
          if (((uVar62 == uVar57) && (iVar34 == 1)) && ((uVar37 == uVar70 && (uVar44 == 1)))) {
            Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)(uint)local_130 < 1) {
                local_130._0_4_ = 0;
              }
              uVar64 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar64 = uVar68;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160->data;
                pvVar69 = local_160[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar75 = this_00->data;
                lVar48 = 0;
                iVar34 = (uint)local_130;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  uVar1 = *(undefined4 *)((long)pvVar9 + lVar48);
                  auVar84._4_4_ = uVar1;
                  auVar84._0_4_ = uVar1;
                  auVar84._8_4_ = uVar1;
                  auVar84._12_4_ = uVar1;
                  auVar77 = vmaxps_avx(auVar84,*(undefined1 (*) [16])
                                                ((long)pvVar69 +
                                                lVar48 * 4 + sVar60 * sVar5 * uVar68));
                  *(undefined1 (*) [16])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) =
                       auVar77;
                  lVar48 = lVar48 + 4;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              uVar64 = (ulong)uVar70;
              if ((int)uVar70 < 1) {
                uVar64 = uVar68;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar68;
              }
              for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data)
                ;
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160[1].data;
                pauVar74 = (undefined1 (*) [16])
                           (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
                  auVar77 = *(undefined1 (*) [16])
                             ((long)pvVar9 + uVar55 * 0x10 + sVar60 * uVar68 * sVar5);
                  uVar35 = uVar57;
                  while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                    auVar10 = vmaxps_avx(auVar77,*pauVar47);
                    *pauVar74 = auVar10;
                    pauVar47 = pauVar47 + 1;
                    pauVar74 = pauVar74 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar57;
              if ((int)uVar57 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                                  (long)local_160->data);
                sVar60 = local_160[1].cstep;
                pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data
                                  );
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160[1].data;
                for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                  for (lVar48 = 0; uVar68 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                    auVar77 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar69 + lVar48),
                                         *(undefined1 (*) [16])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                    *(undefined1 (*) [16])((long)pvVar75 + lVar48) = auVar77;
                  }
                  pvVar69 = (void *)((long)pvVar69 + lVar48);
                  pvVar75 = (void *)((long)pvVar75 + lVar48);
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
            Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)uVar70;
              if ((int)uVar70 < 1) {
                uVar63 = uVar64;
              }
              uVar55 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar55 = uVar64;
              }
              for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                pvVar9 = local_160->data;
                pauVar47 = (undefined1 (*) [16])
                           (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar74 = (undefined1 (*) [16])
                           (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
                for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
                  auVar77 = *(undefined1 (*) [16])
                             ((long)pvVar9 + uVar56 * 0x10 + sVar60 * uVar64 * sVar5);
                  uVar61 = uVar68;
                  while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar10 = vmaxps_avx(auVar77,*pauVar47);
                    *pauVar74 = auVar10;
                    pauVar47 = pauVar47 + 1;
                    pauVar74 = pauVar74 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
            Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar57;
              if ((int)uVar57 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = local_160->cstep;
                pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                  (long)local_160[1].data);
                pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data
                                  );
                sVar5 = local_160->elemsize;
                pvVar9 = local_160->data;
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  for (lVar48 = 0; uVar68 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                    auVar77 = vmaxps_avx(*(undefined1 (*) [16])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64),
                                         *(undefined1 (*) [16])((long)pvVar69 + lVar48));
                    *(undefined1 (*) [16])((long)pvVar75 + lVar48) = auVar77;
                  }
                  pvVar69 = (void *)((long)pvVar69 + lVar48);
                  pvVar75 = (void *)((long)pvVar75 + lVar48);
                }
              }
              return 0;
            }
            return -100;
          }
          goto LAB_003887e9;
        case 4:
          if (a[1].dims != 4) {
            local_130 = opt;
            Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            iVar34 = local_160[1].dims;
            iVar38 = (int)local_158;
            if (iVar34 != 1) {
              if (iVar34 == 3) {
                uVar35 = 0;
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = uVar35;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = uVar35;
                }
                if ((int)uVar58 < 1) {
                  uVar58 = uVar35;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if (iVar38 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pauVar47 = (undefined1 (*) [16])
                             (local_160->cstep * uVar68 * local_160->elemsize +
                             (long)local_160->data);
                  pauVar74 = (undefined1 (*) [16])
                             (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                    for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                      auVar77 = *pauVar74;
                      uVar62 = uVar57;
                      while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                        auVar10 = vmaxps_avx(auVar77,*pauVar47);
                        *pauVar53 = auVar10;
                        pauVar47 = pauVar47 + 1;
                        pauVar53 = pauVar53 + 1;
                      }
                      pauVar74 = pauVar74 + 1;
                    }
                  }
                }
                return 0;
              }
              if (iVar34 == 2) {
                uVar35 = 0;
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = uVar35;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = uVar35;
                }
                if ((int)uVar58 < 1) {
                  uVar58 = uVar35;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if (iVar38 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pauVar47 = (undefined1 (*) [16])
                             (local_160->cstep * uVar68 * local_160->elemsize +
                             (long)local_160->data);
                  pauVar74 = (undefined1 (*) [16])
                             ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                    auVar77 = *pauVar74;
                    for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                      while (uVar62 != 0) {
                        auVar10 = vmaxps_avx(auVar77,*pauVar47);
                        *pauVar53 = auVar10;
                        pauVar47 = pauVar47 + 1;
                        pauVar53 = pauVar53 + 1;
                        uVar62 = uVar62 - 1;
                      }
                    }
                    pauVar74 = pauVar74 + 1;
                  }
                }
                return 0;
              }
              return 0;
            }
            opt = local_130;
            if (uVar35 != 1 || local_160[1].w != 1) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pvVar9 = this_00->data;
                auVar77 = *(undefined1 (*) [16])((long)local_160[1].data + uVar68 * 0x10);
                sVar8 = local_160->elemsize;
                pvVar69 = local_160->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  auVar10 = vmaxps_avx(auVar77,*(undefined1 (*) [16])
                                                ((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68));
                  *(undefined1 (*) [16])((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68) = auVar10;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            goto LAB_00385589;
          }
          goto LAB_00379cea;
        }
        goto LAB_0037d90c;
      case 5:
        if (3 < a->dims - 1U) {
          return 0;
        }
        local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
        uVar57 = a->w;
        uVar70 = a->h;
        uVar58 = a->d;
        uVar44 = a->c;
        local_158 = (__m512 *)(ulong)uVar44;
        local_138 = CONCAT44(local_138._4_4_,uVar70 * uVar57 * uVar58);
        sVar60 = a->elemsize;
        uVar62 = a[1].w;
        uVar37 = a[1].h;
        uVar59 = a[1].d;
        uVar3 = a[1].c;
        local_148 = (__m512 *)(ulong)uVar3;
        local_130 = (Option *)CONCAT44(local_130._4_4_,uVar37 * uVar62 * uVar59);
        sVar5 = a[1].elemsize;
        switch(a->dims) {
        case 1:
          if (iVar34 != 1 || uVar57 != 1) {
            switch(a[1].dims) {
            case 1:
              goto switchD_0037ca62_caseD_1;
            case 2:
              Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
              pauVar47 = (undefined1 (*) [16])this_00->data;
              if (pauVar47 == (undefined1 (*) [16])0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                pauVar74 = (undefined1 (*) [16])local_160->data;
                pauVar53 = (undefined1 (*) [16])local_160[1].data;
                if ((int)uVar62 < 1) {
                  uVar62 = 0;
                }
                if ((int)uVar37 < 1) {
                  uVar37 = 0;
                }
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  auVar77 = *pauVar74;
                  uVar57 = uVar62;
                  while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                    auVar10 = vminps_avx(auVar77,*pauVar53);
                    *pauVar47 = auVar10;
                    pauVar53 = pauVar53 + 1;
                    pauVar47 = pauVar47 + 1;
                  }
                  pauVar74 = pauVar74 + 1;
                }
                return 0;
              }
              return -100;
            case 3:
              Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)local_130 & 0xffffffff;
                if ((int)(uint)local_130 < 1) {
                  uVar68 = uVar64;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  sVar60 = local_160[1].cstep;
                  sVar5 = local_160[1].elemsize;
                  auVar77 = *(undefined1 (*) [16])((long)local_160->data + uVar64 * 0x10);
                  pvVar9 = local_160[1].data;
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar69 = this_00->data;
                  lVar48 = 0;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar10 = vminps_avx(auVar77,*(undefined1 (*) [16])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                    ;
                    *(undefined1 (*) [16])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) =
                         auVar10;
                    lVar48 = lVar48 + 0x10;
                  }
                }
                return 0;
              }
              return -100;
            case 4:
              Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)local_130 & 0xffffffff;
                if ((int)(uint)local_130 < 1) {
                  uVar68 = uVar64;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  sVar60 = local_160[1].cstep;
                  sVar5 = local_160[1].elemsize;
                  auVar77 = *(undefined1 (*) [16])((long)local_160->data + uVar64 * 0x10);
                  pvVar9 = local_160[1].data;
                  sVar7 = this_00->cstep;
                  sVar8 = this_00->elemsize;
                  pvVar69 = this_00->data;
                  lVar48 = 0;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar10 = vminps_avx(auVar77,*(undefined1 (*) [16])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                    ;
                    *(undefined1 (*) [16])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) =
                         auVar10;
                    lVar48 = lVar48 + 0x10;
                  }
                }
                return 0;
              }
              return -100;
            default:
              return 0;
            }
          }
LAB_003763f6:
          local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
          iVar34 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                             (a,b,this_00,opt);
          return iVar34;
        case 2:
          pAVar6 = opt->blob_allocator;
          if (a[1].dims == 3) {
            Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           ((long)local_160->w * uVar64 * local_160->elemsize +
                           (long)local_160->data);
                pauVar74 = (undefined1 (*) [16])
                           (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  auVar77 = *pauVar47;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar10 = vminps_avx(auVar77,*pauVar74);
                    *pauVar53 = auVar10;
                    pauVar74 = pauVar74 + 1;
                    pauVar53 = pauVar53 + 1;
                  }
                  pauVar47 = pauVar47 + 1;
                }
              }
              return 0;
            }
            return -100;
          }
          if (a[1].dims == 4) {
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           ((long)local_160->w * uVar64 * local_160->elemsize +
                           (long)local_160->data);
                pauVar74 = (undefined1 (*) [16])
                           (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                  auVar77 = *pauVar47;
                  for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                    while ((int)uVar55 != 0) {
                      auVar10 = vminps_avx(auVar77,*pauVar74);
                      *pauVar53 = auVar10;
                      pauVar74 = pauVar74 + 1;
                      pauVar53 = pauVar53 + 1;
                      uVar55 = (ulong)((int)uVar55 - 1);
                    }
                  }
                  pauVar47 = pauVar47 + 1;
                }
              }
              return 0;
            }
            return -100;
          }
          local_118 = CONCAT44(local_118._4_4_,uVar35);
          Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar34 = local_160[1].dims;
          if (iVar34 == 1) {
            Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
            pauVar47 = (undefined1 (*) [16])this_00->data;
            if (pauVar47 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if ((int)local_118 != 1 || local_160[1].w != 1) {
              pauVar74 = (undefined1 (*) [16])local_160->data;
              pauVar53 = (undefined1 (*) [16])local_160[1].data;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                auVar77 = *pauVar53;
                uVar58 = uVar57;
                while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                  auVar10 = vminps_avx(auVar77,*pauVar74);
                  *pauVar47 = auVar10;
                  pauVar74 = pauVar74 + 1;
                  pauVar47 = pauVar47 + 1;
                }
                pauVar53 = pauVar53 + 1;
              }
              return 0;
            }
            goto LAB_003858c6;
          }
          break;
        case 3:
          if (a[1].dims != 3) {
            if (a[1].dims == 4) {
              Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                uVar64 = 0;
                uVar68 = (ulong)uVar62;
                if ((int)uVar62 < 1) {
                  uVar68 = uVar64;
                }
                if ((int)uVar37 < 1) {
                  uVar37 = 0;
                }
                if ((int)uVar59 < 1) {
                  uVar59 = 0;
                }
                uVar63 = (ulong)local_148 & 0xffffffff;
                if ((int)local_148 < 1) {
                  uVar63 = uVar64;
                }
                for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                  pauVar47 = (undefined1 (*) [16])
                             (local_160->cstep * uVar64 * local_160->elemsize +
                             (long)local_160->data);
                  pauVar74 = (undefined1 (*) [16])
                             (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                    for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                      auVar77 = *pauVar47;
                      uVar55 = uVar68;
                      while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                        auVar10 = vminps_avx(auVar77,*pauVar74);
                        *pauVar53 = auVar10;
                        pauVar74 = pauVar74 + 1;
                        pauVar53 = pauVar53 + 1;
                      }
                      pauVar47 = pauVar47 + 1;
                    }
                  }
                }
                return 0;
              }
              return -100;
            }
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (local_160[1].dims != 1) {
              if (local_160[1].dims == 2) {
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = 0;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = 0;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if ((int)local_158 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pauVar47 = (undefined1 (*) [16])
                             (local_160->cstep * uVar68 * local_160->elemsize +
                             (long)local_160->data);
                  pauVar74 = (undefined1 (*) [16])
                             ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                    auVar77 = *pauVar74;
                    uVar58 = uVar57;
                    while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                      auVar10 = vminps_avx(auVar77,*pauVar47);
                      *pauVar53 = auVar10;
                      pauVar47 = pauVar47 + 1;
                      pauVar53 = pauVar53 + 1;
                    }
                    pauVar74 = pauVar74 + 1;
                  }
                }
                return 0;
              }
              return 0;
            }
            if (uVar35 != 1 || local_160[1].w != 1) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                auVar77 = *(undefined1 (*) [16])((long)local_160[1].data + uVar68 * 0x10);
                pvVar9 = local_160->data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  auVar10 = vminps_avx(auVar77,*(undefined1 (*) [16])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68));
                  *(undefined1 (*) [16])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68) = auVar10;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            goto LAB_003858c6;
          }
          uVar58 = uVar3 ^ uVar44;
          if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = local_138 & 0xffffffff;
              if ((int)local_138 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = this_00->cstep;
                sVar5 = local_160->cstep;
                sVar7 = local_160->elemsize;
                pvVar9 = local_160->data;
                auVar77 = *(undefined1 (*) [16])
                           ((long)local_160[1].data +
                           local_160[1].cstep * uVar64 * local_160[1].elemsize);
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar10 = vminps_avx(auVar77,*(undefined1 (*) [16])
                                                ((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar64));
                  *(undefined1 (*) [16])((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar64) = auVar10
                  ;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = uVar68;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                pvVar9 = local_160[1].data;
                pvVar69 = local_160->data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar75 = this_00->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  uVar1 = *(undefined4 *)((long)pvVar9 + lVar48);
                  auVar10._4_4_ = uVar1;
                  auVar10._0_4_ = uVar1;
                  auVar10._8_4_ = uVar1;
                  auVar10._12_4_ = uVar1;
                  auVar77 = vminps_avx512vl(*(undefined1 (*) [16])
                                             ((long)pvVar69 + lVar48 * 4 + sVar60 * sVar5 * uVar68),
                                            auVar10);
                  *(undefined1 (*) [16])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) =
                       auVar77;
                  lVar48 = lVar48 + 4;
                }
              }
              return 0;
            }
            return -100;
          }
          local_138 = sVar60;
          if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
            Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)local_130 & 0xffffffff;
              if ((int)(uint)local_130 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = this_00->cstep;
                sVar5 = this_00->elemsize;
                sVar7 = local_160[1].cstep;
                pvVar9 = this_00->data;
                auVar77 = *(undefined1 (*) [16])
                           ((long)local_160->data + local_160->cstep * uVar64 * local_160->elemsize)
                ;
                sVar8 = local_160[1].elemsize;
                pvVar69 = local_160[1].data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar10 = vminps_avx(auVar77,*(undefined1 (*) [16])
                                                ((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64));
                  *(undefined1 (*) [16])((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64) = auVar10;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          }
          local_118 = CONCAT44(local_118._4_4_,uVar35);
          if ((((uVar62 == uVar57) && (iVar34 == 1)) && (uVar37 == uVar70)) && (uVar44 == 1)) {
            Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)(uint)local_130 < 1) {
                local_130._0_4_ = 0;
              }
              uVar64 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar64 = uVar68;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160->data;
                pvVar69 = local_160[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar75 = this_00->data;
                lVar48 = 0;
                iVar34 = (uint)local_130;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  uVar1 = *(undefined4 *)((long)pvVar9 + lVar48);
                  auVar87._4_4_ = uVar1;
                  auVar87._0_4_ = uVar1;
                  auVar87._8_4_ = uVar1;
                  auVar87._12_4_ = uVar1;
                  auVar77 = vminps_avx(auVar87,*(undefined1 (*) [16])
                                                ((long)pvVar69 +
                                                lVar48 * 4 + sVar60 * sVar5 * uVar68));
                  *(undefined1 (*) [16])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) =
                       auVar77;
                  lVar48 = lVar48 + 4;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              uVar64 = (ulong)uVar70;
              if ((int)uVar70 < 1) {
                uVar64 = uVar68;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar68;
              }
              for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data)
                ;
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160[1].data;
                pauVar74 = (undefined1 (*) [16])
                           (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
                  auVar77 = *(undefined1 (*) [16])
                             ((long)pvVar9 + uVar55 * 0x10 + sVar60 * uVar68 * sVar5);
                  uVar35 = uVar57;
                  while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                    auVar10 = vminps_avx(auVar77,*pauVar47);
                    *pauVar74 = auVar10;
                    pauVar47 = pauVar47 + 1;
                    pauVar74 = pauVar74 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
            Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar57;
              if ((int)uVar57 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                                  (long)local_160->data);
                sVar60 = local_160[1].cstep;
                pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data
                                  );
                sVar5 = local_160[1].elemsize;
                pvVar9 = local_160[1].data;
                for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                  for (lVar48 = 0; uVar68 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                    auVar77 = vminps_avx(*(undefined1 (*) [16])((long)pvVar69 + lVar48),
                                         *(undefined1 (*) [16])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                    *(undefined1 (*) [16])((long)pvVar75 + lVar48) = auVar77;
                  }
                  pvVar69 = (void *)((long)pvVar69 + lVar48);
                  pvVar75 = (void *)((long)pvVar75 + lVar48);
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
            Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)uVar70;
              if ((int)uVar70 < 1) {
                uVar63 = uVar64;
              }
              uVar55 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar55 = uVar64;
              }
              for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = local_160->elemsize;
                pvVar9 = local_160->data;
                pauVar47 = (undefined1 (*) [16])
                           (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar74 = (undefined1 (*) [16])
                           (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
                for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
                  auVar77 = *(undefined1 (*) [16])
                             ((long)pvVar9 + uVar56 * 0x10 + sVar60 * uVar64 * sVar5);
                  uVar61 = uVar68;
                  while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar10 = vminps_avx(auVar77,*pauVar47);
                    *pauVar74 = auVar10;
                    pauVar47 = pauVar47 + 1;
                    pauVar74 = pauVar74 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
            Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar57;
              if ((int)uVar57 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              uVar63 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = local_160->cstep;
                pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                  (long)local_160[1].data);
                pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data
                                  );
                sVar5 = local_160->elemsize;
                pvVar9 = local_160->data;
                for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                  for (lVar48 = 0; uVar68 * 0x10 != lVar48; lVar48 = lVar48 + 0x10) {
                    auVar77 = vminps_avx(*(undefined1 (*) [16])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64),
                                         *(undefined1 (*) [16])((long)pvVar69 + lVar48));
                    *(undefined1 (*) [16])((long)pvVar75 + lVar48) = auVar77;
                  }
                  pvVar69 = (void *)((long)pvVar69 + lVar48);
                  pvVar75 = (void *)((long)pvVar75 + lVar48);
                }
              }
              return 0;
            }
            return -100;
          }
          goto LAB_00388b01;
        case 4:
          if (a[1].dims != 4) {
            local_130 = opt;
            Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            iVar34 = local_160[1].dims;
            iVar38 = (int)local_158;
            if (iVar34 != 1) {
              if (iVar34 == 3) {
                uVar35 = 0;
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = uVar35;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = uVar35;
                }
                if ((int)uVar58 < 1) {
                  uVar58 = uVar35;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if (iVar38 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pauVar47 = (undefined1 (*) [16])
                             (local_160->cstep * uVar68 * local_160->elemsize +
                             (long)local_160->data);
                  pauVar74 = (undefined1 (*) [16])
                             (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                    for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                      auVar77 = *pauVar74;
                      uVar62 = uVar57;
                      while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                        auVar10 = vminps_avx(auVar77,*pauVar47);
                        *pauVar53 = auVar10;
                        pauVar47 = pauVar47 + 1;
                        pauVar53 = pauVar53 + 1;
                      }
                      pauVar74 = pauVar74 + 1;
                    }
                  }
                }
                return 0;
              }
              if (iVar34 == 2) {
                uVar35 = 0;
                uVar68 = 0;
                if ((int)uVar57 < 1) {
                  uVar57 = uVar35;
                }
                if ((int)uVar70 < 1) {
                  uVar70 = uVar35;
                }
                if ((int)uVar58 < 1) {
                  uVar58 = uVar35;
                }
                uVar64 = (ulong)local_158 & 0xffffffff;
                if (iVar38 < 1) {
                  uVar64 = 0;
                }
                for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                  pauVar47 = (undefined1 (*) [16])
                             (local_160->cstep * uVar68 * local_160->elemsize +
                             (long)local_160->data);
                  pauVar74 = (undefined1 (*) [16])
                             ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                             (long)local_160[1].data);
                  pauVar53 = (undefined1 (*) [16])
                             (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                  for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                    auVar77 = *pauVar74;
                    for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                      while (uVar62 != 0) {
                        auVar10 = vminps_avx(auVar77,*pauVar47);
                        *pauVar53 = auVar10;
                        pauVar47 = pauVar47 + 1;
                        pauVar53 = pauVar53 + 1;
                        uVar62 = uVar62 - 1;
                      }
                    }
                    pauVar74 = pauVar74 + 1;
                  }
                }
                return 0;
              }
              return 0;
            }
            opt = local_130;
            if (uVar35 != 1 || local_160[1].w != 1) {
              uVar68 = 0;
              if ((int)local_138 < 1) {
                local_138._0_4_ = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                sVar60 = local_160->cstep;
                sVar5 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pvVar9 = this_00->data;
                auVar77 = *(undefined1 (*) [16])((long)local_160[1].data + uVar68 * 0x10);
                sVar8 = local_160->elemsize;
                pvVar69 = local_160->data;
                lVar48 = 0;
                iVar34 = (int)local_138;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  auVar10 = vminps_avx(auVar77,*(undefined1 (*) [16])
                                                ((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68));
                  *(undefined1 (*) [16])((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68) = auVar10;
                  lVar48 = lVar48 + 0x10;
                }
              }
              return 0;
            }
            goto LAB_003858c6;
          }
          goto LAB_0037a4fc;
        }
        goto LAB_0037e0ff;
      case 6:
        if (a->dims - 1U < 4) {
          uVar57 = a->w;
          local_158 = (__m512 *)(ulong)uVar57;
          uVar70 = a->h;
          local_148 = (__m512 *)(ulong)uVar70;
          iVar38 = a->d;
          uVar58 = a->c;
          local_128 = (ulong)uVar58;
          uVar37 = uVar70 * uVar57 * iVar38;
          local_108 = a->elemsize;
          uVar44 = a[1].w;
          local_150._0_4_ = a[1].h;
          local_130._0_4_ = a[1].d;
          uVar62 = a[1].c;
          local_138 = (size_t)uVar62;
          local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
          local_110._0_4_ = (uint)local_150 * uVar44 * (uint)local_130;
          sVar60 = a[1].elemsize;
          local_120._0_4_ = uVar37;
          switch(a->dims) {
          case 1:
            if (iVar34 == 1 && uVar57 == 1) {
              iVar34 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                                 (a,b,this_00,opt);
              return iVar34;
            }
            switch(a[1].dims) {
            case 1:
              Mat::create(this_00,uVar57,local_108,iVar34,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if (uVar35 == 1 && a[1].w == 1) {
LAB_00385851:
                iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                                   (a,b,this_00,opt);
                return iVar34;
              }
              binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                        (a,b,this_00,opt);
              break;
            case 2:
              Mat::create(this_00,uVar44,(uint)local_150,sVar60,uVar35,opt->blob_allocator);
              puVar71 = (undefined8 *)this_00->data;
              if (puVar71 == (undefined8 *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              local_148 = (__m512 *)a->data;
              iVar34 = (uint)local_140;
              if ((int)(uint)local_140 < 1) {
                iVar34 = 0;
              }
              pauVar47 = (undefined1 (*) [16])a[1].data;
              if ((int)(uint)local_150 < 1) {
                local_150._0_4_ = 0;
              }
              iVar38 = 0;
              local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
              while( true ) {
                local_158 = (__m512 *)CONCAT44(local_158._4_4_,iVar38);
                if (iVar38 == (uint)local_150) break;
                local_c0._0_16_ = *(undefined1 (*) [16])local_148;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  uVar109 = *(undefined8 *)((long)*pauVar47 + 8);
                  local_100._0_16_ = *pauVar47;
                  afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                       (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                  *puVar71 = afVar117._0_8_;
                  puVar71[1] = uVar109;
                  pauVar47 = pauVar47 + 1;
                  puVar71 = puVar71 + 2;
                }
                local_148 = (__m512 *)((long)local_148 + 0x10);
                iVar38 = (int)local_158 + 1;
                iVar34 = (uint)local_140;
              }
              break;
            case 3:
              Mat::create(this_00,uVar44,(uint)local_150,uVar62,sVar60,uVar35,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_110 < 1) {
                local_110._0_4_ = 0;
              }
              iVar34 = (int)local_138;
              local_138 = local_138 & 0xffffffff;
              if (iVar34 < 1) {
                local_138 = 0;
              }
              for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_138;
                  local_150 = (__m512 *)((long)local_150 + 1)) {
                local_c0._0_16_ = *(undefined1 (*) [16])((long)a->data + (long)local_150 * 0x10);
                lVar66 = a[1].cstep * a[1].elemsize * (long)local_150;
                pvVar9 = a[1].data;
                lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
                pvVar69 = this_00->data;
                lVar67 = 0;
                iVar34 = (int)local_110;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  pauVar47 = (undefined1 (*) [16])((long)pvVar9 + lVar67 + lVar66);
                  uVar109 = *(undefined8 *)(*pauVar47 + 8);
                  local_100._0_16_ = *pauVar47;
                  afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                       (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                  puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
                  *puVar71 = afVar117._0_8_;
                  puVar71[1] = uVar109;
                  lVar67 = lVar67 + 0x10;
                }
                a = local_160;
              }
              break;
            case 4:
              Mat::create(this_00,uVar44,(uint)local_150,(uint)local_130,uVar62,sVar60,uVar35,
                          opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)local_110 < 1) {
                local_110._0_4_ = 0;
              }
              iVar34 = (int)local_138;
              local_138 = local_138 & 0xffffffff;
              if (iVar34 < 1) {
                local_138 = 0;
              }
              for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_138;
                  local_150 = (__m512 *)((long)local_150 + 1)) {
                local_c0._0_16_ = *(undefined1 (*) [16])((long)a->data + (long)local_150 * 0x10);
                lVar66 = a[1].cstep * a[1].elemsize * (long)local_150;
                pvVar9 = a[1].data;
                lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
                pvVar69 = this_00->data;
                lVar67 = 0;
                iVar34 = (int)local_110;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  pauVar47 = (undefined1 (*) [16])((long)pvVar9 + lVar67 + lVar66);
                  uVar109 = *(undefined8 *)(*pauVar47 + 8);
                  local_100._0_16_ = *pauVar47;
                  afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                       (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                  puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
                  *puVar71 = afVar117._0_8_;
                  puVar71[1] = uVar109;
                  lVar67 = lVar67 + 0x10;
                }
                a = local_160;
              }
            }
            break;
          case 2:
            pAVar6 = opt->blob_allocator;
            if (a[1].dims == 3) {
              Mat::create(this_00,uVar44,(uint)local_150,uVar62,sVar60,uVar35,pAVar6);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              if ((int)uVar44 < 1) {
                uVar44 = 0;
              }
              if ((int)(uint)local_150 < 1) {
                local_150._0_4_ = 0;
              }
              iVar34 = (int)local_138;
              local_138 = local_138 & 0xffffffff;
              if (iVar34 < 1) {
                local_138 = 0;
              }
              local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
              for (local_130 = (Option *)0x0; local_130 != (Option *)local_138;
                  local_130 = (Option *)((long)local_130 + 1)) {
                local_148 = (__m512 *)
                            ((long)local_160->w * (long)local_130 * local_160->elemsize +
                            (long)local_160->data);
                pauVar74 = (undefined1 (*) [16])
                           (local_160[1].cstep * (long)local_130 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar47 = (undefined1 (*) [16])
                           (this_00->cstep * (long)local_130 * this_00->elemsize +
                           (long)this_00->data);
                iVar34 = 0;
                while (iVar34 != (uint)local_150) {
                  local_158 = (__m512 *)CONCAT44(local_158._4_4_,iVar34);
                  local_c0._0_16_ = *(undefined1 (*) [16])local_148;
                  while (bVar76 = uVar44 != 0, uVar44 = uVar44 - 1, bVar76) {
                    auVar110 = ZEXT856(*(ulong *)((long)*pauVar74 + 8));
                    local_100._0_16_ = *pauVar74;
                    afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                         (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                    auVar100._0_8_ = afVar117._0_8_;
                    auVar100._8_56_ = auVar110;
                    *pauVar47 = auVar100._0_16_;
                    pauVar74 = pauVar74 + 1;
                    pauVar47 = pauVar47 + 1;
                  }
                  local_148 = (__m512 *)((long)local_148 + 0x10);
                  uVar44 = (uint)local_140;
                  iVar34 = (int)local_158 + 1;
                }
              }
            }
            else {
              if (a[1].dims != 4) {
                local_140 = b;
                Mat::create(this_00,uVar57,uVar70,local_108,iVar34,pAVar6);
                if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
                  if (a[1].dims != 1) {
                    b = local_140;
                    if (a[1].dims != 2) {
                      return 0;
                    }
                    goto LAB_0037a52a;
                  }
                  Mat::create(this_00,(int)local_158,(int)local_148,local_108,iVar34,
                              opt->blob_allocator);
                  puVar71 = (undefined8 *)this_00->data;
                  if (puVar71 != (undefined8 *)0x0) {
                    if ((long)this_00->c * this_00->cstep == 0) {
                      return -100;
                    }
                    pMVar49 = a + 1;
                    b = local_140;
                    a = local_160;
                    if (uVar35 != 1 || pMVar49->w != 1) {
                      pauVar47 = (undefined1 (*) [16])local_160->data;
                      iVar34 = (int)local_158;
                      local_158 = (__m512 *)((ulong)local_158 & 0xffffffff);
                      if (iVar34 < 1) {
                        local_158 = (__m512 *)0x0;
                      }
                      local_140 = (Mat *)local_160[1].data;
                      iVar34 = (int)local_148;
                      local_148 = (__m512 *)((ulong)local_148 & 0xffffffff);
                      if (iVar34 < 1) {
                        local_148 = (__m512 *)0x0;
                      }
                      for (local_150._0_4_ = 0; (uint)local_150 != (int)local_148;
                          local_150._0_4_ = (uint)local_150 + 1) {
                        local_c0._0_16_ = *(undefined1 (*) [16])local_140;
                        uVar68 = (ulong)local_158 & 0xffffffff;
                        while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                          uVar109 = *(undefined8 *)((long)*pauVar47 + 8);
                          local_100._0_16_ = *pauVar47;
                          afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                               (&local_161,(__m128 *)local_100,(__m128 *)local_c0);
                          *puVar71 = afVar117._0_8_;
                          puVar71[1] = uVar109;
                          pauVar47 = pauVar47 + 1;
                          puVar71 = puVar71 + 2;
                        }
                        local_140 = (Mat *)((long)local_140 + 0x10);
                      }
                      return 0;
                    }
                    goto LAB_00385851;
                  }
                }
                return -100;
              }
              Mat::create(this_00,uVar44,(uint)local_150,(uint)local_130,uVar62,sVar60,uVar35,pAVar6
                         );
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              uVar68 = (ulong)uVar44;
              if ((int)uVar44 < 1) {
                uVar68 = 0;
              }
              if ((int)(uint)local_150 < 1) {
                local_150._0_4_ = 0;
              }
              if ((int)(uint)local_130 < 1) {
                local_130._0_4_ = 0;
              }
              iVar34 = (int)local_138;
              local_138 = local_138 & 0xffffffff;
              if (iVar34 < 1) {
                local_138 = 0;
              }
              local_140 = (Mat *)CONCAT44(local_140._4_4_,(int)uVar68);
              for (local_128 = 0; local_128 != local_138; local_128 = local_128 + 1) {
                local_158 = (__m512 *)
                            ((long)local_160->w * local_128 * local_160->elemsize +
                            (long)local_160->data);
                pauVar47 = (undefined1 (*) [16])
                           (local_160[1].cstep * local_128 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar74 = (undefined1 (*) [16])
                           (this_00->cstep * local_128 * this_00->elemsize + (long)this_00->data);
                for (iVar34 = 0; iVar34 != (uint)local_130; iVar34 = iVar34 + 1) {
                  local_c0._0_16_ = *(undefined1 (*) [16])local_158;
                  local_148 = (__m512 *)CONCAT44(local_148._4_4_,iVar34);
                  for (iVar38 = 0; iVar38 != (uint)local_150; iVar38 = iVar38 + 1) {
                    while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      auVar110 = ZEXT856(*(ulong *)((long)*pauVar47 + 8));
                      local_100._0_16_ = *pauVar47;
                      afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                           (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                      auVar99._0_8_ = afVar117._0_8_;
                      auVar99._8_56_ = auVar110;
                      *pauVar74 = auVar99._0_16_;
                      pauVar47 = pauVar47 + 1;
                      pauVar74 = pauVar74 + 1;
                    }
                    uVar68 = (ulong)local_140 & 0xffffffff;
                    iVar34 = (int)local_148;
                  }
                  local_158 = (__m512 *)((long)local_158 + 0x10);
                }
              }
            }
            break;
          case 3:
            if (a[1].dims == 3) {
              local_120._0_4_ = (uint)local_150 ^ 1;
              uVar59 = uVar62 ^ uVar58;
              if (((uVar44 ^ 1) == 0 && (uint)local_120 == 0) && uVar59 == 0) {
                local_120._0_4_ = uVar37;
                Mat::create(this_00,uVar57,uVar70,uVar58,local_108,iVar34,opt->blob_allocator);
                if (this_00->data == (void *)0x0) {
                  return -100;
                }
                if ((long)this_00->c * this_00->cstep == 0) {
                  return -100;
                }
                if ((int)(uint)local_120 < 1) {
                  local_120._0_4_ = 0;
                }
                iVar34 = (int)local_128;
                local_128 = local_128 & 0xffffffff;
                if (iVar34 < 1) {
                  local_128 = 0;
                }
                for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
                    local_150 = (__m512 *)((long)local_150 + 1)) {
                  lVar48 = a->cstep * a->elemsize * (long)local_150;
                  pvVar9 = a->data;
                  lVar66 = this_00->cstep * this_00->elemsize * (long)local_150;
                  pvVar69 = this_00->data;
                  local_c0._0_16_ =
                       *(undefined1 (*) [16])
                        ((long)a[1].data + a[1].cstep * (long)local_150 * a[1].elemsize);
                  lVar67 = 0;
                  iVar34 = (uint)local_120;
                  while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                    pauVar47 = (undefined1 (*) [16])((long)pvVar9 + lVar67 + lVar48);
                    uVar109 = *(undefined8 *)(*pauVar47 + 8);
                    local_100._0_16_ = *pauVar47;
                    afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                         (&local_161,(__m128 *)local_100,(__m128 *)local_c0);
                    puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar66);
                    *puVar71 = afVar117._0_8_;
                    puVar71[1] = uVar109;
                    lVar67 = lVar67 + 0x10;
                  }
                  a = local_160;
                }
              }
              else if ((uVar44 == uVar57) &&
                      (uVar35 == 1 && (uVar62 == 1 && (uint)local_150 == uVar70))) {
                local_120._0_4_ = uVar37;
                Mat::create(this_00,uVar57,uVar70,uVar58,local_108,iVar34,opt->blob_allocator);
                if (this_00->data == (void *)0x0) {
                  return -100;
                }
                if ((long)this_00->c * this_00->cstep == 0) {
                  return -100;
                }
                if ((int)(uint)local_120 < 1) {
                  local_120._0_4_ = 0;
                }
                iVar34 = (int)local_128;
                local_128 = local_128 & 0xffffffff;
                if (iVar34 < 1) {
                  local_128 = 0;
                }
                for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
                    local_150 = (__m512 *)((long)local_150 + 1)) {
                  pvVar9 = local_160[1].data;
                  lVar66 = local_160->cstep * local_160->elemsize * (long)local_150;
                  pvVar69 = local_160->data;
                  lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
                  pvVar75 = this_00->data;
                  lVar67 = 0;
                  iVar34 = (uint)local_120;
                  while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                    local_c0._0_16_ = *(undefined1 (*) [16])((long)pvVar69 + lVar67 * 4 + lVar66);
                    uVar1 = *(undefined4 *)((long)pvVar9 + lVar67);
                    auVar77._4_4_ = uVar1;
                    auVar77._0_4_ = uVar1;
                    auVar77._8_4_ = uVar1;
                    auVar77._12_4_ = uVar1;
                    auVar110 = ZEXT856(auVar77._8_8_);
                    local_100[0] = (float)uVar1;
                    local_100[1] = (float)uVar1;
                    local_100[2] = (float)uVar1;
                    local_100[3] = (float)uVar1;
                    afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                         (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                    auVar102._0_8_ = afVar117._0_8_;
                    auVar102._8_56_ = auVar110;
                    *(undefined1 (*) [16])((long)pvVar75 + lVar67 * 4 + lVar48) = auVar102._0_16_;
                    lVar67 = lVar67 + 4;
                  }
                }
              }
              else {
                local_130._0_4_ = uVar59;
                if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar59 == 0) {
                  Mat::create(this_00,uVar44,(uint)local_150,uVar58,sVar60,uVar35,
                              opt->blob_allocator);
                  if (this_00->data == (void *)0x0) {
                    return -100;
                  }
                  if ((long)this_00->c * this_00->cstep == 0) {
                    return -100;
                  }
                  if ((int)local_110 < 1) {
                    local_110._0_4_ = 0;
                  }
                  iVar34 = (int)local_128;
                  local_128 = local_128 & 0xffffffff;
                  if (iVar34 < 1) {
                    local_128 = 0;
                  }
                  for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
                      local_150 = (__m512 *)((long)local_150 + 1)) {
                    lVar66 = this_00->cstep * this_00->elemsize * (long)local_150;
                    pvVar9 = this_00->data;
                    lVar48 = a[1].cstep * a[1].elemsize * (long)local_150;
                    pvVar69 = a[1].data;
                    local_c0._0_16_ =
                         *(undefined1 (*) [16])
                          ((long)a->data + a->cstep * (long)local_150 * a->elemsize);
                    lVar67 = 0;
                    iVar34 = (int)local_110;
                    while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                      pauVar47 = (undefined1 (*) [16])((long)pvVar69 + lVar67 + lVar48);
                      uVar109 = *(undefined8 *)(*pauVar47 + 8);
                      local_100._0_16_ = *pauVar47;
                      afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                           (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                      puVar71 = (undefined8 *)((long)pvVar9 + lVar67 + lVar66);
                      *puVar71 = afVar117._0_8_;
                      puVar71[1] = uVar109;
                      lVar67 = lVar67 + 0x10;
                    }
                    a = local_160;
                  }
                }
                else if ((uVar44 == uVar57) &&
                        (iVar34 == 1 && (uVar58 == 1 && (uint)local_150 == uVar70))) {
                  Mat::create(this_00,uVar57,uVar70,uVar62,sVar60,uVar35,opt->blob_allocator);
                  if (this_00->data == (void *)0x0) {
                    return -100;
                  }
                  if ((long)this_00->c * this_00->cstep == 0) {
                    return -100;
                  }
                  if ((int)local_110 < 1) {
                    local_110._0_4_ = 0;
                  }
                  iVar34 = (int)local_138;
                  local_138 = local_138 & 0xffffffff;
                  if (iVar34 < 1) {
                    local_138 = 0;
                  }
                  for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_138;
                      local_150 = (__m512 *)((long)local_150 + 1)) {
                    pvVar9 = local_160->data;
                    lVar66 = local_160[1].cstep * local_160[1].elemsize * (long)local_150;
                    pvVar69 = local_160[1].data;
                    lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
                    pvVar75 = this_00->data;
                    lVar67 = 0;
                    iVar34 = (int)local_110;
                    while (afVar81 = local_c0, bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                      local_c0[1] = *(float *)((long)pvVar9 + lVar67);
                      local_c0[0] = local_c0[1];
                      local_c0[2] = local_c0[1];
                      local_c0._16_48_ = afVar81._16_48_;
                      local_c0[3] = local_c0[1];
                      pauVar47 = (undefined1 (*) [16])((long)pvVar69 + lVar67 * 4 + lVar66);
                      auVar110 = ZEXT856(*(ulong *)(*pauVar47 + 8));
                      local_100._0_16_ = *pauVar47;
                      afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                           (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                      auVar103._0_8_ = afVar117._0_8_;
                      auVar103._8_56_ = auVar110;
                      *(undefined1 (*) [16])((long)pvVar75 + lVar67 * 4 + lVar48) = auVar103._0_16_;
                      lVar67 = lVar67 + 4;
                    }
                  }
                }
                else if ((((uVar44 ^ 1) == 0 && ((uint)local_150 ^ uVar70) == 0) && uVar59 == 0) &&
                         uVar57 != 1) {
                  Mat::create(this_00,uVar57,uVar70,uVar58,local_108,iVar34,opt->blob_allocator);
                  if (this_00->data == (void *)0x0) {
                    return -100;
                  }
                  if ((long)this_00->c * this_00->cstep == 0) {
                    return -100;
                  }
                  uVar68 = 0;
                  pafVar65 = (__m512 *)((ulong)local_158 & 0xffffffff);
                  if ((int)local_158 < 1) {
                    pafVar65 = (__m512 *)uVar68;
                  }
                  pafVar54 = (__m512 *)((ulong)local_148 & 0xffffffff);
                  if ((int)local_148 < 1) {
                    pafVar54 = (__m512 *)uVar68;
                  }
                  iVar34 = (int)local_128;
                  local_128 = local_128 & 0xffffffff;
                  if (iVar34 < 1) {
                    local_128 = uVar68;
                  }
                  local_158 = pafVar65;
                  local_148 = pafVar54;
                  for (local_130 = (Option *)0x0; local_130 != (Option *)local_128;
                      local_130 = (Option *)((long)local_130 + 1)) {
                    pauVar74 = (undefined1 (*) [16])
                               (local_160->cstep * (long)local_130 * local_160->elemsize +
                               (long)local_160->data);
                    local_140 = (Mat *)(local_160[1].cstep * (long)local_130 * local_160[1].elemsize
                                       + (long)local_160[1].data);
                    pauVar47 = (undefined1 (*) [16])
                               (this_00->cstep * (long)local_130 * this_00->elemsize +
                               (long)this_00->data);
                    for (local_150 = (__m512 *)0x0; local_150 != pafVar54;
                        local_150 = (__m512 *)((long)local_150 + 1)) {
                      local_c0._0_16_ =
                           *(undefined1 (*) [16])((long)local_140 + (long)local_150 * 0x10);
                      uVar68 = (ulong)pafVar65 & 0xffffffff;
                      while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                        auVar110 = ZEXT856(*(ulong *)((long)*pauVar74 + 8));
                        local_100._0_16_ = *pauVar74;
                        afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                             (&local_161,(__m128 *)local_100,(__m128 *)local_c0);
                        auVar104._0_8_ = afVar117._0_8_;
                        auVar104._8_56_ = auVar110;
                        *pauVar47 = auVar104._0_16_;
                        pauVar74 = pauVar74 + 1;
                        pauVar47 = pauVar47 + 1;
                      }
                      pafVar65 = local_158;
                      pafVar54 = local_148;
                    }
                  }
                }
                else if ((((uint)local_120 == 0 && (uVar44 ^ uVar57) == 0) && uVar59 == 0) &&
                         uVar70 != 1) {
                  Mat::create(this_00,uVar57,uVar70,uVar58,local_108,iVar34,opt->blob_allocator);
                  if (this_00->data == (void *)0x0) {
                    return -100;
                  }
                  if ((long)this_00->c * this_00->cstep == 0) {
                    return -100;
                  }
                  uVar68 = (ulong)local_158 & 0xffffffff;
                  if ((int)local_158 < 1) {
                    uVar68 = 0;
                  }
                  iVar34 = (int)local_148;
                  local_148 = (__m512 *)((ulong)local_148 & 0xffffffff);
                  if (iVar34 < 1) {
                    local_148 = (__m512 *)0x0;
                  }
                  iVar34 = (int)local_128;
                  local_128 = local_128 & 0xffffffff;
                  if (iVar34 < 1) {
                    local_128 = 0;
                  }
                  for (local_140 = (Mat *)0x0; local_140 != (Mat *)local_128;
                      local_140 = (Mat *)((long)local_140 + 1)) {
                    pvVar75 = (void *)(local_160->cstep * (long)local_140 * local_160->elemsize +
                                      (long)local_160->data);
                    pvVar69 = (void *)(this_00->cstep * (long)local_140 * this_00->elemsize +
                                      (long)this_00->data);
                    lVar48 = local_160[1].cstep * local_160[1].elemsize * (long)local_140;
                    pvVar9 = local_160[1].data;
                    for (local_150._0_4_ = 0; (uint)local_150 != (int)local_148;
                        local_150._0_4_ = (uint)local_150 + 1) {
                      for (lVar66 = 0; uVar68 * 0x10 != lVar66; lVar66 = lVar66 + 0x10) {
                        local_c0._0_16_ = *(undefined1 (*) [16])((long)pvVar75 + lVar66);
                        pauVar47 = (undefined1 (*) [16])((long)pvVar9 + lVar66 + lVar48);
                        auVar110 = ZEXT856(*(ulong *)(*pauVar47 + 8));
                        local_100._0_16_ = *pauVar47;
                        afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                             (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                        auVar105._0_8_ = afVar117._0_8_;
                        auVar105._8_56_ = auVar110;
                        *(undefined1 (*) [16])((long)pvVar69 + lVar66) = auVar105._0_16_;
                      }
                      pvVar75 = (void *)((long)pvVar75 + lVar66);
                      pvVar69 = (void *)((long)pvVar69 + lVar66);
                    }
                  }
                }
                else if ((((uVar57 ^ 1) == 0 && ((uint)local_150 ^ uVar70) == 0) && uVar59 == 0) &&
                         uVar44 != 1) {
                  Mat::create(this_00,uVar44,uVar70,uVar58,sVar60,uVar35,opt->blob_allocator);
                  if (this_00->data == (void *)0x0) {
                    return -100;
                  }
                  if ((long)this_00->c * this_00->cstep == 0) {
                    return -100;
                  }
                  iVar34 = (uint)local_140;
                  if ((int)(uint)local_140 < 1) {
                    iVar34 = 0;
                  }
                  iVar38 = (int)local_148;
                  local_148 = (__m512 *)((ulong)local_148 & 0xffffffff);
                  if (iVar38 < 1) {
                    local_148 = (__m512 *)0x0;
                  }
                  iVar38 = (int)local_128;
                  local_128 = local_128 & 0xffffffff;
                  if (iVar38 < 1) {
                    local_128 = 0;
                  }
                  local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
                  for (local_130 = (Option *)0x0; local_130 != (Option *)local_128;
                      local_130 = (Option *)((long)local_130 + 1)) {
                    local_158 = (__m512 *)
                                (local_160->cstep * (long)local_130 * local_160->elemsize +
                                (long)local_160->data);
                    pauVar47 = (undefined1 (*) [16])
                               (local_160[1].cstep * (long)local_130 * local_160[1].elemsize +
                               (long)local_160[1].data);
                    pauVar74 = (undefined1 (*) [16])
                               (this_00->cstep * (long)local_130 * this_00->elemsize +
                               (long)this_00->data);
                    for (local_150 = (__m512 *)0x0; local_150 != local_148;
                        local_150 = (__m512 *)((long)local_150 + 1)) {
                      local_c0._0_16_ =
                           *(undefined1 (*) [16])((long)local_158 + (long)local_150 * 0x10);
                      while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                        auVar110 = ZEXT856(*(ulong *)((long)*pauVar47 + 8));
                        local_100._0_16_ = *pauVar47;
                        afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                             (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                        auVar106._0_8_ = afVar117._0_8_;
                        auVar106._8_56_ = auVar110;
                        *pauVar74 = auVar106._0_16_;
                        pauVar47 = pauVar47 + 1;
                        pauVar74 = pauVar74 + 1;
                      }
                      iVar34 = (uint)local_140;
                    }
                  }
                }
                else {
                  if ((((uVar44 ^ uVar57) != 0 || (uVar70 ^ 1) != 0) || uVar59 != 0) ||
                      (uint)local_150 == 1) goto LAB_0037a52a;
                  Mat::create(this_00,uVar57,(uint)local_150,uVar58,sVar60,uVar35,
                              opt->blob_allocator);
                  if (this_00->data == (void *)0x0) {
                    return -100;
                  }
                  if ((long)this_00->c * this_00->cstep == 0) {
                    return -100;
                  }
                  uVar68 = (ulong)local_158 & 0xffffffff;
                  if ((int)local_158 < 1) {
                    uVar68 = 0;
                  }
                  if ((int)(uint)local_150 < 1) {
                    local_150._0_4_ = 0;
                  }
                  iVar34 = (int)local_128;
                  local_128 = local_128 & 0xffffffff;
                  if (iVar34 < 1) {
                    local_128 = 0;
                  }
                  for (local_148 = (__m512 *)0x0; local_148 != (__m512 *)local_128;
                      local_148 = (__m512 *)((long)local_148 + 1)) {
                    pvVar69 = (void *)(local_160[1].cstep * (long)local_148 * local_160[1].elemsize
                                      + (long)local_160[1].data);
                    pvVar75 = (void *)(this_00->cstep * (long)local_148 * this_00->elemsize +
                                      (long)this_00->data);
                    lVar48 = local_160->cstep * local_160->elemsize * (long)local_148;
                    pvVar9 = local_160->data;
                    iVar34 = 0;
                    while( true ) {
                      local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
                      if (iVar34 == (uint)local_150) break;
                      for (lVar66 = 0; uVar68 * 0x10 != lVar66; lVar66 = lVar66 + 0x10) {
                        local_c0._0_16_ = *(undefined1 (*) [16])((long)pvVar9 + lVar66 + lVar48);
                        auVar110 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)pvVar69 + lVar66)
                                                     + 8));
                        local_100._0_16_ = *(undefined1 (*) [16])((long)pvVar69 + lVar66);
                        afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                             (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                        auVar107._0_8_ = afVar117._0_8_;
                        auVar107._8_56_ = auVar110;
                        *(undefined1 (*) [16])((long)pvVar75 + lVar66) = auVar107._0_16_;
                      }
                      iVar34 = (uint)local_140 + 1;
                      pvVar69 = (void *)((long)pvVar69 + lVar66);
                      pvVar75 = (void *)((long)pvVar75 + lVar66);
                    }
                  }
                }
              }
            }
            else if (a[1].dims == 4) {
              Mat::create(this_00,uVar44,(uint)local_150,(uint)local_130,uVar62,sVar60,uVar35,
                          opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              uVar68 = (ulong)uVar44;
              if ((int)uVar44 < 1) {
                uVar68 = 0;
              }
              if ((int)(uint)local_150 < 1) {
                local_150._0_4_ = 0;
              }
              if ((int)(uint)local_130 < 1) {
                local_130._0_4_ = 0;
              }
              iVar34 = (int)local_138;
              local_138 = local_138 & 0xffffffff;
              if (iVar34 < 1) {
                local_138 = 0;
              }
              local_140 = (Mat *)CONCAT44(local_140._4_4_,(int)uVar68);
              for (local_128 = 0; local_128 != local_138; local_128 = local_128 + 1) {
                local_148 = (__m512 *)
                            (local_160->cstep * local_128 * local_160->elemsize +
                            (long)local_160->data);
                pauVar47 = (undefined1 (*) [16])
                           (local_160[1].cstep * local_128 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar74 = (undefined1 (*) [16])
                           (this_00->cstep * local_128 * this_00->elemsize + (long)this_00->data);
                for (iVar34 = 0; iVar34 != (uint)local_130; iVar34 = iVar34 + 1) {
                  local_158 = (__m512 *)CONCAT44(local_158._4_4_,iVar34);
                  for (iVar38 = 0; iVar38 != (uint)local_150; iVar38 = iVar38 + 1) {
                    local_c0._0_16_ = *(undefined1 (*) [16])local_148;
                    while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      auVar110 = ZEXT856(*(ulong *)((long)*pauVar47 + 8));
                      local_100._0_16_ = *pauVar47;
                      afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                           (&local_161,(__m128 *)local_c0,(__m128 *)local_100);
                      auVar98._0_8_ = afVar117._0_8_;
                      auVar98._8_56_ = auVar110;
                      *pauVar74 = auVar98._0_16_;
                      pauVar47 = pauVar47 + 1;
                      pauVar74 = pauVar74 + 1;
                    }
                    local_148 = (__m512 *)((long)local_148 + 0x10);
                    uVar68 = (ulong)local_140 & 0xffffffff;
                    iVar34 = (int)local_158;
                  }
                }
              }
            }
            else {
              local_118 = CONCAT44(local_118._4_4_,uVar35);
              Mat::create(this_00,uVar57,uVar70,uVar58,local_108,iVar34,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep == 0) {
                return -100;
              }
              iVar34 = (int)local_128;
              if (a[1].dims == 1) {
                if ((int)local_118 == 1 && a[1].w == 1) goto LAB_00385851;
                if ((int)(uint)local_120 < 1) {
                  local_120._0_4_ = 0;
                }
                local_128 = local_128 & 0xffffffff;
                if (iVar34 < 1) {
                  local_128 = 0;
                }
                for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
                    local_150 = (__m512 *)((long)local_150 + 1)) {
                  lVar66 = a->cstep * a->elemsize * (long)local_150;
                  pvVar9 = a->data;
                  local_c0._0_16_ = *(undefined1 (*) [16])((long)a[1].data + (long)local_150 * 0x10)
                  ;
                  lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
                  pvVar69 = this_00->data;
                  lVar67 = 0;
                  iVar34 = (uint)local_120;
                  while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                    pauVar47 = (undefined1 (*) [16])((long)pvVar9 + lVar67 + lVar66);
                    uVar109 = *(undefined8 *)(*pauVar47 + 8);
                    local_100._0_16_ = *pauVar47;
                    afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                         (&local_161,(__m128 *)local_100,(__m128 *)local_c0);
                    puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
                    *puVar71 = afVar117._0_8_;
                    puVar71[1] = uVar109;
                    lVar67 = lVar67 + 0x10;
                  }
                  a = local_160;
                }
              }
              else {
                if (a[1].dims != 2) {
                  return 0;
                }
                pafVar65 = (__m512 *)((ulong)local_158 & 0xffffffff);
                if ((int)local_158 < 1) {
                  pafVar65 = (__m512 *)0x0;
                }
                pafVar54 = (__m512 *)((ulong)local_148 & 0xffffffff);
                if ((int)local_148 < 1) {
                  pafVar54 = (__m512 *)0x0;
                }
                local_128 = local_128 & 0xffffffff;
                if (iVar34 < 1) {
                  local_128 = 0;
                }
                local_158 = pafVar65;
                local_148 = pafVar54;
                for (local_130 = (Option *)0x0; local_130 != (Option *)local_128;
                    local_130 = (Option *)((long)local_130 + 1)) {
                  pauVar74 = (undefined1 (*) [16])
                             (local_160->cstep * (long)local_130 * local_160->elemsize +
                             (long)local_160->data);
                  local_150 = (__m512 *)
                              ((long)local_160[1].w * (long)local_130 * local_160[1].elemsize +
                              (long)local_160[1].data);
                  pauVar47 = (undefined1 (*) [16])
                             (this_00->cstep * (long)local_130 * this_00->elemsize +
                             (long)this_00->data);
                  iVar34 = 0;
                  while (iVar34 != (int)pafVar54) {
                    local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
                    local_c0._0_16_ = *(undefined1 (*) [16])local_150;
                    uVar68 = (ulong)pafVar65 & 0xffffffff;
                    while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      auVar110 = ZEXT856(*(ulong *)((long)*pauVar74 + 8));
                      local_100._0_16_ = *pauVar74;
                      afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                           (&local_161,(__m128 *)local_100,(__m128 *)local_c0);
                      auVar101._0_8_ = afVar117._0_8_;
                      auVar101._8_56_ = auVar110;
                      *pauVar47 = auVar101._0_16_;
                      pauVar74 = pauVar74 + 1;
                      pauVar47 = pauVar47 + 1;
                    }
                    local_150 = (__m512 *)((long)local_150 + 0x10);
                    pafVar65 = local_158;
                    pafVar54 = local_148;
                    iVar34 = (uint)local_140 + 1;
                  }
                }
              }
            }
            break;
          case 4:
            if (a[1].dims == 4) {
LAB_0037a52a:
              iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                                 (a,b,this_00,opt);
              return iVar34;
            }
            local_118 = CONCAT44(local_118._4_4_,uVar35);
            Mat::create(this_00,uVar57,uVar70,iVar38,uVar58,local_108,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            iVar34 = a[1].dims;
            iVar41 = (int)local_128;
            if (iVar34 == 1) {
              if ((int)local_118 == 1 && a[1].w == 1) goto LAB_00385851;
              if ((int)(uint)local_120 < 1) {
                local_120._0_4_ = 0;
              }
              local_128 = local_128 & 0xffffffff;
              if (iVar41 < 1) {
                local_128 = 0;
              }
              for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
                  local_150 = (__m512 *)((long)local_150 + 1)) {
                lVar67 = a->cstep * a->elemsize * (long)local_150;
                pvVar9 = a->data;
                local_c0._0_16_ = *(undefined1 (*) [16])((long)a[1].data + (long)local_150 * 0x10);
                lVar66 = this_00->cstep * this_00->elemsize * (long)local_150;
                pvVar69 = this_00->data;
                lVar48 = 0;
                iVar34 = (uint)local_120;
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  pauVar47 = (undefined1 (*) [16])((long)pvVar9 + lVar48 + lVar67);
                  uVar109 = *(undefined8 *)(*pauVar47 + 8);
                  local_100._0_16_ = *pauVar47;
                  afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                       (&local_161,(__m128 *)local_100,(__m128 *)local_c0);
                  puVar71 = (undefined8 *)((long)pvVar69 + lVar48 + lVar66);
                  *puVar71 = afVar117._0_8_;
                  puVar71[1] = uVar109;
                  lVar48 = lVar48 + 0x10;
                }
                a = local_160;
              }
            }
            else if (iVar34 == 3) {
              pafVar65 = (__m512 *)((ulong)local_158 & 0xffffffff);
              if ((int)local_158 < 1) {
                pafVar65 = (__m512 *)0x0;
              }
              pafVar54 = (__m512 *)((ulong)local_148 & 0xffffffff);
              if ((int)local_148 < 1) {
                pafVar54 = (__m512 *)0x0;
              }
              if (iVar38 < 1) {
                iVar38 = 0;
              }
              local_138 = CONCAT44(local_138._4_4_,iVar38);
              local_128 = local_128 & 0xffffffff;
              if (iVar41 < 1) {
                local_128 = 0;
              }
              local_158 = pafVar65;
              local_148 = pafVar54;
              for (local_120 = 0; local_120 != local_128; local_120 = local_120 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           (local_160->cstep * local_120 * local_160->elemsize +
                           (long)local_160->data);
                local_150 = (__m512 *)
                            (local_160[1].cstep * local_120 * local_160[1].elemsize +
                            (long)local_160[1].data);
                pauVar74 = (undefined1 (*) [16])
                           (this_00->cstep * local_120 * this_00->elemsize + (long)this_00->data);
                for (local_130._0_4_ = 0; (uint)local_130 != (int)local_138;
                    local_130._0_4_ = (uint)local_130 + 1) {
                  iVar34 = 0;
                  while (iVar34 != (int)pafVar54) {
                    local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
                    local_c0._0_16_ = *(undefined1 (*) [16])local_150;
                    uVar68 = (ulong)pafVar65 & 0xffffffff;
                    while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      auVar110 = ZEXT856(*(ulong *)((long)*pauVar47 + 8));
                      local_100._0_16_ = *pauVar47;
                      afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                           (&local_161,(__m128 *)local_100,(__m128 *)local_c0);
                      auVar80._0_8_ = afVar117._0_8_;
                      auVar80._8_56_ = auVar110;
                      *pauVar74 = auVar80._0_16_;
                      pauVar47 = pauVar47 + 1;
                      pauVar74 = pauVar74 + 1;
                    }
                    local_150 = (__m512 *)((long)local_150 + 0x10);
                    pafVar65 = local_158;
                    pafVar54 = local_148;
                    iVar34 = (uint)local_140 + 1;
                  }
                }
              }
            }
            else {
              if (iVar34 != 2) {
                return 0;
              }
              pafVar65 = (__m512 *)((ulong)local_158 & 0xffffffff);
              if ((int)local_158 < 1) {
                pafVar65 = (__m512 *)0x0;
              }
              pafVar54 = (__m512 *)((ulong)local_148 & 0xffffffff);
              if ((int)local_148 < 1) {
                pafVar54 = (__m512 *)0x0;
              }
              if (iVar38 < 1) {
                iVar38 = 0;
              }
              local_138 = CONCAT44(local_138._4_4_,iVar38);
              local_128 = local_128 & 0xffffffff;
              if (iVar41 < 1) {
                local_128 = 0;
              }
              local_158 = pafVar65;
              local_148 = pafVar54;
              for (local_120 = 0; local_120 != local_128; local_120 = local_120 + 1) {
                pauVar47 = (undefined1 (*) [16])
                           (local_160->cstep * local_120 * local_160->elemsize +
                           (long)local_160->data);
                local_130 = (Option *)
                            ((long)local_160[1].w * local_120 * local_160[1].elemsize +
                            (long)local_160[1].data);
                pauVar74 = (undefined1 (*) [16])
                           (this_00->cstep * local_120 * this_00->elemsize + (long)this_00->data);
                for (iVar34 = 0; iVar34 != (int)local_138; iVar34 = iVar34 + 1) {
                  local_c0._0_16_ = local_130->lightmode;
                  local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
                  for (local_150._0_4_ = 0; (uint)local_150 != (int)pafVar54;
                      local_150._0_4_ = (uint)local_150 + 1) {
                    uVar68 = (ulong)pafVar65 & 0xffffffff;
                    while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      auVar110 = ZEXT856(*(ulong *)((long)*pauVar47 + 8));
                      local_100._0_16_ = *pauVar47;
                      afVar117 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                           (&local_161,(__m128 *)local_100,(__m128 *)local_c0);
                      auVar79._0_8_ = afVar117._0_8_;
                      auVar79._8_56_ = auVar110;
                      *pauVar74 = auVar79._0_16_;
                      pauVar47 = pauVar47 + 1;
                      pauVar74 = pauVar74 + 1;
                    }
                    pafVar65 = local_158;
                    pafVar54 = local_148;
                    iVar34 = (uint)local_140;
                  }
                  local_130 = (Option *)((long)local_130 + 0x10);
                }
              }
            }
          }
        }
        return 0;
      case 7:
        pMVar49 = a;
        break;
      case 8:
        pMVar49 = a;
LAB_003764ce:
        iVar34 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                           (b,pMVar49,this_00,opt);
        return iVar34;
      default:
        goto switchD_0037581f_default;
      }
      iVar34 = binary_op_pack4<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
                         (b,pMVar49,this_00,opt);
      return iVar34;
    }
    switch(*(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3])) {
    case 0:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
      uVar57 = a->w;
      uVar70 = a->h;
      uVar58 = a->d;
      uVar44 = a->c;
      local_158 = (__m512 *)(ulong)uVar44;
      local_138 = CONCAT44(local_138._4_4_,uVar70 * uVar57 * uVar58);
      sVar60 = a->elemsize;
      uVar62 = a[1].w;
      uVar37 = a[1].h;
      uVar59 = a[1].d;
      uVar3 = a[1].c;
      local_148 = (__m512 *)(ulong)uVar3;
      local_130 = (Option *)CONCAT44(local_130._4_4_,uVar37 * uVar62 * uVar59);
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar34 != 1 || uVar57 != 1) {
          switch(a[1].dims) {
          case 1:
switchD_00375756_caseD_1:
            local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
            Mat::create(this_00,uVar57,sVar60,iVar34,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            if (uVar35 == 1 && local_160[1].w == 1) goto LAB_00385822;
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                      (local_160,local_140,this_00,opt);
            break;
          case 2:
            Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
            pfVar40 = (float *)this_00->data;
            if (pfVar40 == (float *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            pfVar51 = (float *)local_160->data;
            pfVar43 = (float *)local_160[1].data;
            if ((int)uVar62 < 1) {
              uVar62 = 0;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              fVar2 = *pfVar51;
              fVar20 = pfVar51[1];
              fVar21 = pfVar51[2];
              fVar22 = pfVar51[3];
              fVar23 = pfVar51[4];
              fVar24 = pfVar51[5];
              fVar25 = pfVar51[6];
              fVar26 = pfVar51[7];
              uVar57 = uVar62;
              while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                fVar27 = pfVar43[1];
                fVar28 = pfVar43[2];
                fVar29 = pfVar43[3];
                fVar30 = pfVar43[4];
                fVar31 = pfVar43[5];
                fVar32 = pfVar43[6];
                fVar33 = pfVar43[7];
                *pfVar40 = fVar2 + *pfVar43;
                pfVar40[1] = fVar20 + fVar27;
                pfVar40[2] = fVar21 + fVar28;
                pfVar40[3] = fVar22 + fVar29;
                pfVar40[4] = fVar23 + fVar30;
                pfVar40[5] = fVar24 + fVar31;
                pfVar40[6] = fVar25 + fVar32;
                pfVar40[7] = fVar26 + fVar33;
                pfVar43 = pfVar43 + 8;
                pfVar40 = pfVar40 + 8;
              }
              pfVar51 = pfVar51 + 8;
            }
            break;
          case 3:
            Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)(uint)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              pfVar40 = (float *)((long)local_160->data + uVar64 * 0x20);
              fVar2 = *pfVar40;
              fVar20 = pfVar40[1];
              fVar21 = pfVar40[2];
              fVar22 = pfVar40[3];
              fVar23 = pfVar40[4];
              fVar24 = pfVar40[5];
              fVar25 = pfVar40[6];
              fVar26 = pfVar40[7];
              pvVar9 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                fVar27 = pfVar40[1];
                fVar28 = pfVar40[2];
                fVar29 = pfVar40[3];
                fVar30 = pfVar40[4];
                fVar31 = pfVar40[5];
                fVar32 = pfVar40[6];
                fVar33 = pfVar40[7];
                pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                *pfVar51 = fVar2 + *pfVar40;
                pfVar51[1] = fVar20 + fVar27;
                pfVar51[2] = fVar21 + fVar28;
                pfVar51[3] = fVar22 + fVar29;
                pfVar51[4] = fVar23 + fVar30;
                pfVar51[5] = fVar24 + fVar31;
                pfVar51[6] = fVar25 + fVar32;
                pfVar51[7] = fVar26 + fVar33;
                lVar48 = lVar48 + 0x20;
              }
            }
            break;
          case 4:
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep == 0) {
              return -100;
            }
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)(uint)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              pfVar40 = (float *)((long)local_160->data + uVar64 * 0x20);
              fVar2 = *pfVar40;
              fVar20 = pfVar40[1];
              fVar21 = pfVar40[2];
              fVar22 = pfVar40[3];
              fVar23 = pfVar40[4];
              fVar24 = pfVar40[5];
              fVar25 = pfVar40[6];
              fVar26 = pfVar40[7];
              pvVar9 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                fVar27 = pfVar40[1];
                fVar28 = pfVar40[2];
                fVar29 = pfVar40[3];
                fVar30 = pfVar40[4];
                fVar31 = pfVar40[5];
                fVar32 = pfVar40[6];
                fVar33 = pfVar40[7];
                pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                *pfVar51 = fVar2 + *pfVar40;
                pfVar51[1] = fVar20 + fVar27;
                pfVar51[2] = fVar21 + fVar28;
                pfVar51[3] = fVar22 + fVar29;
                pfVar51[4] = fVar23 + fVar30;
                pfVar51[5] = fVar24 + fVar31;
                pfVar51[6] = fVar25 + fVar32;
                pfVar51[7] = fVar26 + fVar33;
                lVar48 = lVar48 + 0x20;
              }
            }
          }
          return 0;
        }
        goto LAB_003758b0;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar46 = (undefined1 (*) [32])
                         ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data)
              ;
              pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                 (long)local_160[1].data);
              pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                auVar78 = *pauVar46;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  fVar2 = pfVar40[1];
                  fVar20 = pfVar40[2];
                  fVar21 = pfVar40[3];
                  fVar22 = pfVar40[4];
                  fVar23 = pfVar40[5];
                  fVar24 = pfVar40[6];
                  fVar25 = pfVar40[7];
                  *pfVar51 = auVar78._0_4_ + *pfVar40;
                  pfVar51[1] = auVar78._4_4_ + fVar2;
                  pfVar51[2] = auVar78._8_4_ + fVar20;
                  pfVar51[3] = auVar78._12_4_ + fVar21;
                  pfVar51[4] = auVar78._16_4_ + fVar22;
                  pfVar51[5] = auVar78._20_4_ + fVar23;
                  pfVar51[6] = auVar78._24_4_ + fVar24;
                  pfVar51[7] = auVar78._28_4_ + fVar25;
                  pfVar40 = pfVar40 + 8;
                  pfVar51 = pfVar51 + 8;
                }
                pauVar46 = pauVar46 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar46 = (undefined1 (*) [32])
                         ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data)
              ;
              pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                 (long)local_160[1].data);
              pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                auVar78 = *pauVar46;
                for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                  while ((int)uVar55 != 0) {
                    fVar2 = pfVar40[1];
                    fVar20 = pfVar40[2];
                    fVar21 = pfVar40[3];
                    fVar22 = pfVar40[4];
                    fVar23 = pfVar40[5];
                    fVar24 = pfVar40[6];
                    fVar25 = pfVar40[7];
                    *pfVar51 = auVar78._0_4_ + *pfVar40;
                    pfVar51[1] = auVar78._4_4_ + fVar2;
                    pfVar51[2] = auVar78._8_4_ + fVar20;
                    pfVar51[3] = auVar78._12_4_ + fVar21;
                    pfVar51[4] = auVar78._16_4_ + fVar22;
                    pfVar51[5] = auVar78._20_4_ + fVar23;
                    pfVar51[6] = auVar78._24_4_ + fVar24;
                    pfVar51[7] = auVar78._28_4_ + fVar25;
                    pfVar40 = pfVar40 + 8;
                    pfVar51 = pfVar51 + 8;
                    uVar55 = (ulong)((int)uVar55 - 1);
                  }
                }
                pauVar46 = pauVar46 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        local_118 = CONCAT44(local_118._4_4_,uVar35);
        Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = local_160[1].dims;
        if (iVar34 == 1) {
          Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
          pfVar40 = (float *)this_00->data;
          if (pfVar40 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_118 != 1 || local_160[1].w != 1) {
            pfVar51 = (float *)local_160->data;
            pfVar43 = (float *)local_160[1].data;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
              fVar2 = *pfVar43;
              fVar20 = pfVar43[1];
              fVar21 = pfVar43[2];
              fVar22 = pfVar43[3];
              fVar23 = pfVar43[4];
              fVar24 = pfVar43[5];
              fVar25 = pfVar43[6];
              fVar26 = pfVar43[7];
              uVar58 = uVar57;
              while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                fVar27 = pfVar51[1];
                fVar28 = pfVar51[2];
                fVar29 = pfVar51[3];
                fVar30 = pfVar51[4];
                fVar31 = pfVar51[5];
                fVar32 = pfVar51[6];
                fVar33 = pfVar51[7];
                *pfVar40 = fVar2 + *pfVar51;
                pfVar40[1] = fVar20 + fVar27;
                pfVar40[2] = fVar21 + fVar28;
                pfVar40[3] = fVar22 + fVar29;
                pfVar40[4] = fVar23 + fVar30;
                pfVar40[5] = fVar24 + fVar31;
                pfVar40[6] = fVar25 + fVar32;
                pfVar40[7] = fVar26 + fVar33;
                pfVar51 = pfVar51 + 8;
                pfVar40 = pfVar40 + 8;
              }
              pfVar43 = pfVar43 + 8;
            }
            return 0;
          }
          goto LAB_00385822;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * uVar64 * local_160->elemsize + (long)local_160->data)
                ;
                pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                   (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                  for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                    auVar78 = *pauVar46;
                    uVar55 = uVar68;
                    while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      fVar2 = pfVar40[1];
                      fVar20 = pfVar40[2];
                      fVar21 = pfVar40[3];
                      fVar22 = pfVar40[4];
                      fVar23 = pfVar40[5];
                      fVar24 = pfVar40[6];
                      fVar25 = pfVar40[7];
                      *pfVar51 = auVar78._0_4_ + *pfVar40;
                      pfVar51[1] = auVar78._4_4_ + fVar2;
                      pfVar51[2] = auVar78._8_4_ + fVar20;
                      pfVar51[3] = auVar78._12_4_ + fVar21;
                      pfVar51[4] = auVar78._16_4_ + fVar22;
                      pfVar51[5] = auVar78._20_4_ + fVar23;
                      pfVar51[6] = auVar78._24_4_ + fVar24;
                      pfVar51[7] = auVar78._28_4_ + fVar25;
                      pfVar40 = pfVar40 + 8;
                      pfVar51 = pfVar51 + 8;
                    }
                    pauVar46 = pauVar46 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_160[1].dims != 1) {
            if (local_160[1].dims == 2) {
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                   (long)local_160->data);
                pauVar46 = (undefined1 (*) [32])
                           ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                  auVar78 = *pauVar46;
                  uVar58 = uVar57;
                  while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                    fVar2 = pfVar40[1];
                    fVar20 = pfVar40[2];
                    fVar21 = pfVar40[3];
                    fVar22 = pfVar40[4];
                    fVar23 = pfVar40[5];
                    fVar24 = pfVar40[6];
                    fVar25 = pfVar40[7];
                    *pfVar51 = auVar78._0_4_ + *pfVar40;
                    pfVar51[1] = auVar78._4_4_ + fVar2;
                    pfVar51[2] = auVar78._8_4_ + fVar20;
                    pfVar51[3] = auVar78._12_4_ + fVar21;
                    pfVar51[4] = auVar78._16_4_ + fVar22;
                    pfVar51[5] = auVar78._20_4_ + fVar23;
                    pfVar51[6] = auVar78._24_4_ + fVar24;
                    pfVar51[7] = auVar78._28_4_ + fVar25;
                    pfVar40 = pfVar40 + 8;
                    pfVar51 = pfVar51 + 8;
                  }
                  pauVar46 = pauVar46 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          if (uVar35 != 1 || local_160[1].w != 1) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              pfVar40 = (float *)((long)local_160[1].data + uVar68 * 0x20);
              fVar2 = *pfVar40;
              fVar20 = pfVar40[1];
              fVar21 = pfVar40[2];
              fVar22 = pfVar40[3];
              fVar23 = pfVar40[4];
              fVar24 = pfVar40[5];
              fVar25 = pfVar40[6];
              fVar26 = pfVar40[7];
              pvVar9 = local_160->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68);
                fVar27 = pfVar40[1];
                fVar28 = pfVar40[2];
                fVar29 = pfVar40[3];
                fVar30 = pfVar40[4];
                fVar31 = pfVar40[5];
                fVar32 = pfVar40[6];
                fVar33 = pfVar40[7];
                pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68);
                *pfVar51 = fVar2 + *pfVar40;
                pfVar51[1] = fVar20 + fVar27;
                pfVar51[2] = fVar21 + fVar28;
                pfVar51[3] = fVar22 + fVar29;
                pfVar51[4] = fVar23 + fVar30;
                pfVar51[5] = fVar24 + fVar31;
                pfVar51[6] = fVar25 + fVar32;
                pfVar51[7] = fVar26 + fVar33;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          goto LAB_00385822;
        }
        uVar58 = uVar3 ^ uVar44;
        if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = local_138 & 0xffffffff;
            if ((int)local_138 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              sVar7 = this_00->cstep;
              pvVar9 = local_160->data;
              pfVar40 = (float *)((long)local_160[1].data +
                                 local_160[1].cstep * uVar64 * local_160[1].elemsize);
              fVar2 = *pfVar40;
              fVar20 = pfVar40[1];
              fVar21 = pfVar40[2];
              fVar22 = pfVar40[3];
              fVar23 = pfVar40[4];
              fVar24 = pfVar40[5];
              fVar25 = pfVar40[6];
              fVar26 = pfVar40[7];
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                fVar27 = pfVar40[1];
                fVar28 = pfVar40[2];
                fVar29 = pfVar40[3];
                fVar30 = pfVar40[4];
                fVar31 = pfVar40[5];
                fVar32 = pfVar40[6];
                fVar33 = pfVar40[7];
                pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                *pfVar51 = fVar2 + *pfVar40;
                pfVar51[1] = fVar20 + fVar27;
                pfVar51[2] = fVar21 + fVar28;
                pfVar51[3] = fVar22 + fVar29;
                pfVar51[4] = fVar23 + fVar30;
                pfVar51[5] = fVar24 + fVar31;
                pfVar51[6] = fVar25 + fVar32;
                pfVar51[7] = fVar26 + fVar33;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = uVar68;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              pvVar9 = local_160[1].data;
              pvVar69 = local_160->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar75 = this_00->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                fVar2 = *(float *)((long)pvVar9 + lVar48);
                pfVar40 = (float *)((long)pvVar69 + lVar48 * 8 + sVar60 * sVar5 * uVar68);
                auVar92._0_4_ = fVar2 + *pfVar40;
                auVar92._4_4_ = fVar2 + pfVar40[1];
                auVar92._8_4_ = fVar2 + pfVar40[2];
                auVar92._12_4_ = fVar2 + pfVar40[3];
                auVar92._16_4_ = fVar2 + pfVar40[4];
                auVar92._20_4_ = fVar2 + pfVar40[5];
                auVar92._24_4_ = fVar2 + pfVar40[6];
                auVar92._28_4_ = fVar2 + pfVar40[7];
                *(undefined1 (*) [32])((long)pvVar75 + lVar48 * 8 + sVar7 * sVar8 * uVar68) =
                     auVar92;
                lVar48 = lVar48 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_138 = sVar60;
        if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
          Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)(uint)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              sVar7 = this_00->cstep;
              pvVar9 = local_160[1].data;
              pfVar40 = (float *)((long)local_160->data +
                                 local_160->cstep * uVar64 * local_160->elemsize);
              fVar2 = *pfVar40;
              fVar20 = pfVar40[1];
              fVar21 = pfVar40[2];
              fVar22 = pfVar40[3];
              fVar23 = pfVar40[4];
              fVar24 = pfVar40[5];
              fVar25 = pfVar40[6];
              fVar26 = pfVar40[7];
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                fVar27 = pfVar40[1];
                fVar28 = pfVar40[2];
                fVar29 = pfVar40[3];
                fVar30 = pfVar40[4];
                fVar31 = pfVar40[5];
                fVar32 = pfVar40[6];
                fVar33 = pfVar40[7];
                pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                *pfVar51 = fVar2 + *pfVar40;
                pfVar51[1] = fVar20 + fVar27;
                pfVar51[2] = fVar21 + fVar28;
                pfVar51[3] = fVar22 + fVar29;
                pfVar51[4] = fVar23 + fVar30;
                pfVar51[5] = fVar24 + fVar31;
                pfVar51[6] = fVar25 + fVar32;
                pfVar51[7] = fVar26 + fVar33;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar62 == uVar57) && (iVar34 == 1)) && ((uVar37 == uVar70 && (uVar44 == 1)))) {
          Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)(uint)local_130 < 1) {
              local_130._0_4_ = 0;
            }
            uVar64 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar64 = uVar68;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160->data;
              pvVar69 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar75 = this_00->data;
              lVar48 = 0;
              iVar34 = (uint)local_130;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                fVar2 = *(float *)((long)pvVar9 + lVar48);
                pfVar40 = (float *)((long)pvVar69 + lVar48 * 8 + sVar60 * sVar5 * uVar68);
                auVar94._0_4_ = fVar2 + *pfVar40;
                auVar94._4_4_ = fVar2 + pfVar40[1];
                auVar94._8_4_ = fVar2 + pfVar40[2];
                auVar94._12_4_ = fVar2 + pfVar40[3];
                auVar94._16_4_ = fVar2 + pfVar40[4];
                auVar94._20_4_ = fVar2 + pfVar40[5];
                auVar94._24_4_ = fVar2 + pfVar40[6];
                auVar94._28_4_ = fVar2 + pfVar40[7];
                *(undefined1 (*) [32])((long)pvVar75 + lVar48 * 8 + sVar7 * sVar8 * uVar68) =
                     auVar94;
                lVar48 = lVar48 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_118 = CONCAT44(local_118._4_4_,uVar35);
        if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            uVar64 = (ulong)uVar70;
            if ((int)uVar70 < 1) {
              uVar64 = uVar68;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar68;
            }
            for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
              pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                 (long)local_160->data);
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160[1].data;
              pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
                auVar78 = *(undefined1 (*) [32])
                           ((long)pvVar9 + uVar55 * 0x20 + sVar60 * uVar68 * sVar5);
                uVar35 = uVar57;
                while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                  fVar2 = pfVar40[1];
                  fVar20 = pfVar40[2];
                  fVar21 = pfVar40[3];
                  fVar22 = pfVar40[4];
                  fVar23 = pfVar40[5];
                  fVar24 = pfVar40[6];
                  fVar25 = pfVar40[7];
                  *pfVar51 = auVar78._0_4_ + *pfVar40;
                  pfVar51[1] = auVar78._4_4_ + fVar2;
                  pfVar51[2] = auVar78._8_4_ + fVar20;
                  pfVar51[3] = auVar78._12_4_ + fVar21;
                  pfVar51[4] = auVar78._16_4_ + fVar22;
                  pfVar51[5] = auVar78._20_4_ + fVar23;
                  pfVar51[6] = auVar78._24_4_ + fVar24;
                  pfVar51[7] = auVar78._28_4_ + fVar25;
                  pfVar40 = pfVar40 + 8;
                  pfVar51 = pfVar51 + 8;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar57;
            if ((int)uVar57 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                                (long)local_160->data);
              sVar60 = local_160[1].cstep;
              pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160[1].data;
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                for (lVar48 = 0; uVar68 * 0x20 != lVar48; lVar48 = lVar48 + 0x20) {
                  pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                  pfVar51 = (float *)((long)pvVar69 + lVar48);
                  auVar96._0_4_ = *pfVar40 + *pfVar51;
                  auVar96._4_4_ = pfVar40[1] + pfVar51[1];
                  auVar96._8_4_ = pfVar40[2] + pfVar51[2];
                  auVar96._12_4_ = pfVar40[3] + pfVar51[3];
                  auVar96._16_4_ = pfVar40[4] + pfVar51[4];
                  auVar96._20_4_ = pfVar40[5] + pfVar51[5];
                  auVar96._24_4_ = pfVar40[6] + pfVar51[6];
                  auVar96._28_4_ = pfVar40[7] + pfVar51[7];
                  *(undefined1 (*) [32])((long)pvVar75 + lVar48) = auVar96;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar48);
                pvVar75 = (void *)((long)pvVar75 + lVar48);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
          Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)uVar70;
            if ((int)uVar70 < 1) {
              uVar63 = uVar64;
            }
            uVar55 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar55 = uVar64;
            }
            for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              pvVar9 = local_160->data;
              pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                 (long)local_160[1].data);
              pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
                auVar78 = *(undefined1 (*) [32])
                           ((long)pvVar9 + uVar56 * 0x20 + sVar60 * uVar64 * sVar5);
                uVar61 = uVar68;
                while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  fVar2 = pfVar40[1];
                  fVar20 = pfVar40[2];
                  fVar21 = pfVar40[3];
                  fVar22 = pfVar40[4];
                  fVar23 = pfVar40[5];
                  fVar24 = pfVar40[6];
                  fVar25 = pfVar40[7];
                  *pfVar51 = auVar78._0_4_ + *pfVar40;
                  pfVar51[1] = auVar78._4_4_ + fVar2;
                  pfVar51[2] = auVar78._8_4_ + fVar20;
                  pfVar51[3] = auVar78._12_4_ + fVar21;
                  pfVar51[4] = auVar78._16_4_ + fVar22;
                  pfVar51[5] = auVar78._20_4_ + fVar23;
                  pfVar51[6] = auVar78._24_4_ + fVar24;
                  pfVar51[7] = auVar78._28_4_ + fVar25;
                  pfVar40 = pfVar40 + 8;
                  pfVar51 = pfVar51 + 8;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
          Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar57;
            if ((int)uVar57 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                (long)local_160[1].data);
              pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_160->elemsize;
              pvVar9 = local_160->data;
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                for (lVar48 = 0; uVar68 * 0x20 != lVar48; lVar48 = lVar48 + 0x20) {
                  pfVar40 = (float *)((long)pvVar69 + lVar48);
                  pfVar51 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                  auVar97._0_4_ = *pfVar40 + *pfVar51;
                  auVar97._4_4_ = pfVar40[1] + pfVar51[1];
                  auVar97._8_4_ = pfVar40[2] + pfVar51[2];
                  auVar97._12_4_ = pfVar40[3] + pfVar51[3];
                  auVar97._16_4_ = pfVar40[4] + pfVar51[4];
                  auVar97._20_4_ = pfVar40[5] + pfVar51[5];
                  auVar97._24_4_ = pfVar40[6] + pfVar51[6];
                  auVar97._28_4_ = pfVar40[7] + pfVar51[7];
                  *(undefined1 (*) [32])((long)pvVar75 + lVar48) = auVar97;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar48);
                pvVar75 = (void *)((long)pvVar75 + lVar48);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003889f9;
      case 4:
        if (a[1].dims != 4) {
          local_130 = opt;
          Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar34 = local_160[1].dims;
          iVar38 = (int)local_158;
          if (iVar34 != 1) {
            if (iVar34 == 3) {
              uVar35 = 0;
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = uVar35;
              }
              if ((int)uVar70 < 1) {
                uVar70 = uVar35;
              }
              if ((int)uVar58 < 1) {
                uVar58 = uVar35;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                   (long)local_160->data);
                pauVar46 = (undefined1 (*) [32])
                           (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                  for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                    auVar78 = *pauVar46;
                    uVar62 = uVar57;
                    while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                      fVar2 = pfVar40[1];
                      fVar20 = pfVar40[2];
                      fVar21 = pfVar40[3];
                      fVar22 = pfVar40[4];
                      fVar23 = pfVar40[5];
                      fVar24 = pfVar40[6];
                      fVar25 = pfVar40[7];
                      *pfVar51 = auVar78._0_4_ + *pfVar40;
                      pfVar51[1] = auVar78._4_4_ + fVar2;
                      pfVar51[2] = auVar78._8_4_ + fVar20;
                      pfVar51[3] = auVar78._12_4_ + fVar21;
                      pfVar51[4] = auVar78._16_4_ + fVar22;
                      pfVar51[5] = auVar78._20_4_ + fVar23;
                      pfVar51[6] = auVar78._24_4_ + fVar24;
                      pfVar51[7] = auVar78._28_4_ + fVar25;
                      pfVar40 = pfVar40 + 8;
                      pfVar51 = pfVar51 + 8;
                    }
                    pauVar46 = pauVar46 + 1;
                  }
                }
              }
              return 0;
            }
            if (iVar34 == 2) {
              uVar35 = 0;
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = uVar35;
              }
              if ((int)uVar70 < 1) {
                uVar70 = uVar35;
              }
              if ((int)uVar58 < 1) {
                uVar58 = uVar35;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                   (long)local_160->data);
                pauVar46 = (undefined1 (*) [32])
                           ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                  auVar78 = *pauVar46;
                  for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                    while (uVar62 != 0) {
                      fVar2 = pfVar40[1];
                      fVar20 = pfVar40[2];
                      fVar21 = pfVar40[3];
                      fVar22 = pfVar40[4];
                      fVar23 = pfVar40[5];
                      fVar24 = pfVar40[6];
                      fVar25 = pfVar40[7];
                      *pfVar51 = auVar78._0_4_ + *pfVar40;
                      pfVar51[1] = auVar78._4_4_ + fVar2;
                      pfVar51[2] = auVar78._8_4_ + fVar20;
                      pfVar51[3] = auVar78._12_4_ + fVar21;
                      pfVar51[4] = auVar78._16_4_ + fVar22;
                      pfVar51[5] = auVar78._20_4_ + fVar23;
                      pfVar51[6] = auVar78._24_4_ + fVar24;
                      pfVar51[7] = auVar78._28_4_ + fVar25;
                      pfVar40 = pfVar40 + 8;
                      pfVar51 = pfVar51 + 8;
                      uVar62 = uVar62 - 1;
                    }
                  }
                  pauVar46 = pauVar46 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          opt = local_130;
          if (uVar35 != 1 || local_160[1].w != 1) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar9 = this_00->data;
              pfVar40 = (float *)((long)local_160[1].data + uVar68 * 0x20);
              fVar2 = *pfVar40;
              fVar20 = pfVar40[1];
              fVar21 = pfVar40[2];
              fVar22 = pfVar40[3];
              fVar23 = pfVar40[4];
              fVar24 = pfVar40[5];
              fVar25 = pfVar40[6];
              fVar26 = pfVar40[7];
              sVar8 = local_160->elemsize;
              pvVar69 = local_160->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                pfVar40 = (float *)((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68);
                fVar27 = pfVar40[1];
                fVar28 = pfVar40[2];
                fVar29 = pfVar40[3];
                fVar30 = pfVar40[4];
                fVar31 = pfVar40[5];
                fVar32 = pfVar40[6];
                fVar33 = pfVar40[7];
                pfVar51 = (float *)((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68);
                *pfVar51 = fVar2 + *pfVar40;
                pfVar51[1] = fVar20 + fVar27;
                pfVar51[2] = fVar21 + fVar28;
                pfVar51[3] = fVar22 + fVar29;
                pfVar51[4] = fVar23 + fVar30;
                pfVar51[5] = fVar24 + fVar31;
                pfVar51[6] = fVar25 + fVar32;
                pfVar51[7] = fVar26 + fVar33;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          goto LAB_00385822;
        }
        goto LAB_0037a150;
      }
      goto LAB_0037df07;
    case 1:
      pMVar49 = b;
      b = a;
      break;
    case 2:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
      uVar57 = a->w;
      uVar70 = a->h;
      uVar58 = a->d;
      uVar44 = a->c;
      local_158 = (__m512 *)(ulong)uVar44;
      local_138 = CONCAT44(local_138._4_4_,uVar70 * uVar57 * uVar58);
      sVar60 = a->elemsize;
      uVar62 = a[1].w;
      uVar37 = a[1].h;
      uVar59 = a[1].d;
      uVar3 = a[1].c;
      local_148 = (__m512 *)(ulong)uVar3;
      local_130 = (Option *)CONCAT44(local_130._4_4_,uVar37 * uVar62 * uVar59);
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar34 != 1 || uVar57 != 1) {
          switch(a[1].dims) {
          case 1:
            goto switchD_00375adb_caseD_1;
          case 2:
            Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
            pfVar40 = (float *)this_00->data;
            if (pfVar40 == (float *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              pfVar51 = (float *)local_160->data;
              pfVar43 = (float *)local_160[1].data;
              if ((int)uVar62 < 1) {
                uVar62 = 0;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                fVar2 = *pfVar51;
                fVar20 = pfVar51[1];
                fVar21 = pfVar51[2];
                fVar22 = pfVar51[3];
                fVar23 = pfVar51[4];
                fVar24 = pfVar51[5];
                fVar25 = pfVar51[6];
                uVar57 = uVar62;
                while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                  fVar26 = pfVar43[1];
                  fVar27 = pfVar43[2];
                  fVar28 = pfVar43[3];
                  fVar29 = pfVar43[4];
                  fVar30 = pfVar43[5];
                  fVar31 = pfVar43[6];
                  *pfVar40 = fVar2 * *pfVar43;
                  pfVar40[1] = fVar20 * fVar26;
                  pfVar40[2] = fVar21 * fVar27;
                  pfVar40[3] = fVar22 * fVar28;
                  pfVar40[4] = fVar23 * fVar29;
                  pfVar40[5] = fVar24 * fVar30;
                  pfVar40[6] = fVar25 * fVar31;
                  pfVar40[7] = in_register_0000125c;
                  pfVar43 = pfVar43 + 8;
                  pfVar40 = pfVar40 + 8;
                }
                pfVar51 = pfVar51 + 8;
              }
              return 0;
            }
            return -100;
          case 3:
            Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)local_130 & 0xffffffff;
              if ((int)(uint)local_130 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                pfVar40 = (float *)((long)local_160->data + uVar64 * 0x20);
                fVar2 = *pfVar40;
                fVar20 = pfVar40[1];
                fVar21 = pfVar40[2];
                fVar22 = pfVar40[3];
                fVar23 = pfVar40[4];
                fVar24 = pfVar40[5];
                fVar25 = pfVar40[6];
                pvVar9 = local_160[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                  fVar26 = pfVar40[1];
                  fVar27 = pfVar40[2];
                  fVar28 = pfVar40[3];
                  fVar29 = pfVar40[4];
                  fVar30 = pfVar40[5];
                  fVar31 = pfVar40[6];
                  pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                  *pfVar51 = fVar2 * *pfVar40;
                  pfVar51[1] = fVar20 * fVar26;
                  pfVar51[2] = fVar21 * fVar27;
                  pfVar51[3] = fVar22 * fVar28;
                  pfVar51[4] = fVar23 * fVar29;
                  pfVar51[5] = fVar24 * fVar30;
                  pfVar51[6] = fVar25 * fVar31;
                  pfVar51[7] = in_register_0000125c;
                  lVar48 = lVar48 + 0x20;
                }
              }
              return 0;
            }
            return -100;
          case 4:
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)local_130 & 0xffffffff;
              if ((int)(uint)local_130 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                pfVar40 = (float *)((long)local_160->data + uVar64 * 0x20);
                fVar2 = *pfVar40;
                fVar20 = pfVar40[1];
                fVar21 = pfVar40[2];
                fVar22 = pfVar40[3];
                fVar23 = pfVar40[4];
                fVar24 = pfVar40[5];
                fVar25 = pfVar40[6];
                pvVar9 = local_160[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                  fVar26 = pfVar40[1];
                  fVar27 = pfVar40[2];
                  fVar28 = pfVar40[3];
                  fVar29 = pfVar40[4];
                  fVar30 = pfVar40[5];
                  fVar31 = pfVar40[6];
                  pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                  *pfVar51 = fVar2 * *pfVar40;
                  pfVar51[1] = fVar20 * fVar26;
                  pfVar51[2] = fVar21 * fVar27;
                  pfVar51[3] = fVar22 * fVar28;
                  pfVar51[4] = fVar23 * fVar29;
                  pfVar51[5] = fVar24 * fVar30;
                  pfVar51[6] = fVar25 * fVar31;
                  pfVar51[7] = in_register_0000125c;
                  lVar48 = lVar48 + 0x20;
                }
              }
              return 0;
            }
            return -100;
          default:
            return 0;
          }
        }
        goto LAB_00376322;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar46 = (undefined1 (*) [32])
                         ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data)
              ;
              pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                 (long)local_160[1].data);
              pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                auVar78 = *pauVar46;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  fVar2 = pfVar40[1];
                  fVar20 = pfVar40[2];
                  fVar21 = pfVar40[3];
                  fVar22 = pfVar40[4];
                  fVar23 = pfVar40[5];
                  fVar24 = pfVar40[6];
                  *pfVar51 = auVar78._0_4_ * *pfVar40;
                  pfVar51[1] = auVar78._4_4_ * fVar2;
                  pfVar51[2] = auVar78._8_4_ * fVar20;
                  pfVar51[3] = auVar78._12_4_ * fVar21;
                  pfVar51[4] = auVar78._16_4_ * fVar22;
                  pfVar51[5] = auVar78._20_4_ * fVar23;
                  pfVar51[6] = auVar78._24_4_ * fVar24;
                  pfVar51[7] = in_register_0000125c;
                  pfVar40 = pfVar40 + 8;
                  pfVar51 = pfVar51 + 8;
                }
                pauVar46 = pauVar46 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar46 = (undefined1 (*) [32])
                         ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data)
              ;
              pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                 (long)local_160[1].data);
              pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                auVar78 = *pauVar46;
                for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                  while ((int)uVar55 != 0) {
                    fVar2 = pfVar40[1];
                    fVar20 = pfVar40[2];
                    fVar21 = pfVar40[3];
                    fVar22 = pfVar40[4];
                    fVar23 = pfVar40[5];
                    fVar24 = pfVar40[6];
                    *pfVar51 = auVar78._0_4_ * *pfVar40;
                    pfVar51[1] = auVar78._4_4_ * fVar2;
                    pfVar51[2] = auVar78._8_4_ * fVar20;
                    pfVar51[3] = auVar78._12_4_ * fVar21;
                    pfVar51[4] = auVar78._16_4_ * fVar22;
                    pfVar51[5] = auVar78._20_4_ * fVar23;
                    pfVar51[6] = auVar78._24_4_ * fVar24;
                    pfVar51[7] = in_register_0000125c;
                    pfVar40 = pfVar40 + 8;
                    pfVar51 = pfVar51 + 8;
                    uVar55 = (ulong)((int)uVar55 - 1);
                  }
                }
                pauVar46 = pauVar46 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        local_118 = CONCAT44(local_118._4_4_,uVar35);
        Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = local_160[1].dims;
        if (iVar34 == 1) {
          Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
          pfVar40 = (float *)this_00->data;
          if (pfVar40 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_118 != 1 || local_160[1].w != 1) {
            pfVar51 = (float *)local_160->data;
            pfVar43 = (float *)local_160[1].data;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
              fVar2 = *pfVar43;
              fVar20 = pfVar43[1];
              fVar21 = pfVar43[2];
              fVar22 = pfVar43[3];
              fVar23 = pfVar43[4];
              fVar24 = pfVar43[5];
              fVar25 = pfVar43[6];
              uVar58 = uVar57;
              while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                fVar26 = pfVar51[1];
                fVar27 = pfVar51[2];
                fVar28 = pfVar51[3];
                fVar29 = pfVar51[4];
                fVar30 = pfVar51[5];
                fVar31 = pfVar51[6];
                *pfVar40 = fVar2 * *pfVar51;
                pfVar40[1] = fVar20 * fVar26;
                pfVar40[2] = fVar21 * fVar27;
                pfVar40[3] = fVar22 * fVar28;
                pfVar40[4] = fVar23 * fVar29;
                pfVar40[5] = fVar24 * fVar30;
                pfVar40[6] = fVar25 * fVar31;
                pfVar40[7] = in_register_0000125c;
                pfVar51 = pfVar51 + 8;
                pfVar40 = pfVar40 + 8;
              }
              pfVar43 = pfVar43 + 8;
            }
            return 0;
          }
          goto LAB_0038571c;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * uVar64 * local_160->elemsize + (long)local_160->data)
                ;
                pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                   (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                  for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                    auVar78 = *pauVar46;
                    uVar55 = uVar68;
                    while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      fVar2 = pfVar40[1];
                      fVar20 = pfVar40[2];
                      fVar21 = pfVar40[3];
                      fVar22 = pfVar40[4];
                      fVar23 = pfVar40[5];
                      fVar24 = pfVar40[6];
                      *pfVar51 = auVar78._0_4_ * *pfVar40;
                      pfVar51[1] = auVar78._4_4_ * fVar2;
                      pfVar51[2] = auVar78._8_4_ * fVar20;
                      pfVar51[3] = auVar78._12_4_ * fVar21;
                      pfVar51[4] = auVar78._16_4_ * fVar22;
                      pfVar51[5] = auVar78._20_4_ * fVar23;
                      pfVar51[6] = auVar78._24_4_ * fVar24;
                      pfVar51[7] = in_register_0000125c;
                      pfVar40 = pfVar40 + 8;
                      pfVar51 = pfVar51 + 8;
                    }
                    pauVar46 = pauVar46 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_160[1].dims != 1) {
            if (local_160[1].dims == 2) {
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                   (long)local_160->data);
                pauVar46 = (undefined1 (*) [32])
                           ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                  auVar78 = *pauVar46;
                  uVar58 = uVar57;
                  while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                    fVar2 = pfVar40[1];
                    fVar20 = pfVar40[2];
                    fVar21 = pfVar40[3];
                    fVar22 = pfVar40[4];
                    fVar23 = pfVar40[5];
                    fVar24 = pfVar40[6];
                    *pfVar51 = auVar78._0_4_ * *pfVar40;
                    pfVar51[1] = auVar78._4_4_ * fVar2;
                    pfVar51[2] = auVar78._8_4_ * fVar20;
                    pfVar51[3] = auVar78._12_4_ * fVar21;
                    pfVar51[4] = auVar78._16_4_ * fVar22;
                    pfVar51[5] = auVar78._20_4_ * fVar23;
                    pfVar51[6] = auVar78._24_4_ * fVar24;
                    pfVar51[7] = in_register_0000125c;
                    pfVar40 = pfVar40 + 8;
                    pfVar51 = pfVar51 + 8;
                  }
                  pauVar46 = pauVar46 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          if (uVar35 != 1 || local_160[1].w != 1) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              pfVar40 = (float *)((long)local_160[1].data + uVar68 * 0x20);
              fVar2 = *pfVar40;
              fVar20 = pfVar40[1];
              fVar21 = pfVar40[2];
              fVar22 = pfVar40[3];
              fVar23 = pfVar40[4];
              fVar24 = pfVar40[5];
              fVar25 = pfVar40[6];
              pvVar9 = local_160->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68);
                fVar26 = pfVar40[1];
                fVar27 = pfVar40[2];
                fVar28 = pfVar40[3];
                fVar29 = pfVar40[4];
                fVar30 = pfVar40[5];
                fVar31 = pfVar40[6];
                pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68);
                *pfVar51 = fVar2 * *pfVar40;
                pfVar51[1] = fVar20 * fVar26;
                pfVar51[2] = fVar21 * fVar27;
                pfVar51[3] = fVar22 * fVar28;
                pfVar51[4] = fVar23 * fVar29;
                pfVar51[5] = fVar24 * fVar30;
                pfVar51[6] = fVar25 * fVar31;
                pfVar51[7] = in_register_0000125c;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          goto LAB_0038571c;
        }
        uVar58 = uVar3 ^ uVar44;
        if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = local_138 & 0xffffffff;
            if ((int)local_138 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              sVar7 = this_00->cstep;
              pvVar9 = local_160->data;
              pfVar40 = (float *)((long)local_160[1].data +
                                 local_160[1].cstep * uVar64 * local_160[1].elemsize);
              fVar2 = *pfVar40;
              fVar20 = pfVar40[1];
              fVar21 = pfVar40[2];
              fVar22 = pfVar40[3];
              fVar23 = pfVar40[4];
              fVar24 = pfVar40[5];
              fVar25 = pfVar40[6];
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                fVar26 = pfVar40[1];
                fVar27 = pfVar40[2];
                fVar28 = pfVar40[3];
                fVar29 = pfVar40[4];
                fVar30 = pfVar40[5];
                fVar31 = pfVar40[6];
                pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                *pfVar51 = fVar2 * *pfVar40;
                pfVar51[1] = fVar20 * fVar26;
                pfVar51[2] = fVar21 * fVar27;
                pfVar51[3] = fVar22 * fVar28;
                pfVar51[4] = fVar23 * fVar29;
                pfVar51[5] = fVar24 * fVar30;
                pfVar51[6] = fVar25 * fVar31;
                pfVar51[7] = in_register_0000125c;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = uVar68;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              pvVar9 = local_160[1].data;
              pvVar69 = local_160->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar75 = this_00->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                fVar2 = *(float *)((long)pvVar9 + lVar48);
                pfVar40 = (float *)((long)pvVar69 + lVar48 * 8 + sVar60 * sVar5 * uVar68);
                auVar16._4_4_ = fVar2 * pfVar40[1];
                auVar16._0_4_ = fVar2 * *pfVar40;
                auVar16._8_4_ = fVar2 * pfVar40[2];
                auVar16._12_4_ = fVar2 * pfVar40[3];
                auVar16._16_4_ = fVar2 * pfVar40[4];
                auVar16._20_4_ = fVar2 * pfVar40[5];
                auVar16._24_4_ = fVar2 * pfVar40[6];
                auVar16._28_4_ = fVar2;
                *(undefined1 (*) [32])((long)pvVar75 + lVar48 * 8 + sVar7 * sVar8 * uVar68) =
                     auVar16;
                lVar48 = lVar48 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_138 = sVar60;
        if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
          Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)(uint)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              sVar7 = this_00->cstep;
              pvVar9 = local_160[1].data;
              pfVar40 = (float *)((long)local_160->data +
                                 local_160->cstep * uVar64 * local_160->elemsize);
              fVar2 = *pfVar40;
              fVar20 = pfVar40[1];
              fVar21 = pfVar40[2];
              fVar22 = pfVar40[3];
              fVar23 = pfVar40[4];
              fVar24 = pfVar40[5];
              fVar25 = pfVar40[6];
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                fVar26 = pfVar40[1];
                fVar27 = pfVar40[2];
                fVar28 = pfVar40[3];
                fVar29 = pfVar40[4];
                fVar30 = pfVar40[5];
                fVar31 = pfVar40[6];
                pfVar51 = (float *)((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64);
                *pfVar51 = fVar2 * *pfVar40;
                pfVar51[1] = fVar20 * fVar26;
                pfVar51[2] = fVar21 * fVar27;
                pfVar51[3] = fVar22 * fVar28;
                pfVar51[4] = fVar23 * fVar29;
                pfVar51[5] = fVar24 * fVar30;
                pfVar51[6] = fVar25 * fVar31;
                pfVar51[7] = in_register_0000125c;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar62 == uVar57) && (iVar34 == 1)) && (uVar37 == uVar70)) && (uVar44 == 1)) {
          Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)(uint)local_130 < 1) {
              local_130._0_4_ = 0;
            }
            uVar64 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar64 = uVar68;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160->data;
              pvVar69 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar75 = this_00->data;
              lVar48 = 0;
              iVar34 = (uint)local_130;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                fVar2 = *(float *)((long)pvVar9 + lVar48);
                pfVar40 = (float *)((long)pvVar69 + lVar48 * 8 + sVar60 * sVar5 * uVar68);
                auVar17._4_4_ = fVar2 * pfVar40[1];
                auVar17._0_4_ = fVar2 * *pfVar40;
                auVar17._8_4_ = fVar2 * pfVar40[2];
                auVar17._12_4_ = fVar2 * pfVar40[3];
                auVar17._16_4_ = fVar2 * pfVar40[4];
                auVar17._20_4_ = fVar2 * pfVar40[5];
                auVar17._24_4_ = fVar2 * pfVar40[6];
                auVar17._28_4_ = fVar2;
                *(undefined1 (*) [32])((long)pvVar75 + lVar48 * 8 + sVar7 * sVar8 * uVar68) =
                     auVar17;
                lVar48 = lVar48 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_118 = CONCAT44(local_118._4_4_,uVar35);
        if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            uVar64 = (ulong)uVar70;
            if ((int)uVar70 < 1) {
              uVar64 = uVar68;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar68;
            }
            for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
              pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                 (long)local_160->data);
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160[1].data;
              pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
                auVar78 = *(undefined1 (*) [32])
                           ((long)pvVar9 + uVar55 * 0x20 + sVar60 * uVar68 * sVar5);
                uVar35 = uVar57;
                while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                  fVar2 = pfVar40[1];
                  fVar20 = pfVar40[2];
                  fVar21 = pfVar40[3];
                  fVar22 = pfVar40[4];
                  fVar23 = pfVar40[5];
                  fVar24 = pfVar40[6];
                  *pfVar51 = auVar78._0_4_ * *pfVar40;
                  pfVar51[1] = auVar78._4_4_ * fVar2;
                  pfVar51[2] = auVar78._8_4_ * fVar20;
                  pfVar51[3] = auVar78._12_4_ * fVar21;
                  pfVar51[4] = auVar78._16_4_ * fVar22;
                  pfVar51[5] = auVar78._20_4_ * fVar23;
                  pfVar51[6] = auVar78._24_4_ * fVar24;
                  pfVar51[7] = in_register_0000125c;
                  pfVar40 = pfVar40 + 8;
                  pfVar51 = pfVar51 + 8;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar57;
            if ((int)uVar57 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                                (long)local_160->data);
              sVar60 = local_160[1].cstep;
              pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160[1].data;
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                for (lVar48 = 0; uVar68 * 0x20 != lVar48; lVar48 = lVar48 + 0x20) {
                  pfVar40 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                  pfVar51 = (float *)((long)pvVar69 + lVar48);
                  auVar18._4_4_ = pfVar40[1] * pfVar51[1];
                  auVar18._0_4_ = *pfVar40 * *pfVar51;
                  auVar18._8_4_ = pfVar40[2] * pfVar51[2];
                  auVar18._12_4_ = pfVar40[3] * pfVar51[3];
                  auVar18._16_4_ = pfVar40[4] * pfVar51[4];
                  auVar18._20_4_ = pfVar40[5] * pfVar51[5];
                  auVar18._24_4_ = pfVar40[6] * pfVar51[6];
                  auVar18._28_4_ = pfVar40[7];
                  *(undefined1 (*) [32])((long)pvVar75 + lVar48) = auVar18;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar48);
                pvVar75 = (void *)((long)pvVar75 + lVar48);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
          Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)uVar70;
            if ((int)uVar70 < 1) {
              uVar63 = uVar64;
            }
            uVar55 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar55 = uVar64;
            }
            for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              pvVar9 = local_160->data;
              pfVar40 = (float *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                 (long)local_160[1].data);
              pfVar51 = (float *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
                auVar78 = *(undefined1 (*) [32])
                           ((long)pvVar9 + uVar56 * 0x20 + sVar60 * uVar64 * sVar5);
                uVar61 = uVar68;
                while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  fVar2 = pfVar40[1];
                  fVar20 = pfVar40[2];
                  fVar21 = pfVar40[3];
                  fVar22 = pfVar40[4];
                  fVar23 = pfVar40[5];
                  fVar24 = pfVar40[6];
                  *pfVar51 = auVar78._0_4_ * *pfVar40;
                  pfVar51[1] = auVar78._4_4_ * fVar2;
                  pfVar51[2] = auVar78._8_4_ * fVar20;
                  pfVar51[3] = auVar78._12_4_ * fVar21;
                  pfVar51[4] = auVar78._16_4_ * fVar22;
                  pfVar51[5] = auVar78._20_4_ * fVar23;
                  pfVar51[6] = auVar78._24_4_ * fVar24;
                  pfVar51[7] = in_register_0000125c;
                  pfVar40 = pfVar40 + 8;
                  pfVar51 = pfVar51 + 8;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
          Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar57;
            if ((int)uVar57 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                (long)local_160[1].data);
              pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_160->elemsize;
              pvVar9 = local_160->data;
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                for (lVar48 = 0; uVar68 * 0x20 != lVar48; lVar48 = lVar48 + 0x20) {
                  pfVar40 = (float *)((long)pvVar69 + lVar48);
                  pfVar51 = (float *)((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64);
                  auVar19._4_4_ = pfVar40[1] * pfVar51[1];
                  auVar19._0_4_ = *pfVar40 * *pfVar51;
                  auVar19._8_4_ = pfVar40[2] * pfVar51[2];
                  auVar19._12_4_ = pfVar40[3] * pfVar51[3];
                  auVar19._16_4_ = pfVar40[4] * pfVar51[4];
                  auVar19._20_4_ = pfVar40[5] * pfVar51[5];
                  auVar19._24_4_ = pfVar40[6] * pfVar51[6];
                  auVar19._28_4_ = pfVar40[7];
                  *(undefined1 (*) [32])((long)pvVar75 + lVar48) = auVar19;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar48);
                pvVar75 = (void *)((long)pvVar75 + lVar48);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003888f1;
      case 4:
        if (a[1].dims != 4) {
          local_130 = opt;
          Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar34 = local_160[1].dims;
          iVar38 = (int)local_158;
          if (iVar34 != 1) {
            if (iVar34 == 3) {
              uVar35 = 0;
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = uVar35;
              }
              if ((int)uVar70 < 1) {
                uVar70 = uVar35;
              }
              if ((int)uVar58 < 1) {
                uVar58 = uVar35;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                   (long)local_160->data);
                pauVar46 = (undefined1 (*) [32])
                           (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                  for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                    auVar78 = *pauVar46;
                    uVar62 = uVar57;
                    while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                      fVar2 = pfVar40[1];
                      fVar20 = pfVar40[2];
                      fVar21 = pfVar40[3];
                      fVar22 = pfVar40[4];
                      fVar23 = pfVar40[5];
                      fVar24 = pfVar40[6];
                      *pfVar51 = auVar78._0_4_ * *pfVar40;
                      pfVar51[1] = auVar78._4_4_ * fVar2;
                      pfVar51[2] = auVar78._8_4_ * fVar20;
                      pfVar51[3] = auVar78._12_4_ * fVar21;
                      pfVar51[4] = auVar78._16_4_ * fVar22;
                      pfVar51[5] = auVar78._20_4_ * fVar23;
                      pfVar51[6] = auVar78._24_4_ * fVar24;
                      pfVar51[7] = in_register_0000125c;
                      pfVar40 = pfVar40 + 8;
                      pfVar51 = pfVar51 + 8;
                    }
                    pauVar46 = pauVar46 + 1;
                  }
                }
              }
              return 0;
            }
            if (iVar34 == 2) {
              uVar35 = 0;
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = uVar35;
              }
              if ((int)uVar70 < 1) {
                uVar70 = uVar35;
              }
              if ((int)uVar58 < 1) {
                uVar58 = uVar35;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pfVar40 = (float *)(local_160->cstep * uVar68 * local_160->elemsize +
                                   (long)local_160->data);
                pauVar46 = (undefined1 (*) [32])
                           ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pfVar51 = (float *)(this_00->cstep * uVar68 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                  auVar78 = *pauVar46;
                  for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                    while (uVar62 != 0) {
                      fVar2 = pfVar40[1];
                      fVar20 = pfVar40[2];
                      fVar21 = pfVar40[3];
                      fVar22 = pfVar40[4];
                      fVar23 = pfVar40[5];
                      fVar24 = pfVar40[6];
                      *pfVar51 = auVar78._0_4_ * *pfVar40;
                      pfVar51[1] = auVar78._4_4_ * fVar2;
                      pfVar51[2] = auVar78._8_4_ * fVar20;
                      pfVar51[3] = auVar78._12_4_ * fVar21;
                      pfVar51[4] = auVar78._16_4_ * fVar22;
                      pfVar51[5] = auVar78._20_4_ * fVar23;
                      pfVar51[6] = auVar78._24_4_ * fVar24;
                      pfVar51[7] = in_register_0000125c;
                      pfVar40 = pfVar40 + 8;
                      pfVar51 = pfVar51 + 8;
                      uVar62 = uVar62 - 1;
                    }
                  }
                  pauVar46 = pauVar46 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          opt = local_130;
          if (uVar35 != 1 || local_160[1].w != 1) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar9 = this_00->data;
              pfVar40 = (float *)((long)local_160[1].data + uVar68 * 0x20);
              fVar2 = *pfVar40;
              fVar20 = pfVar40[1];
              fVar21 = pfVar40[2];
              fVar22 = pfVar40[3];
              fVar23 = pfVar40[4];
              fVar24 = pfVar40[5];
              fVar25 = pfVar40[6];
              sVar8 = local_160->elemsize;
              pvVar69 = local_160->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                pfVar40 = (float *)((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68);
                fVar26 = pfVar40[1];
                fVar27 = pfVar40[2];
                fVar28 = pfVar40[3];
                fVar29 = pfVar40[4];
                fVar30 = pfVar40[5];
                fVar31 = pfVar40[6];
                pfVar51 = (float *)((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68);
                *pfVar51 = fVar2 * *pfVar40;
                pfVar51[1] = fVar20 * fVar26;
                pfVar51[2] = fVar21 * fVar27;
                pfVar51[3] = fVar22 * fVar28;
                pfVar51[4] = fVar23 * fVar29;
                pfVar51[5] = fVar24 * fVar30;
                pfVar51[6] = fVar25 * fVar31;
                pfVar51[7] = in_register_0000125c;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          goto LAB_0038571c;
        }
        goto LAB_00379f1d;
      }
      goto LAB_0037dd91;
    case 3:
      pMVar49 = b;
      b = a;
      goto LAB_003761d8;
    case 4:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
      uVar57 = a->w;
      uVar70 = a->h;
      uVar58 = a->d;
      uVar44 = a->c;
      local_158 = (__m512 *)(ulong)uVar44;
      local_138 = CONCAT44(local_138._4_4_,uVar70 * uVar57 * uVar58);
      sVar60 = a->elemsize;
      uVar62 = a[1].w;
      uVar37 = a[1].h;
      uVar59 = a[1].d;
      uVar3 = a[1].c;
      local_148 = (__m512 *)(ulong)uVar3;
      local_130 = (Option *)CONCAT44(local_130._4_4_,uVar37 * uVar62 * uVar59);
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar34 != 1 || uVar57 != 1) {
          switch(a[1].dims) {
          case 1:
            goto switchD_00375993_caseD_1;
          case 2:
            Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
            pauVar46 = (undefined1 (*) [32])this_00->data;
            if (pauVar46 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              pauVar72 = (undefined1 (*) [32])local_160->data;
              pauVar52 = (undefined1 (*) [32])local_160[1].data;
              if ((int)uVar62 < 1) {
                uVar62 = 0;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                auVar78 = *pauVar72;
                uVar57 = uVar62;
                while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                  auVar11 = vmaxps_avx(auVar78,*pauVar52);
                  *pauVar46 = auVar11;
                  pauVar52 = pauVar52 + 1;
                  pauVar46 = pauVar46 + 1;
                }
                pauVar72 = pauVar72 + 1;
              }
              return 0;
            }
            return -100;
          case 3:
            Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)local_130 & 0xffffffff;
              if ((int)(uint)local_130 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                auVar78 = *(undefined1 (*) [32])((long)local_160->data + uVar64 * 0x20);
                pvVar9 = local_160[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar11 = vmaxps_avx(auVar78,*(undefined1 (*) [32])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                  *(undefined1 (*) [32])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar11;
                  lVar48 = lVar48 + 0x20;
                }
              }
              return 0;
            }
            return -100;
          case 4:
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)local_130 & 0xffffffff;
              if ((int)(uint)local_130 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                auVar78 = *(undefined1 (*) [32])((long)local_160->data + uVar64 * 0x20);
                pvVar9 = local_160[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar11 = vmaxps_avx(auVar78,*(undefined1 (*) [32])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                  *(undefined1 (*) [32])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar11;
                  lVar48 = lVar48 + 0x20;
                }
              }
              return 0;
            }
            return -100;
          default:
            return 0;
          }
        }
        goto LAB_00376277;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar46 = (undefined1 (*) [32])
                         ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data)
              ;
              pauVar72 = (undefined1 (*) [32])
                         (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar52 = (undefined1 (*) [32])
                         (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                auVar78 = *pauVar46;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar11 = vmaxps_avx(auVar78,*pauVar72);
                  *pauVar52 = auVar11;
                  pauVar72 = pauVar72 + 1;
                  pauVar52 = pauVar52 + 1;
                }
                pauVar46 = pauVar46 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar46 = (undefined1 (*) [32])
                         ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data)
              ;
              pauVar72 = (undefined1 (*) [32])
                         (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar52 = (undefined1 (*) [32])
                         (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                auVar78 = *pauVar46;
                for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                  while ((int)uVar55 != 0) {
                    auVar11 = vmaxps_avx(auVar78,*pauVar72);
                    *pauVar52 = auVar11;
                    pauVar72 = pauVar72 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar55 = (ulong)((int)uVar55 - 1);
                  }
                }
                pauVar46 = pauVar46 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        local_118 = CONCAT44(local_118._4_4_,uVar35);
        Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = local_160[1].dims;
        if (iVar34 == 1) {
          Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
          pauVar46 = (undefined1 (*) [32])this_00->data;
          if (pauVar46 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_118 != 1 || local_160[1].w != 1) {
            pauVar72 = (undefined1 (*) [32])local_160->data;
            pauVar52 = (undefined1 (*) [32])local_160[1].data;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
              auVar78 = *pauVar52;
              uVar58 = uVar57;
              while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                auVar11 = vmaxps_avx(auVar78,*pauVar72);
                *pauVar46 = auVar11;
                pauVar72 = pauVar72 + 1;
                pauVar46 = pauVar46 + 1;
              }
              pauVar52 = pauVar52 + 1;
            }
            return 0;
          }
          goto LAB_00385589;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * uVar64 * local_160->elemsize + (long)local_160->data)
                ;
                pauVar72 = (undefined1 (*) [32])
                           (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar52 = (undefined1 (*) [32])
                           (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                  for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                    auVar78 = *pauVar46;
                    uVar55 = uVar68;
                    while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      auVar11 = vmaxps_avx(auVar78,*pauVar72);
                      *pauVar52 = auVar11;
                      pauVar72 = pauVar72 + 1;
                      pauVar52 = pauVar52 + 1;
                    }
                    pauVar46 = pauVar46 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_160[1].dims != 1) {
            if (local_160[1].dims == 2) {
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data)
                ;
                pauVar72 = (undefined1 (*) [32])
                           ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar52 = (undefined1 (*) [32])
                           (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                  auVar78 = *pauVar72;
                  uVar58 = uVar57;
                  while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                    auVar11 = vmaxps_avx(auVar78,*pauVar46);
                    *pauVar52 = auVar11;
                    pauVar46 = pauVar46 + 1;
                    pauVar52 = pauVar52 + 1;
                  }
                  pauVar72 = pauVar72 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          if (uVar35 != 1 || local_160[1].w != 1) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              auVar78 = *(undefined1 (*) [32])((long)local_160[1].data + uVar68 * 0x20);
              pvVar9 = local_160->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                auVar11 = vmaxps_avx(auVar78,*(undefined1 (*) [32])
                                              ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68));
                *(undefined1 (*) [32])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68) = auVar11;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          goto LAB_00385589;
        }
        uVar58 = uVar3 ^ uVar44;
        if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = local_138 & 0xffffffff;
            if ((int)local_138 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              sVar7 = this_00->cstep;
              pvVar9 = local_160->data;
              auVar78 = *(undefined1 (*) [32])
                         ((long)local_160[1].data +
                         local_160[1].cstep * uVar64 * local_160[1].elemsize);
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar11 = vmaxps_avx(auVar78,*(undefined1 (*) [32])
                                              ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                *(undefined1 (*) [32])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar11;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = uVar68;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              pvVar9 = local_160[1].data;
              pvVar69 = local_160->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar75 = this_00->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                uVar1 = *(undefined4 *)((long)pvVar9 + lVar48);
                auVar13._4_4_ = uVar1;
                auVar13._0_4_ = uVar1;
                auVar13._8_4_ = uVar1;
                auVar13._12_4_ = uVar1;
                auVar13._16_4_ = uVar1;
                auVar13._20_4_ = uVar1;
                auVar13._24_4_ = uVar1;
                auVar13._28_4_ = uVar1;
                auVar78 = vmaxps_avx512vl(*(undefined1 (*) [32])
                                           ((long)pvVar69 + lVar48 * 8 + sVar60 * sVar5 * uVar68),
                                          auVar13);
                *(undefined1 (*) [32])((long)pvVar75 + lVar48 * 8 + sVar7 * sVar8 * uVar68) =
                     auVar78;
                lVar48 = lVar48 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_138 = sVar60;
        if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
          Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)(uint)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              sVar7 = this_00->cstep;
              pvVar9 = local_160[1].data;
              auVar78 = *(undefined1 (*) [32])
                         ((long)local_160->data + local_160->cstep * uVar64 * local_160->elemsize);
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar11 = vmaxps_avx(auVar78,*(undefined1 (*) [32])
                                              ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                *(undefined1 (*) [32])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar11;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar62 == uVar57) && (iVar34 == 1)) && ((uVar37 == uVar70 && (uVar44 == 1)))) {
          Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)(uint)local_130 < 1) {
              local_130._0_4_ = 0;
            }
            uVar64 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar64 = uVar68;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160->data;
              pvVar69 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar75 = this_00->data;
              lVar48 = 0;
              iVar34 = (uint)local_130;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                uVar1 = *(undefined4 *)((long)pvVar9 + lVar48);
                auVar93._4_4_ = uVar1;
                auVar93._0_4_ = uVar1;
                auVar93._8_4_ = uVar1;
                auVar93._12_4_ = uVar1;
                auVar93._16_4_ = uVar1;
                auVar93._20_4_ = uVar1;
                auVar93._24_4_ = uVar1;
                auVar93._28_4_ = uVar1;
                auVar78 = vmaxps_avx(auVar93,*(undefined1 (*) [32])
                                              ((long)pvVar69 + lVar48 * 8 + sVar60 * sVar5 * uVar68)
                                    );
                *(undefined1 (*) [32])((long)pvVar75 + lVar48 * 8 + sVar7 * sVar8 * uVar68) =
                     auVar78;
                lVar48 = lVar48 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_118 = CONCAT44(local_118._4_4_,uVar35);
        if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            uVar64 = (ulong)uVar70;
            if ((int)uVar70 < 1) {
              uVar64 = uVar68;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar68;
            }
            for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
              pauVar46 = (undefined1 (*) [32])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160[1].data;
              pauVar72 = (undefined1 (*) [32])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
                auVar78 = *(undefined1 (*) [32])
                           ((long)pvVar9 + uVar55 * 0x20 + sVar60 * uVar68 * sVar5);
                uVar35 = uVar57;
                while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                  auVar11 = vmaxps_avx(auVar78,*pauVar46);
                  *pauVar72 = auVar11;
                  pauVar46 = pauVar46 + 1;
                  pauVar72 = pauVar72 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar57;
            if ((int)uVar57 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                                (long)local_160->data);
              sVar60 = local_160[1].cstep;
              pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160[1].data;
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                for (lVar48 = 0; uVar68 * 0x20 != lVar48; lVar48 = lVar48 + 0x20) {
                  auVar78 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar69 + lVar48),
                                       *(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                  *(undefined1 (*) [32])((long)pvVar75 + lVar48) = auVar78;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar48);
                pvVar75 = (void *)((long)pvVar75 + lVar48);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
          Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)uVar70;
            if ((int)uVar70 < 1) {
              uVar63 = uVar64;
            }
            uVar55 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar55 = uVar64;
            }
            for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              pvVar9 = local_160->data;
              pauVar46 = (undefined1 (*) [32])
                         (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar72 = (undefined1 (*) [32])
                         (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
                auVar78 = *(undefined1 (*) [32])
                           ((long)pvVar9 + uVar56 * 0x20 + sVar60 * uVar64 * sVar5);
                uVar61 = uVar68;
                while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar11 = vmaxps_avx(auVar78,*pauVar46);
                  *pauVar72 = auVar11;
                  pauVar46 = pauVar46 + 1;
                  pauVar72 = pauVar72 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
          Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar57;
            if ((int)uVar57 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                (long)local_160[1].data);
              pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_160->elemsize;
              pvVar9 = local_160->data;
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                for (lVar48 = 0; uVar68 * 0x20 != lVar48; lVar48 = lVar48 + 0x20) {
                  auVar78 = vmaxps_avx(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64),
                                       *(undefined1 (*) [32])((long)pvVar69 + lVar48));
                  *(undefined1 (*) [32])((long)pvVar75 + lVar48) = auVar78;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar48);
                pvVar75 = (void *)((long)pvVar75 + lVar48);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003887e9;
      case 4:
        if (a[1].dims != 4) {
          local_130 = opt;
          Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar34 = local_160[1].dims;
          iVar38 = (int)local_158;
          if (iVar34 != 1) {
            if (iVar34 == 3) {
              uVar35 = 0;
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = uVar35;
              }
              if ((int)uVar70 < 1) {
                uVar70 = uVar35;
              }
              if ((int)uVar58 < 1) {
                uVar58 = uVar35;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data)
                ;
                pauVar72 = (undefined1 (*) [32])
                           (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar52 = (undefined1 (*) [32])
                           (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                  for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                    auVar78 = *pauVar72;
                    uVar62 = uVar57;
                    while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                      auVar11 = vmaxps_avx(auVar78,*pauVar46);
                      *pauVar52 = auVar11;
                      pauVar46 = pauVar46 + 1;
                      pauVar52 = pauVar52 + 1;
                    }
                    pauVar72 = pauVar72 + 1;
                  }
                }
              }
              return 0;
            }
            if (iVar34 == 2) {
              uVar35 = 0;
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = uVar35;
              }
              if ((int)uVar70 < 1) {
                uVar70 = uVar35;
              }
              if ((int)uVar58 < 1) {
                uVar58 = uVar35;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data)
                ;
                pauVar72 = (undefined1 (*) [32])
                           ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar52 = (undefined1 (*) [32])
                           (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                  auVar78 = *pauVar72;
                  for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                    while (uVar62 != 0) {
                      auVar11 = vmaxps_avx(auVar78,*pauVar46);
                      *pauVar52 = auVar11;
                      pauVar46 = pauVar46 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar62 = uVar62 - 1;
                    }
                  }
                  pauVar72 = pauVar72 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          opt = local_130;
          if (uVar35 != 1 || local_160[1].w != 1) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar9 = this_00->data;
              auVar78 = *(undefined1 (*) [32])((long)local_160[1].data + uVar68 * 0x20);
              sVar8 = local_160->elemsize;
              pvVar69 = local_160->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                auVar11 = vmaxps_avx(auVar78,*(undefined1 (*) [32])
                                              ((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68));
                *(undefined1 (*) [32])((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68) = auVar11;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          goto LAB_00385589;
        }
        goto LAB_00379cea;
      }
      goto LAB_0037d90c;
    case 5:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
      uVar57 = a->w;
      uVar70 = a->h;
      uVar58 = a->d;
      uVar44 = a->c;
      local_158 = (__m512 *)(ulong)uVar44;
      local_138 = CONCAT44(local_138._4_4_,uVar70 * uVar57 * uVar58);
      sVar60 = a->elemsize;
      uVar62 = a[1].w;
      uVar37 = a[1].h;
      uVar59 = a[1].d;
      uVar3 = a[1].c;
      local_148 = (__m512 *)(ulong)uVar3;
      local_130 = (Option *)CONCAT44(local_130._4_4_,uVar37 * uVar62 * uVar59);
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar34 != 1 || uVar57 != 1) {
          switch(a[1].dims) {
          case 1:
            goto switchD_00375c4c_caseD_1;
          case 2:
            Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
            pauVar46 = (undefined1 (*) [32])this_00->data;
            if (pauVar46 == (undefined1 (*) [32])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              pauVar72 = (undefined1 (*) [32])local_160->data;
              pauVar52 = (undefined1 (*) [32])local_160[1].data;
              if ((int)uVar62 < 1) {
                uVar62 = 0;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                auVar78 = *pauVar72;
                uVar57 = uVar62;
                while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                  auVar11 = vminps_avx(auVar78,*pauVar52);
                  *pauVar46 = auVar11;
                  pauVar52 = pauVar52 + 1;
                  pauVar46 = pauVar46 + 1;
                }
                pauVar72 = pauVar72 + 1;
              }
              return 0;
            }
            return -100;
          case 3:
            Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)local_130 & 0xffffffff;
              if ((int)(uint)local_130 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                auVar78 = *(undefined1 (*) [32])((long)local_160->data + uVar64 * 0x20);
                pvVar9 = local_160[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar11 = vminps_avx(auVar78,*(undefined1 (*) [32])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                  *(undefined1 (*) [32])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar11;
                  lVar48 = lVar48 + 0x20;
                }
              }
              return 0;
            }
            return -100;
          case 4:
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)local_130 & 0xffffffff;
              if ((int)(uint)local_130 < 1) {
                uVar68 = uVar64;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                sVar60 = local_160[1].cstep;
                sVar5 = local_160[1].elemsize;
                auVar78 = *(undefined1 (*) [32])((long)local_160->data + uVar64 * 0x20);
                pvVar9 = local_160[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar69 = this_00->data;
                lVar48 = 0;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar11 = vminps_avx(auVar78,*(undefined1 (*) [32])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                  *(undefined1 (*) [32])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar11;
                  lVar48 = lVar48 + 0x20;
                }
              }
              return 0;
            }
            return -100;
          default:
            return 0;
          }
        }
        goto LAB_003763f6;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar46 = (undefined1 (*) [32])
                         ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data)
              ;
              pauVar72 = (undefined1 (*) [32])
                         (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar52 = (undefined1 (*) [32])
                         (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                auVar78 = *pauVar46;
                uVar55 = uVar68;
                while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar11 = vminps_avx(auVar78,*pauVar72);
                  *pauVar52 = auVar11;
                  pauVar72 = pauVar72 + 1;
                  pauVar52 = pauVar52 + 1;
                }
                pauVar46 = pauVar46 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar46 = (undefined1 (*) [32])
                         ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data)
              ;
              pauVar72 = (undefined1 (*) [32])
                         (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar52 = (undefined1 (*) [32])
                         (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                auVar78 = *pauVar46;
                for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                  while ((int)uVar55 != 0) {
                    auVar11 = vminps_avx(auVar78,*pauVar72);
                    *pauVar52 = auVar11;
                    pauVar72 = pauVar72 + 1;
                    pauVar52 = pauVar52 + 1;
                    uVar55 = (ulong)((int)uVar55 - 1);
                  }
                }
                pauVar46 = pauVar46 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        local_118 = CONCAT44(local_118._4_4_,uVar35);
        Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = local_160[1].dims;
        if (iVar34 == 1) {
          Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
          pauVar46 = (undefined1 (*) [32])this_00->data;
          if (pauVar46 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_118 != 1 || local_160[1].w != 1) {
            pauVar72 = (undefined1 (*) [32])local_160->data;
            pauVar52 = (undefined1 (*) [32])local_160[1].data;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
              auVar78 = *pauVar52;
              uVar58 = uVar57;
              while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                auVar11 = vminps_avx(auVar78,*pauVar72);
                *pauVar46 = auVar11;
                pauVar72 = pauVar72 + 1;
                pauVar46 = pauVar46 + 1;
              }
              pauVar52 = pauVar52 + 1;
            }
            return 0;
          }
          goto LAB_003858c6;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar64 = 0;
              uVar68 = (ulong)uVar62;
              if ((int)uVar62 < 1) {
                uVar68 = uVar64;
              }
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              uVar63 = (ulong)local_148 & 0xffffffff;
              if ((int)local_148 < 1) {
                uVar63 = uVar64;
              }
              for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * uVar64 * local_160->elemsize + (long)local_160->data)
                ;
                pauVar72 = (undefined1 (*) [32])
                           (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar52 = (undefined1 (*) [32])
                           (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                  for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                    auVar78 = *pauVar46;
                    uVar55 = uVar68;
                    while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      auVar11 = vminps_avx(auVar78,*pauVar72);
                      *pauVar52 = auVar11;
                      pauVar72 = pauVar72 + 1;
                      pauVar52 = pauVar52 + 1;
                    }
                    pauVar46 = pauVar46 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_160[1].dims != 1) {
            if (local_160[1].dims == 2) {
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = 0;
              }
              if ((int)uVar70 < 1) {
                uVar70 = 0;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if ((int)local_158 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data)
                ;
                pauVar72 = (undefined1 (*) [32])
                           ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar52 = (undefined1 (*) [32])
                           (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                  auVar78 = *pauVar72;
                  uVar58 = uVar57;
                  while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                    auVar11 = vminps_avx(auVar78,*pauVar46);
                    *pauVar52 = auVar11;
                    pauVar46 = pauVar46 + 1;
                    pauVar52 = pauVar52 + 1;
                  }
                  pauVar72 = pauVar72 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          if (uVar35 != 1 || local_160[1].w != 1) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              auVar78 = *(undefined1 (*) [32])((long)local_160[1].data + uVar68 * 0x20);
              pvVar9 = local_160->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                auVar11 = vminps_avx(auVar78,*(undefined1 (*) [32])
                                              ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68));
                *(undefined1 (*) [32])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68) = auVar11;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          goto LAB_003858c6;
        }
        uVar58 = uVar3 ^ uVar44;
        if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = local_138 & 0xffffffff;
            if ((int)local_138 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              sVar7 = this_00->cstep;
              pvVar9 = local_160->data;
              auVar78 = *(undefined1 (*) [32])
                         ((long)local_160[1].data +
                         local_160[1].cstep * uVar64 * local_160[1].elemsize);
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar11 = vminps_avx(auVar78,*(undefined1 (*) [32])
                                              ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                *(undefined1 (*) [32])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar11;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = uVar68;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              pvVar9 = local_160[1].data;
              pvVar69 = local_160->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar75 = this_00->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                uVar1 = *(undefined4 *)((long)pvVar9 + lVar48);
                auVar11._4_4_ = uVar1;
                auVar11._0_4_ = uVar1;
                auVar11._8_4_ = uVar1;
                auVar11._12_4_ = uVar1;
                auVar11._16_4_ = uVar1;
                auVar11._20_4_ = uVar1;
                auVar11._24_4_ = uVar1;
                auVar11._28_4_ = uVar1;
                auVar78 = vminps_avx512vl(*(undefined1 (*) [32])
                                           ((long)pvVar69 + lVar48 * 8 + sVar60 * sVar5 * uVar68),
                                          auVar11);
                *(undefined1 (*) [32])((long)pvVar75 + lVar48 * 8 + sVar7 * sVar8 * uVar68) =
                     auVar78;
                lVar48 = lVar48 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_138 = sVar60;
        if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
          Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)(uint)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              sVar7 = this_00->cstep;
              pvVar9 = local_160[1].data;
              auVar78 = *(undefined1 (*) [32])
                         ((long)local_160->data + local_160->cstep * uVar64 * local_160->elemsize);
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar11 = vminps_avx(auVar78,*(undefined1 (*) [32])
                                              ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                *(undefined1 (*) [32])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar11;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar62 == uVar57) && (iVar34 == 1)) && (uVar37 == uVar70)) && (uVar44 == 1)) {
          Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)(uint)local_130 < 1) {
              local_130._0_4_ = 0;
            }
            uVar64 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar64 = uVar68;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160->data;
              pvVar69 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar75 = this_00->data;
              lVar48 = 0;
              iVar34 = (uint)local_130;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                uVar1 = *(undefined4 *)((long)pvVar9 + lVar48);
                auVar95._4_4_ = uVar1;
                auVar95._0_4_ = uVar1;
                auVar95._8_4_ = uVar1;
                auVar95._12_4_ = uVar1;
                auVar95._16_4_ = uVar1;
                auVar95._20_4_ = uVar1;
                auVar95._24_4_ = uVar1;
                auVar95._28_4_ = uVar1;
                auVar78 = vminps_avx(auVar95,*(undefined1 (*) [32])
                                              ((long)pvVar69 + lVar48 * 8 + sVar60 * sVar5 * uVar68)
                                    );
                *(undefined1 (*) [32])((long)pvVar75 + lVar48 * 8 + sVar7 * sVar8 * uVar68) =
                     auVar78;
                lVar48 = lVar48 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_118 = CONCAT44(local_118._4_4_,uVar35);
        if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            uVar64 = (ulong)uVar70;
            if ((int)uVar70 < 1) {
              uVar64 = uVar68;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar68;
            }
            for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
              pauVar46 = (undefined1 (*) [32])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160[1].data;
              pauVar72 = (undefined1 (*) [32])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
                auVar78 = *(undefined1 (*) [32])
                           ((long)pvVar9 + uVar55 * 0x20 + sVar60 * uVar68 * sVar5);
                uVar35 = uVar57;
                while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                  auVar11 = vminps_avx(auVar78,*pauVar46);
                  *pauVar72 = auVar11;
                  pauVar46 = pauVar46 + 1;
                  pauVar72 = pauVar72 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
          Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar57;
            if ((int)uVar57 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                                (long)local_160->data);
              sVar60 = local_160[1].cstep;
              pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_160[1].elemsize;
              pvVar9 = local_160[1].data;
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                for (lVar48 = 0; uVar68 * 0x20 != lVar48; lVar48 = lVar48 + 0x20) {
                  auVar78 = vminps_avx(*(undefined1 (*) [32])((long)pvVar69 + lVar48),
                                       *(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                  *(undefined1 (*) [32])((long)pvVar75 + lVar48) = auVar78;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar48);
                pvVar75 = (void *)((long)pvVar75 + lVar48);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
          Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)uVar70;
            if ((int)uVar70 < 1) {
              uVar63 = uVar64;
            }
            uVar55 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar55 = uVar64;
            }
            for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = local_160->elemsize;
              pvVar9 = local_160->data;
              pauVar46 = (undefined1 (*) [32])
                         (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar72 = (undefined1 (*) [32])
                         (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
                auVar78 = *(undefined1 (*) [32])
                           ((long)pvVar9 + uVar56 * 0x20 + sVar60 * uVar64 * sVar5);
                uVar61 = uVar68;
                while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar11 = vminps_avx(auVar78,*pauVar46);
                  *pauVar72 = auVar11;
                  pauVar46 = pauVar46 + 1;
                  pauVar72 = pauVar72 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
          Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar57;
            if ((int)uVar57 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            uVar63 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160->cstep;
              pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                                (long)local_160[1].data);
              pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_160->elemsize;
              pvVar9 = local_160->data;
              for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
                for (lVar48 = 0; uVar68 * 0x20 != lVar48; lVar48 = lVar48 + 0x20) {
                  auVar78 = vminps_avx(*(undefined1 (*) [32])
                                        ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64),
                                       *(undefined1 (*) [32])((long)pvVar69 + lVar48));
                  *(undefined1 (*) [32])((long)pvVar75 + lVar48) = auVar78;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar48);
                pvVar75 = (void *)((long)pvVar75 + lVar48);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_00388b01;
      case 4:
        if (a[1].dims != 4) {
          local_130 = opt;
          Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar34 = local_160[1].dims;
          iVar38 = (int)local_158;
          if (iVar34 != 1) {
            if (iVar34 == 3) {
              uVar35 = 0;
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = uVar35;
              }
              if ((int)uVar70 < 1) {
                uVar70 = uVar35;
              }
              if ((int)uVar58 < 1) {
                uVar58 = uVar35;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data)
                ;
                pauVar72 = (undefined1 (*) [32])
                           (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar52 = (undefined1 (*) [32])
                           (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                  for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                    auVar78 = *pauVar72;
                    uVar62 = uVar57;
                    while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                      auVar11 = vminps_avx(auVar78,*pauVar46);
                      *pauVar52 = auVar11;
                      pauVar46 = pauVar46 + 1;
                      pauVar52 = pauVar52 + 1;
                    }
                    pauVar72 = pauVar72 + 1;
                  }
                }
              }
              return 0;
            }
            if (iVar34 == 2) {
              uVar35 = 0;
              uVar68 = 0;
              if ((int)uVar57 < 1) {
                uVar57 = uVar35;
              }
              if ((int)uVar70 < 1) {
                uVar70 = uVar35;
              }
              if ((int)uVar58 < 1) {
                uVar58 = uVar35;
              }
              uVar64 = (ulong)local_158 & 0xffffffff;
              if (iVar38 < 1) {
                uVar64 = 0;
              }
              for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data)
                ;
                pauVar72 = (undefined1 (*) [32])
                           ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar52 = (undefined1 (*) [32])
                           (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
                for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                  auVar78 = *pauVar72;
                  for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                    while (uVar62 != 0) {
                      auVar11 = vminps_avx(auVar78,*pauVar46);
                      *pauVar52 = auVar11;
                      pauVar46 = pauVar46 + 1;
                      pauVar52 = pauVar52 + 1;
                      uVar62 = uVar62 - 1;
                    }
                  }
                  pauVar72 = pauVar72 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          opt = local_130;
          if (uVar35 != 1 || local_160[1].w != 1) {
            uVar68 = 0;
            if ((int)local_138 < 1) {
              local_138._0_4_ = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              sVar60 = local_160->cstep;
              sVar5 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar9 = this_00->data;
              auVar78 = *(undefined1 (*) [32])((long)local_160[1].data + uVar68 * 0x20);
              sVar8 = local_160->elemsize;
              pvVar69 = local_160->data;
              lVar48 = 0;
              iVar34 = (int)local_138;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                auVar11 = vminps_avx(auVar78,*(undefined1 (*) [32])
                                              ((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68));
                *(undefined1 (*) [32])((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68) = auVar11;
                lVar48 = lVar48 + 0x20;
              }
            }
            return 0;
          }
          goto LAB_003858c6;
        }
        goto LAB_0037a4fc;
      }
      goto LAB_0037e0ff;
    case 6:
      local_120 = 0;
      if (3 < a->dims - 1U) goto switchD_0037a98e_default;
      uVar57 = a->w;
      pafVar65 = (__m512 *)(ulong)uVar57;
      uVar70 = a->h;
      pafVar54 = (__m512 *)(ulong)uVar70;
      iVar38 = a->d;
      uVar58 = a->c;
      local_128 = (ulong)uVar58;
      local_110._0_4_ = uVar70 * uVar57 * iVar38;
      local_80 = a->elemsize;
      uVar44 = a[1].w;
      local_150._0_4_ = a[1].h;
      iVar41 = a[1].d;
      uVar62 = a[1].c;
      local_138 = (size_t)uVar62;
      local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
      local_130 = (Option *)CONCAT44(local_130._4_4_,iVar41);
      iVar36 = (uint)local_150 * uVar44 * iVar41;
      sVar60 = a[1].elemsize;
      local_108._0_4_ = iVar36;
      switch(a->dims) {
      case 1:
        if (iVar34 == 1 && uVar57 == 1) {
          uVar35 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                             (a,b,this_00,opt);
          local_120 = (ulong)uVar35;
          goto switchD_0037a98e_default;
        }
        switch(a[1].dims) {
        case 1:
          Mat::create(this_00,uVar57,local_80,iVar34,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) break;
          if (uVar35 != 1 || a[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>(a,b,this_00,opt);
            local_120 = 0;
            break;
          }
          goto LAB_00383d85;
        case 2:
          Mat::create(this_00,uVar44,(uint)local_150,sVar60,uVar35,opt->blob_allocator);
          puVar71 = (undefined8 *)this_00->data;
          local_120 = 0xffffffffffffff9c;
          if ((puVar71 != (undefined8 *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            local_148 = (__m512 *)a->data;
            if ((int)uVar44 < 1) {
              uVar44 = 0;
            }
            pauVar46 = (undefined1 (*) [32])a[1].data;
            local_120 = 0;
            if ((int)(uint)local_150 < 1) {
              local_150._0_4_ = 0;
            }
            local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
            iVar34 = 0;
            while (iVar34 != (uint)local_150) {
              local_158 = (__m512 *)CONCAT44(local_158._4_4_,iVar34);
              local_c0._0_32_ = *(undefined1 (*) [32])local_148;
              while (bVar76 = uVar44 != 0, uVar44 = uVar44 - 1, bVar76) {
                uVar109 = *(undefined8 *)*pauVar46;
                uVar108 = *(undefined8 *)((long)*pauVar46 + 8);
                uVar111 = *(undefined8 *)((long)*pauVar46 + 0x10);
                uVar112 = *(undefined8 *)((long)*pauVar46 + 0x18);
                local_100._0_32_ = *pauVar46;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                pauVar46 = pauVar46 + 1;
                puVar71 = puVar71 + 4;
              }
              local_148 = (__m512 *)((long)local_148 + 0x20);
              uVar44 = (uint)local_140;
              iVar34 = (int)local_158 + 1;
            }
          }
          break;
        case 3:
          Mat::create(this_00,uVar44,(uint)local_150,uVar62,sVar60,uVar35,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if ((int)local_108 < 1) {
              local_108._0_4_ = 0;
            }
            iVar34 = (int)local_138;
            local_120 = 0;
            local_138 = local_138 & 0xffffffff;
            if (iVar34 < 1) {
              local_138 = 0;
            }
            for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_138;
                local_150 = (__m512 *)((long)local_150 + 1)) {
              local_c0._0_32_ = *(undefined1 (*) [32])((long)a->data + (long)local_150 * 0x20);
              lVar66 = a[1].cstep * a[1].elemsize * (long)local_150;
              pvVar9 = a[1].data;
              lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
              pvVar69 = this_00->data;
              lVar67 = 0;
              iVar34 = (int)local_108;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                pauVar46 = (undefined1 (*) [32])((long)pvVar9 + lVar67 + lVar66);
                uVar109 = *(undefined8 *)*pauVar46;
                uVar108 = *(undefined8 *)(*pauVar46 + 8);
                uVar111 = *(undefined8 *)(*pauVar46 + 0x10);
                uVar112 = *(undefined8 *)(*pauVar46 + 0x18);
                local_100._0_32_ = *pauVar46;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                lVar67 = lVar67 + 0x20;
              }
              a = local_160;
            }
          }
          break;
        case 4:
          Mat::create(this_00,uVar44,(uint)local_150,iVar41,uVar62,sVar60,uVar35,opt->blob_allocator
                     );
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if ((int)local_108 < 1) {
              local_108._0_4_ = 0;
            }
            iVar34 = (int)local_138;
            local_120 = 0;
            local_138 = local_138 & 0xffffffff;
            if (iVar34 < 1) {
              local_138 = 0;
            }
            for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_138;
                local_150 = (__m512 *)((long)local_150 + 1)) {
              local_c0._0_32_ = *(undefined1 (*) [32])((long)a->data + (long)local_150 * 0x20);
              lVar66 = a[1].cstep * a[1].elemsize * (long)local_150;
              pvVar9 = a[1].data;
              lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
              pvVar69 = this_00->data;
              lVar67 = 0;
              iVar34 = (int)local_108;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                pauVar46 = (undefined1 (*) [32])((long)pvVar9 + lVar67 + lVar66);
                uVar109 = *(undefined8 *)*pauVar46;
                uVar108 = *(undefined8 *)(*pauVar46 + 8);
                uVar111 = *(undefined8 *)(*pauVar46 + 0x10);
                uVar112 = *(undefined8 *)(*pauVar46 + 0x18);
                local_100._0_32_ = *pauVar46;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                lVar67 = lVar67 + 0x20;
              }
              a = local_160;
            }
          }
        }
        goto switchD_0037a98e_default;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          Mat::create(this_00,uVar44,(uint)local_150,uVar62,sVar60,uVar35,pAVar6);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if ((int)uVar44 < 1) {
              uVar44 = 0;
            }
            if ((int)(uint)local_150 < 1) {
              local_150._0_4_ = 0;
            }
            iVar34 = (int)local_138;
            local_120 = 0;
            local_138 = local_138 & 0xffffffff;
            if (iVar34 < 1) {
              local_138 = 0;
            }
            local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
            for (local_130 = (Option *)0x0; local_130 != (Option *)local_138;
                local_130 = (Option *)((long)local_130 + 1)) {
              local_148 = (__m512 *)
                          ((long)local_160->w * (long)local_130 * local_160->elemsize +
                          (long)local_160->data);
              pauVar72 = (undefined1 (*) [32])
                         (local_160[1].cstep * (long)local_130 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar46 = (undefined1 (*) [32])
                         (this_00->cstep * (long)local_130 * this_00->elemsize + (long)this_00->data
                         );
              iVar34 = 0;
              while (iVar34 != (uint)local_150) {
                local_158 = (__m512 *)CONCAT44(local_158._4_4_,iVar34);
                local_c0._0_32_ = *(undefined1 (*) [32])local_148;
                while (bVar76 = uVar44 != 0, uVar44 = uVar44 - 1, bVar76) {
                  auVar78 = *pauVar72;
                  local_100[0] = (float)auVar78._0_4_;
                  local_100[1] = (float)auVar78._4_4_;
                  local_100[2] = (float)auVar78._8_4_;
                  local_100[3] = (float)auVar78._12_4_;
                  local_100[4] = (float)auVar78._16_4_;
                  local_100[5] = (float)auVar78._20_4_;
                  local_100[6] = (float)auVar78._24_4_;
                  local_100[7] = (float)auVar78._28_4_;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                  *pauVar46 = auVar78;
                  pauVar72 = pauVar72 + 1;
                  pauVar46 = pauVar46 + 1;
                }
                local_148 = (__m512 *)((long)local_148 + 0x20);
                uVar44 = (uint)local_140;
                iVar34 = (int)local_158 + 1;
              }
            }
          }
          goto switchD_0037a98e_default;
        }
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar44,(uint)local_150,iVar41,uVar62,sVar60,uVar35,pAVar6);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if ((int)uVar44 < 1) {
              uVar44 = 0;
            }
            if ((int)(uint)local_150 < 1) {
              local_150._0_4_ = 0;
            }
            iVar34 = (uint)local_130;
            if ((int)(uint)local_130 < 1) {
              iVar34 = 0;
            }
            local_130 = (Option *)CONCAT44(local_130._4_4_,iVar34);
            iVar34 = (int)local_138;
            local_120 = 0;
            local_138 = local_138 & 0xffffffff;
            if (iVar34 < 1) {
              local_138 = 0;
            }
            local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
            for (local_128 = 0; local_128 != local_138; local_128 = local_128 + 1) {
              local_158 = (__m512 *)
                          ((long)local_160->w * local_128 * local_160->elemsize +
                          (long)local_160->data);
              pauVar46 = (undefined1 (*) [32])
                         (local_160[1].cstep * local_128 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar72 = (undefined1 (*) [32])
                         (this_00->cstep * local_128 * this_00->elemsize + (long)this_00->data);
              for (iVar34 = 0; iVar34 != (uint)local_130; iVar34 = iVar34 + 1) {
                local_c0._0_32_ = *(undefined1 (*) [32])local_158;
                local_148 = (__m512 *)CONCAT44(local_148._4_4_,iVar34);
                for (iVar38 = 0; iVar38 != (uint)local_150; iVar38 = iVar38 + 1) {
                  while (bVar76 = uVar44 != 0, uVar44 = uVar44 - 1, bVar76) {
                    auVar78 = *pauVar46;
                    local_100[0] = (float)auVar78._0_4_;
                    local_100[1] = (float)auVar78._4_4_;
                    local_100[2] = (float)auVar78._8_4_;
                    local_100[3] = (float)auVar78._12_4_;
                    local_100[4] = (float)auVar78._16_4_;
                    local_100[5] = (float)auVar78._20_4_;
                    local_100[6] = (float)auVar78._24_4_;
                    local_100[7] = (float)auVar78._28_4_;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                              (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                    *pauVar72 = auVar78;
                    pauVar46 = pauVar46 + 1;
                    pauVar72 = pauVar72 + 1;
                  }
                  iVar34 = (int)local_148;
                  uVar44 = (uint)local_140;
                }
                local_158 = (__m512 *)((long)local_158 + 0x20);
              }
            }
          }
          goto switchD_0037a98e_default;
        }
        local_158 = pafVar65;
        local_148 = pafVar54;
        local_140 = b;
        Mat::create(this_00,uVar57,uVar70,local_80,iVar34,pAVar6);
        local_120 = 0xffffffffffffff9c;
        if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
        goto switchD_0037a98e_default;
        if (a[1].dims == 1) {
          Mat::create(this_00,(int)local_158,(int)local_148,local_80,iVar34,opt->blob_allocator);
          puVar71 = (undefined8 *)this_00->data;
          if ((puVar71 == (undefined8 *)0x0) || ((long)this_00->c * this_00->cstep == 0))
          goto switchD_0037a98e_default;
          b = local_140;
          if (uVar35 != 1 || a[1].w != 1) {
            pauVar46 = (undefined1 (*) [32])a->data;
            iVar34 = (int)local_158;
            local_158 = (__m512 *)((ulong)local_158 & 0xffffffff);
            if (iVar34 < 1) {
              local_158 = (__m512 *)0;
            }
            local_140 = (Mat *)a[1].data;
            iVar34 = (int)local_148;
            local_120 = 0;
            local_148 = (__m512 *)((ulong)local_148 & 0xffffffff);
            if (iVar34 < 1) {
              local_148 = (__m512 *)0;
            }
            for (local_150._0_4_ = 0; (uint)local_150 != (int)local_148;
                local_150._0_4_ = (uint)local_150 + 1) {
              local_c0._0_32_ = *(undefined1 (*) [32])local_140;
              uVar68 = (ulong)local_158 & 0xffffffff;
              while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                uVar109 = *(undefined8 *)*pauVar46;
                uVar108 = *(undefined8 *)((long)*pauVar46 + 8);
                uVar111 = *(undefined8 *)((long)*pauVar46 + 0x10);
                uVar112 = *(undefined8 *)((long)*pauVar46 + 0x18);
                local_100._0_32_ = *pauVar46;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_161,(__m256 *)local_100,(__m256 *)local_c0);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                pauVar46 = pauVar46 + 1;
                puVar71 = puVar71 + 4;
              }
              local_140 = (Mat *)((long)local_140 + 0x20);
            }
            goto switchD_0037a98e_default;
          }
          goto LAB_00383d85;
        }
        local_120 = 0;
        b = local_140;
        if (a[1].dims != 2) goto switchD_0037a98e_default;
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            Mat::create(this_00,uVar44,(uint)local_150,iVar41,uVar62,sVar60,uVar35,
                        opt->blob_allocator);
            local_120 = 0xffffffffffffff9c;
            if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
              if ((int)uVar44 < 1) {
                uVar44 = 0;
              }
              if ((int)(uint)local_150 < 1) {
                local_150._0_4_ = 0;
              }
              iVar34 = (uint)local_130;
              if ((int)(uint)local_130 < 1) {
                iVar34 = 0;
              }
              local_130 = (Option *)CONCAT44(local_130._4_4_,iVar34);
              iVar34 = (int)local_138;
              local_120 = 0;
              local_138 = local_138 & 0xffffffff;
              if (iVar34 < 1) {
                local_138 = 0;
              }
              local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
              for (local_128 = 0; local_128 != local_138; local_128 = local_128 + 1) {
                local_148 = (__m512 *)
                            (local_160->cstep * local_128 * local_160->elemsize +
                            (long)local_160->data);
                pauVar46 = (undefined1 (*) [32])
                           (local_160[1].cstep * local_128 * local_160[1].elemsize +
                           (long)local_160[1].data);
                pauVar72 = (undefined1 (*) [32])
                           (this_00->cstep * local_128 * this_00->elemsize + (long)this_00->data);
                for (iVar34 = 0; iVar34 != (uint)local_130; iVar34 = iVar34 + 1) {
                  local_158 = (__m512 *)CONCAT44(local_158._4_4_,iVar34);
                  for (iVar38 = 0; iVar38 != (uint)local_150; iVar38 = iVar38 + 1) {
                    local_c0._0_32_ = *(undefined1 (*) [32])local_148;
                    while (bVar76 = uVar44 != 0, uVar44 = uVar44 - 1, bVar76) {
                      auVar78 = *pauVar46;
                      local_100[0] = (float)auVar78._0_4_;
                      local_100[1] = (float)auVar78._4_4_;
                      local_100[2] = (float)auVar78._8_4_;
                      local_100[3] = (float)auVar78._12_4_;
                      local_100[4] = (float)auVar78._16_4_;
                      local_100[5] = (float)auVar78._20_4_;
                      local_100[6] = (float)auVar78._24_4_;
                      local_100[7] = (float)auVar78._28_4_;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                      *pauVar72 = auVar78;
                      pauVar46 = pauVar46 + 1;
                      pauVar72 = pauVar72 + 1;
                    }
                    local_148 = (__m512 *)((long)local_148 + 0x20);
                    iVar34 = (int)local_158;
                    uVar44 = (uint)local_140;
                  }
                }
              }
            }
            goto switchD_0037a98e_default;
          }
          local_118 = CONCAT44(local_118._4_4_,uVar35);
          local_130 = opt;
          Mat::create(this_00,uVar57,uVar70,uVar58,local_80,iVar34,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
          goto switchD_0037a98e_default;
          iVar34 = (int)local_128;
          if (a[1].dims != 1) {
            local_120 = 0;
            if (a[1].dims == 2) {
              if ((int)uVar57 < 1) {
                pafVar65 = (__m512 *)0x0;
              }
              if ((int)uVar70 < 1) {
                pafVar54 = (__m512 *)0x0;
              }
              local_120 = 0;
              local_128 = local_128 & 0xffffffff;
              if (iVar34 < 1) {
                local_128 = 0;
              }
              local_158 = pafVar65;
              local_148 = pafVar54;
              for (local_130 = (Option *)0x0; local_130 != (Option *)local_128;
                  local_130 = (Option *)((long)local_130 + 1)) {
                pauVar72 = (undefined1 (*) [32])
                           (local_160->cstep * (long)local_130 * local_160->elemsize +
                           (long)local_160->data);
                local_150 = (__m512 *)
                            ((long)local_160[1].w * (long)local_130 * local_160[1].elemsize +
                            (long)local_160[1].data);
                pauVar46 = (undefined1 (*) [32])
                           (this_00->cstep * (long)local_130 * this_00->elemsize +
                           (long)this_00->data);
                iVar34 = 0;
                while (iVar34 != (int)pafVar54) {
                  local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
                  local_c0._0_32_ = *(undefined1 (*) [32])local_150;
                  uVar68 = (ulong)pafVar65 & 0xffffffff;
                  while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar78 = *pauVar72;
                    local_100[0] = (float)auVar78._0_4_;
                    local_100[1] = (float)auVar78._4_4_;
                    local_100[2] = (float)auVar78._8_4_;
                    local_100[3] = (float)auVar78._12_4_;
                    local_100[4] = (float)auVar78._16_4_;
                    local_100[5] = (float)auVar78._20_4_;
                    local_100[6] = (float)auVar78._24_4_;
                    local_100[7] = (float)auVar78._28_4_;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                              (&local_161,(__m256 *)local_100,(__m256 *)local_c0);
                    *pauVar46 = auVar78;
                    pauVar72 = pauVar72 + 1;
                    pauVar46 = pauVar46 + 1;
                  }
                  local_150 = (__m512 *)((long)local_150 + 0x20);
                  pafVar65 = local_158;
                  pafVar54 = local_148;
                  iVar34 = (uint)local_140 + 1;
                }
              }
            }
            goto switchD_0037a98e_default;
          }
          if ((int)local_118 != 1 || a[1].w != 1) {
            if ((int)local_110 < 1) {
              local_110._0_4_ = 0;
            }
            local_120 = 0;
            local_128 = local_128 & 0xffffffff;
            if (iVar34 < 1) {
              local_128 = 0;
            }
            for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
                local_150 = (__m512 *)((long)local_150 + 1)) {
              lVar66 = a->cstep * a->elemsize * (long)local_150;
              pvVar9 = a->data;
              local_c0._0_32_ = *(undefined1 (*) [32])((long)a[1].data + (long)local_150 * 0x20);
              lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
              pvVar69 = this_00->data;
              lVar67 = 0;
              iVar34 = (int)local_110;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                pauVar46 = (undefined1 (*) [32])((long)pvVar9 + lVar67 + lVar66);
                uVar109 = *(undefined8 *)*pauVar46;
                uVar108 = *(undefined8 *)(*pauVar46 + 8);
                uVar111 = *(undefined8 *)(*pauVar46 + 0x10);
                uVar112 = *(undefined8 *)(*pauVar46 + 0x18);
                local_100._0_32_ = *pauVar46;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_161,(__m256 *)local_100,(__m256 *)local_c0);
                puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                lVar67 = lVar67 + 0x20;
              }
              a = local_160;
            }
            goto switchD_0037a98e_default;
          }
LAB_00383d77:
          local_120 = 0xffffffffffffff9c;
          opt = local_130;
LAB_00383d85:
          uVar35 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                             (a,b,this_00,opt);
          local_120 = (ulong)uVar35;
          goto switchD_0037a98e_default;
        }
        uVar37 = uVar62 ^ uVar58;
        if (((uVar44 ^ 1) == 0 && ((uint)local_150 ^ 1) == 0) && uVar37 == 0) {
          local_158 = pafVar65;
          local_148 = pafVar54;
          Mat::create(this_00,uVar57,uVar70,uVar58,local_80,iVar34,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if ((int)local_110 < 1) {
              local_110._0_4_ = 0;
            }
            iVar34 = (int)local_128;
            local_120 = 0;
            local_128 = local_128 & 0xffffffff;
            if (iVar34 < 1) {
              local_128 = 0;
            }
            for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
                local_150 = (__m512 *)((long)local_150 + 1)) {
              lVar66 = a->cstep * a->elemsize * (long)local_150;
              pvVar9 = a->data;
              lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
              pvVar69 = this_00->data;
              local_c0._0_32_ =
                   *(undefined1 (*) [32])
                    ((long)a[1].data + a[1].cstep * (long)local_150 * a[1].elemsize);
              lVar67 = 0;
              iVar34 = (int)local_110;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                pauVar46 = (undefined1 (*) [32])((long)pvVar9 + lVar67 + lVar66);
                uVar109 = *(undefined8 *)*pauVar46;
                uVar108 = *(undefined8 *)(*pauVar46 + 8);
                uVar111 = *(undefined8 *)(*pauVar46 + 0x10);
                uVar112 = *(undefined8 *)(*pauVar46 + 0x18);
                local_100._0_32_ = *pauVar46;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_161,(__m256 *)local_100,(__m256 *)local_c0);
                puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                lVar67 = lVar67 + 0x20;
              }
              a = local_160;
            }
          }
          goto switchD_0037a98e_default;
        }
        if ((uVar44 == uVar57) && (uVar35 == 1 && (uVar62 == 1 && (uint)local_150 == uVar70))) {
          local_158 = pafVar65;
          local_148 = pafVar54;
          Mat::create(this_00,uVar57,uVar70,uVar58,local_80,iVar34,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if ((int)local_110 < 1) {
              local_110._0_4_ = 0;
            }
            iVar34 = (int)local_128;
            local_120 = 0;
            local_128 = local_128 & 0xffffffff;
            if (iVar34 < 1) {
              local_128 = 0;
            }
            for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
                local_150 = (__m512 *)((long)local_150 + 1)) {
              pvVar9 = a[1].data;
              lVar66 = a->cstep * a->elemsize * (long)local_150;
              pvVar69 = a->data;
              lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
              pvVar75 = this_00->data;
              lVar67 = 0;
              iVar34 = (int)local_110;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                local_c0._0_32_ = *(undefined1 (*) [32])((long)pvVar69 + lVar67 * 8 + lVar66);
                uVar1 = *(undefined4 *)((long)pvVar9 + lVar67);
                auVar78._4_4_ = uVar1;
                auVar78._0_4_ = uVar1;
                auVar78._8_4_ = uVar1;
                auVar78._12_4_ = uVar1;
                auVar78._16_4_ = uVar1;
                auVar78._20_4_ = uVar1;
                auVar78._24_4_ = uVar1;
                auVar78._28_4_ = uVar1;
                local_100[0] = (float)uVar1;
                local_100[1] = (float)uVar1;
                local_100[2] = (float)uVar1;
                local_100[3] = (float)uVar1;
                local_100[4] = (float)uVar1;
                local_100[5] = (float)uVar1;
                local_100[6] = (float)uVar1;
                local_100[7] = (float)uVar1;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                *(undefined1 (*) [32])((long)pvVar75 + lVar67 * 8 + lVar48) = auVar78;
                lVar67 = lVar67 + 4;
              }
              a = local_160;
            }
          }
          goto switchD_0037a98e_default;
        }
        local_130 = (Option *)(CONCAT44(local_130._4_4_,(uint)local_150) ^ 1);
        if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar37 == 0) {
          local_158 = pafVar65;
          local_148 = pafVar54;
          Mat::create(this_00,uVar44,(uint)local_150,uVar58,sVar60,uVar35,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if ((int)local_108 < 1) {
              local_108._0_4_ = 0;
            }
            iVar34 = (int)local_128;
            local_120 = 0;
            local_128 = local_128 & 0xffffffff;
            if (iVar34 < 1) {
              local_128 = 0;
            }
            for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
                local_150 = (__m512 *)((long)local_150 + 1)) {
              lVar66 = a[1].cstep * a[1].elemsize * (long)local_150;
              pvVar9 = a[1].data;
              lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
              pvVar69 = this_00->data;
              local_c0._0_32_ =
                   *(undefined1 (*) [32])((long)a->data + a->cstep * (long)local_150 * a->elemsize);
              lVar67 = 0;
              iVar34 = (int)local_108;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                pauVar46 = (undefined1 (*) [32])((long)pvVar9 + lVar67 + lVar66);
                uVar109 = *(undefined8 *)*pauVar46;
                uVar108 = *(undefined8 *)(*pauVar46 + 8);
                uVar111 = *(undefined8 *)(*pauVar46 + 0x10);
                uVar112 = *(undefined8 *)(*pauVar46 + 0x18);
                local_100._0_32_ = *pauVar46;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                lVar67 = lVar67 + 0x20;
              }
              a = local_160;
            }
          }
          goto switchD_0037a98e_default;
        }
        local_118 = CONCAT44(local_118._4_4_,uVar35);
        if ((uVar44 == uVar57) && (iVar34 == 1 && (uVar58 == 1 && (uint)local_150 == uVar70))) {
          local_158 = pafVar65;
          local_148 = pafVar54;
          Mat::create(this_00,uVar57,uVar70,uVar62,sVar60,uVar35,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if ((int)local_108 < 1) {
              local_108._0_4_ = 0;
            }
            iVar34 = (int)local_138;
            local_120 = 0;
            local_138 = local_138 & 0xffffffff;
            if (iVar34 < 1) {
              local_138 = 0;
            }
            for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_138;
                local_150 = (__m512 *)((long)local_150 + 1)) {
              pvVar9 = local_160->data;
              lVar66 = local_160[1].cstep * local_160[1].elemsize * (long)local_150;
              pvVar69 = local_160[1].data;
              lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
              pvVar75 = this_00->data;
              lVar67 = 0;
              iVar34 = (int)local_108;
              while (afVar81 = local_c0, bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                local_c0[1] = *(float *)((long)pvVar9 + lVar67);
                local_c0[0] = local_c0[1];
                local_c0[2] = local_c0[1];
                local_c0[3] = local_c0[1];
                local_c0[4] = local_c0[1];
                local_c0[5] = local_c0[1];
                local_c0[6] = local_c0[1];
                local_c0._32_32_ = afVar81._32_32_;
                local_c0[7] = local_c0[1];
                auVar78 = *(undefined1 (*) [32])((long)pvVar69 + lVar67 * 8 + lVar66);
                local_100[0] = (float)auVar78._0_4_;
                local_100[1] = (float)auVar78._4_4_;
                local_100[2] = (float)auVar78._8_4_;
                local_100[3] = (float)auVar78._12_4_;
                local_100[4] = (float)auVar78._16_4_;
                local_100[5] = (float)auVar78._20_4_;
                local_100[6] = (float)auVar78._24_4_;
                local_100[7] = (float)auVar78._28_4_;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                *(undefined1 (*) [32])((long)pvVar75 + lVar67 * 8 + lVar48) = auVar78;
                lVar67 = lVar67 + 4;
              }
            }
          }
          goto switchD_0037a98e_default;
        }
        if ((((uVar44 ^ 1) == 0 && ((uint)local_150 ^ uVar70) == 0) && uVar37 == 0) && uVar57 != 1)
        {
          local_158 = pafVar65;
          local_148 = pafVar54;
          Mat::create(this_00,uVar57,uVar70,uVar58,local_80,iVar34,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            pafVar65 = (__m512 *)((ulong)local_158 & 0xffffffff);
            if ((int)local_158 < 1) {
              pafVar65 = (__m512 *)0x0;
            }
            pafVar54 = (__m512 *)((ulong)local_148 & 0xffffffff);
            if ((int)local_148 < 1) {
              pafVar54 = (__m512 *)0x0;
            }
            iVar34 = (int)local_128;
            local_120 = 0;
            local_128 = local_128 & 0xffffffff;
            if (iVar34 < 1) {
              local_128 = 0;
            }
            local_158 = pafVar65;
            local_148 = pafVar54;
            for (local_130 = (Option *)0x0; local_130 != (Option *)local_128;
                local_130 = (Option *)((long)local_130 + 1)) {
              pauVar72 = (undefined1 (*) [32])
                         (local_160->cstep * (long)local_130 * local_160->elemsize +
                         (long)local_160->data);
              local_140 = (Mat *)(local_160[1].cstep * (long)local_130 * local_160[1].elemsize +
                                 (long)local_160[1].data);
              pauVar46 = (undefined1 (*) [32])
                         (this_00->cstep * (long)local_130 * this_00->elemsize + (long)this_00->data
                         );
              for (local_150 = (__m512 *)0x0; local_150 != pafVar54;
                  local_150 = (__m512 *)((long)local_150 + 1)) {
                local_c0._0_32_ = *(undefined1 (*) [32])((long)local_140 + (long)local_150 * 0x20);
                uVar68 = (ulong)pafVar65 & 0xffffffff;
                while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  auVar78 = *pauVar72;
                  local_100[0] = (float)auVar78._0_4_;
                  local_100[1] = (float)auVar78._4_4_;
                  local_100[2] = (float)auVar78._8_4_;
                  local_100[3] = (float)auVar78._12_4_;
                  local_100[4] = (float)auVar78._16_4_;
                  local_100[5] = (float)auVar78._20_4_;
                  local_100[6] = (float)auVar78._24_4_;
                  local_100[7] = (float)auVar78._28_4_;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            (&local_161,(__m256 *)local_100,(__m256 *)local_c0);
                  *pauVar46 = auVar78;
                  pauVar72 = pauVar72 + 1;
                  pauVar46 = pauVar46 + 1;
                }
                pafVar65 = local_158;
                pafVar54 = local_148;
              }
            }
          }
          goto switchD_0037a98e_default;
        }
        if (((((uint)local_150 ^ 1) == 0 && (uVar44 ^ uVar57) == 0) && uVar37 == 0) && uVar70 != 1)
        {
          local_158 = pafVar65;
          local_148 = pafVar54;
          Mat::create(this_00,uVar57,uVar70,uVar58,local_80,iVar34,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            uVar68 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar68 = 0;
            }
            iVar34 = (int)local_148;
            local_148 = (__m512 *)((ulong)local_148 & 0xffffffff);
            if (iVar34 < 1) {
              local_148 = (__m512 *)0x0;
            }
            iVar34 = (int)local_128;
            local_120 = 0;
            local_128 = local_128 & 0xffffffff;
            if (iVar34 < 1) {
              local_128 = 0;
            }
            for (local_140 = (Mat *)0x0; local_140 != (Mat *)local_128;
                local_140 = (Mat *)((long)local_140 + 1)) {
              pvVar75 = (void *)(local_160->cstep * (long)local_140 * local_160->elemsize +
                                (long)local_160->data);
              pvVar69 = (void *)(this_00->cstep * (long)local_140 * this_00->elemsize +
                                (long)this_00->data);
              lVar48 = local_160[1].cstep * local_160[1].elemsize * (long)local_140;
              pvVar9 = local_160[1].data;
              for (local_150._0_4_ = 0; (uint)local_150 != (int)local_148;
                  local_150._0_4_ = (uint)local_150 + 1) {
                for (lVar66 = 0; uVar68 * 0x20 != lVar66; lVar66 = lVar66 + 0x20) {
                  local_c0._0_32_ = *(undefined1 (*) [32])((long)pvVar75 + lVar66);
                  auVar78 = *(undefined1 (*) [32])((long)pvVar9 + lVar66 + lVar48);
                  local_100[0] = (float)auVar78._0_4_;
                  local_100[1] = (float)auVar78._4_4_;
                  local_100[2] = (float)auVar78._8_4_;
                  local_100[3] = (float)auVar78._12_4_;
                  local_100[4] = (float)auVar78._16_4_;
                  local_100[5] = (float)auVar78._20_4_;
                  local_100[6] = (float)auVar78._24_4_;
                  local_100[7] = (float)auVar78._28_4_;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                  *(undefined1 (*) [32])((long)pvVar69 + lVar66) = auVar78;
                }
                pvVar75 = (void *)((long)pvVar75 + lVar66);
                pvVar69 = (void *)((long)pvVar69 + lVar66);
              }
            }
          }
          goto switchD_0037a98e_default;
        }
        if ((((uVar57 ^ 1) == 0 && ((uint)local_150 ^ uVar70) == 0) && uVar37 == 0) && uVar44 != 1)
        {
          local_158 = pafVar65;
          local_148 = pafVar54;
          Mat::create(this_00,uVar44,uVar70,uVar58,sVar60,uVar35,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            iVar34 = (uint)local_140;
            if ((int)(uint)local_140 < 1) {
              iVar34 = 0;
            }
            iVar38 = (int)local_148;
            local_148 = (__m512 *)((ulong)local_148 & 0xffffffff);
            if (iVar38 < 1) {
              local_148 = (__m512 *)0x0;
            }
            iVar38 = (int)local_128;
            local_120 = 0;
            local_128 = local_128 & 0xffffffff;
            if (iVar38 < 1) {
              local_128 = 0;
            }
            local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
            for (local_130 = (Option *)0x0; local_130 != (Option *)local_128;
                local_130 = (Option *)((long)local_130 + 1)) {
              local_158 = (__m512 *)
                          (local_160->cstep * (long)local_130 * local_160->elemsize +
                          (long)local_160->data);
              pauVar46 = (undefined1 (*) [32])
                         (local_160[1].cstep * (long)local_130 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar72 = (undefined1 (*) [32])
                         (this_00->cstep * (long)local_130 * this_00->elemsize + (long)this_00->data
                         );
              for (local_150 = (__m512 *)0x0; local_150 != local_148;
                  local_150 = (__m512 *)((long)local_150 + 1)) {
                local_c0._0_32_ = *(undefined1 (*) [32])((long)local_158 + (long)local_150 * 0x20);
                while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                  auVar78 = *pauVar46;
                  local_100[0] = (float)auVar78._0_4_;
                  local_100[1] = (float)auVar78._4_4_;
                  local_100[2] = (float)auVar78._8_4_;
                  local_100[3] = (float)auVar78._12_4_;
                  local_100[4] = (float)auVar78._16_4_;
                  local_100[5] = (float)auVar78._20_4_;
                  local_100[6] = (float)auVar78._24_4_;
                  local_100[7] = (float)auVar78._28_4_;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                  *pauVar72 = auVar78;
                  pauVar46 = pauVar46 + 1;
                  pauVar72 = pauVar72 + 1;
                }
                iVar34 = (uint)local_140;
              }
            }
          }
          goto switchD_0037a98e_default;
        }
        local_158 = pafVar65;
        local_148 = pafVar54;
        if ((((uVar44 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar37 == 0) && (uint)local_150 != 1)
        {
          Mat::create(this_00,uVar57,(uint)local_150,uVar58,sVar60,uVar35,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            uVar68 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar68 = 0;
            }
            if ((int)(uint)local_150 < 1) {
              local_150._0_4_ = 0;
            }
            iVar34 = (int)local_128;
            local_120 = 0;
            local_128 = local_128 & 0xffffffff;
            if (iVar34 < 1) {
              local_128 = 0;
            }
            for (local_148 = (__m512 *)0x0; local_148 != (__m512 *)local_128;
                local_148 = (__m512 *)((long)local_148 + 1)) {
              pvVar69 = (void *)(local_160[1].cstep * (long)local_148 * local_160[1].elemsize +
                                (long)local_160[1].data);
              pvVar75 = (void *)(this_00->cstep * (long)local_148 * this_00->elemsize +
                                (long)this_00->data);
              lVar48 = local_160->cstep * local_160->elemsize * (long)local_148;
              pvVar9 = local_160->data;
              iVar34 = 0;
              while (iVar34 != (uint)local_150) {
                local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
                for (lVar66 = 0; uVar68 * 0x20 != lVar66; lVar66 = lVar66 + 0x20) {
                  local_c0._0_32_ = *(undefined1 (*) [32])((long)pvVar9 + lVar66 + lVar48);
                  auVar78 = *(undefined1 (*) [32])((long)pvVar69 + lVar66);
                  local_100[0] = (float)auVar78._0_4_;
                  local_100[1] = (float)auVar78._4_4_;
                  local_100[2] = (float)auVar78._8_4_;
                  local_100[3] = (float)auVar78._12_4_;
                  local_100[4] = (float)auVar78._16_4_;
                  local_100[5] = (float)auVar78._20_4_;
                  local_100[6] = (float)auVar78._24_4_;
                  local_100[7] = (float)auVar78._28_4_;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            (&local_161,(__m256 *)local_c0,(__m256 *)local_100);
                  *(undefined1 (*) [32])((long)pvVar75 + lVar66) = auVar78;
                }
                pvVar69 = (void *)((long)pvVar69 + lVar66);
                pvVar75 = (void *)((long)pvVar75 + lVar66);
                iVar34 = (uint)local_140 + 1;
              }
            }
          }
          goto switchD_0037a98e_default;
        }
        break;
      case 4:
        if (a[1].dims != 4) {
          local_118 = CONCAT44(local_118._4_4_,uVar35);
          local_148 = pafVar54;
          local_130 = opt;
          Mat::create(this_00,uVar57,uVar70,iVar38,uVar58,local_80,iVar34,opt->blob_allocator);
          local_120 = 0xffffffffffffff9c;
          if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
          goto switchD_0037a98e_default;
          iVar34 = a[1].dims;
          iVar41 = (int)local_128;
          if (iVar34 != 1) {
            if (iVar34 == 3) {
              if ((int)uVar57 < 1) {
                pafVar65 = (__m512 *)0x0;
              }
              pafVar54 = (__m512 *)((ulong)local_148 & 0xffffffff);
              if ((int)local_148 < 1) {
                pafVar54 = (__m512 *)0x0;
              }
              if (iVar38 < 1) {
                iVar38 = 0;
              }
              local_138 = CONCAT44(local_138._4_4_,iVar38);
              local_120 = 0;
              local_128 = local_128 & 0xffffffff;
              if (iVar41 < 1) {
                local_128 = 0;
              }
              local_158 = pafVar65;
              local_148 = pafVar54;
              for (local_110 = 0; local_110 != local_128; local_110 = local_110 + 1) {
                pauVar46 = (undefined1 (*) [32])
                           (local_160->cstep * local_110 * local_160->elemsize +
                           (long)local_160->data);
                local_150 = (__m512 *)
                            (local_160[1].cstep * local_110 * local_160[1].elemsize +
                            (long)local_160[1].data);
                pauVar72 = (undefined1 (*) [32])
                           (this_00->cstep * local_110 * this_00->elemsize + (long)this_00->data);
                for (iVar34 = 0; iVar34 != (int)local_138; iVar34 = iVar34 + 1) {
                  local_130 = (Option *)CONCAT44(local_130._4_4_,iVar34);
                  iVar38 = 0;
                  while (iVar38 != (int)pafVar54) {
                    local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar38);
                    local_c0._0_32_ = *(undefined1 (*) [32])local_150;
                    uVar68 = (ulong)pafVar65 & 0xffffffff;
                    while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      auVar78 = *pauVar46;
                      local_100[0] = (float)auVar78._0_4_;
                      local_100[1] = (float)auVar78._4_4_;
                      local_100[2] = (float)auVar78._8_4_;
                      local_100[3] = (float)auVar78._12_4_;
                      local_100[4] = (float)auVar78._16_4_;
                      local_100[5] = (float)auVar78._20_4_;
                      local_100[6] = (float)auVar78._24_4_;
                      local_100[7] = (float)auVar78._28_4_;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                (&local_161,(__m256 *)local_100,(__m256 *)local_c0);
                      *pauVar72 = auVar78;
                      pauVar46 = pauVar46 + 1;
                      pauVar72 = pauVar72 + 1;
                    }
                    local_150 = (__m512 *)((long)local_150 + 0x20);
                    pafVar65 = local_158;
                    pafVar54 = local_148;
                    iVar34 = (uint)local_130;
                    iVar38 = (uint)local_140 + 1;
                  }
                }
              }
            }
            else {
              local_120 = 0;
              if (iVar34 == 2) {
                if ((int)uVar57 < 1) {
                  pafVar65 = (__m512 *)0x0;
                }
                pafVar54 = (__m512 *)((ulong)local_148 & 0xffffffff);
                if ((int)local_148 < 1) {
                  pafVar54 = (__m512 *)0x0;
                }
                if (iVar38 < 1) {
                  iVar38 = 0;
                }
                local_138 = CONCAT44(local_138._4_4_,iVar38);
                local_120 = 0;
                local_128 = local_128 & 0xffffffff;
                if (iVar41 < 1) {
                  local_128 = 0;
                }
                local_158 = pafVar65;
                local_148 = pafVar54;
                for (local_110 = 0; local_110 != local_128; local_110 = local_110 + 1) {
                  pauVar46 = (undefined1 (*) [32])
                             (local_160->cstep * local_110 * local_160->elemsize +
                             (long)local_160->data);
                  local_130 = (Option *)
                              ((long)local_160[1].w * local_110 * local_160[1].elemsize +
                              (long)local_160[1].data);
                  pauVar72 = (undefined1 (*) [32])
                             (this_00->cstep * local_110 * this_00->elemsize + (long)this_00->data);
                  for (iVar34 = 0; iVar34 != (int)local_138; iVar34 = iVar34 + 1) {
                    local_c0._0_32_ = local_130->lightmode;
                    local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
                    for (local_150._0_4_ = 0; (uint)local_150 != (int)pafVar54;
                        local_150._0_4_ = (uint)local_150 + 1) {
                      uVar68 = (ulong)pafVar65 & 0xffffffff;
                      while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                        auVar78 = *pauVar46;
                        local_100[0] = (float)auVar78._0_4_;
                        local_100[1] = (float)auVar78._4_4_;
                        local_100[2] = (float)auVar78._8_4_;
                        local_100[3] = (float)auVar78._12_4_;
                        local_100[4] = (float)auVar78._16_4_;
                        local_100[5] = (float)auVar78._20_4_;
                        local_100[6] = (float)auVar78._24_4_;
                        local_100[7] = (float)auVar78._28_4_;
                        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                                  (&local_161,(__m256 *)local_100,(__m256 *)local_c0);
                        *pauVar72 = auVar78;
                        pauVar46 = pauVar46 + 1;
                        pauVar72 = pauVar72 + 1;
                      }
                      pafVar65 = local_158;
                      pafVar54 = local_148;
                      iVar34 = (uint)local_140;
                    }
                    local_130 = (Option *)((long)local_130 + 0x20);
                  }
                }
              }
            }
            goto switchD_0037a98e_default;
          }
          if ((int)local_118 != 1 || a[1].w != 1) {
            if ((int)local_110 < 1) {
              local_110._0_4_ = 0;
            }
            local_120 = 0;
            local_128 = local_128 & 0xffffffff;
            if (iVar41 < 1) {
              local_128 = 0;
            }
            for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
                local_150 = (__m512 *)((long)local_150 + 1)) {
              lVar67 = a->cstep * a->elemsize * (long)local_150;
              pvVar9 = a->data;
              local_c0._0_32_ = *(undefined1 (*) [32])((long)a[1].data + (long)local_150 * 0x20);
              lVar66 = this_00->cstep * this_00->elemsize * (long)local_150;
              pvVar69 = this_00->data;
              lVar48 = 0;
              iVar34 = (int)local_110;
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                pauVar46 = (undefined1 (*) [32])((long)pvVar9 + lVar48 + lVar67);
                uVar109 = *(undefined8 *)*pauVar46;
                uVar108 = *(undefined8 *)(*pauVar46 + 8);
                uVar111 = *(undefined8 *)(*pauVar46 + 0x10);
                uVar112 = *(undefined8 *)(*pauVar46 + 0x18);
                local_100._0_32_ = *pauVar46;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                          (&local_161,(__m256 *)local_100,(__m256 *)local_c0);
                puVar71 = (undefined8 *)((long)pvVar69 + lVar48 + lVar66);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                lVar48 = lVar48 + 0x20;
              }
              a = local_160;
            }
            goto switchD_0037a98e_default;
          }
          goto LAB_00383d77;
        }
      }
      local_120 = 0;
      uVar35 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                         (a,b,this_00,opt);
      local_120 = (ulong)uVar35;
switchD_0037a98e_default:
      return (int)local_120;
    case 7:
      pMVar49 = a;
      break;
    case 8:
      pMVar49 = a;
LAB_003761d8:
      iVar34 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                         (b,pMVar49,this_00,opt);
      return iVar34;
    default:
      goto switchD_0037569f_default;
    }
    iVar34 = binary_op_pack8<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>
                       (b,pMVar49,this_00,opt);
    return iVar34;
  }
  switch(*(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3])) {
  case 0:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
    uVar57 = a->w;
    uVar70 = a->h;
    uVar58 = a->d;
    uVar44 = a->c;
    local_158 = (__m512 *)(ulong)uVar44;
    local_138 = (size_t)(uVar70 * uVar57 * uVar58);
    sVar60 = a->elemsize;
    uVar62 = a[1].w;
    uVar37 = a[1].h;
    uVar59 = a[1].d;
    uVar3 = a[1].c;
    local_148 = (__m512 *)(ulong)uVar3;
    local_130 = (Option *)(ulong)(uVar37 * uVar62 * uVar59);
    sVar5 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar34 != 1 || uVar57 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_003755f6_caseD_1;
        case 2:
          Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
          pauVar39 = (undefined1 (*) [64])this_00->data;
          if (pauVar39 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pauVar42 = (undefined1 (*) [64])local_160->data;
            pauVar50 = (undefined1 (*) [64])local_160[1].data;
            if ((int)uVar62 < 1) {
              uVar62 = 0;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar42;
              uVar57 = uVar62;
              while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                auVar79 = vaddps_avx512f(auVar80,*pauVar50);
                *pauVar39 = auVar79;
                pauVar50 = pauVar50 + 1;
                pauVar39 = pauVar39 + 1;
              }
              pauVar42 = pauVar42 + 1;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              auVar80 = *(undefined1 (*) [64])((long)local_160->data + uVar64 * 0x40);
              pvVar9 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vaddps_avx512f(auVar80,*(undefined1 (*) [64])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                ;
                *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
                lVar48 = lVar48 + 0x40;
              }
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              auVar80 = *(undefined1 (*) [64])((long)local_160->data + uVar64 * 0x40);
              pvVar9 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vaddps_avx512f(auVar80,*(undefined1 (*) [64])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                ;
                *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
                lVar48 = lVar48 + 0x40;
              }
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_003758b0;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          uVar63 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data);
            pauVar42 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar50 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar39;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vaddps_avx512f(auVar80,*pauVar42);
                *pauVar50 = auVar79;
                pauVar42 = pauVar42 + 1;
                pauVar50 = pauVar50 + 1;
              }
              pauVar39 = pauVar39 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar63 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data);
            pauVar42 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar50 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar39;
              for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                while ((int)uVar55 != 0) {
                  auVar79 = vaddps_avx512f(auVar80,*pauVar42);
                  *pauVar50 = auVar79;
                  pauVar42 = pauVar42 + 1;
                  pauVar50 = pauVar50 + 1;
                  uVar55 = (ulong)((int)uVar55 - 1);
                }
              }
              pauVar39 = pauVar39 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = local_160[1].dims;
      if (iVar34 == 1) {
        Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
        pauVar39 = (undefined1 (*) [64])this_00->data;
        if (pauVar39 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_118 != 1 || local_160[1].w != 1) {
          pauVar42 = (undefined1 (*) [64])local_160->data;
          pauVar50 = (undefined1 (*) [64])local_160[1].data;
          if ((int)uVar57 < 1) {
            uVar57 = 0;
          }
          if ((int)uVar70 < 1) {
            uVar70 = 0;
          }
          for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
            auVar80 = *pauVar50;
            uVar58 = uVar57;
            while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
              auVar79 = vaddps_avx512f(auVar80,*pauVar42);
              *pauVar39 = auVar79;
              pauVar42 = pauVar42 + 1;
              pauVar39 = pauVar39 + 1;
            }
            pauVar50 = pauVar50 + 1;
          }
          return 0;
        }
        goto LAB_00385822;
      }
LAB_0037df07:
      if (iVar34 != 2) {
        return 0;
      }
      goto LAB_0037a15d;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar64 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                  auVar80 = *pauVar39;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar79 = vaddps_avx512f(auVar80,*pauVar42);
                    *pauVar50 = auVar79;
                    pauVar42 = pauVar42 + 1;
                    pauVar50 = pauVar50 + 1;
                  }
                  pauVar39 = pauVar39 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_160[1].dims != 1) {
          if (local_160[1].dims == 2) {
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                auVar80 = *pauVar42;
                uVar58 = uVar57;
                while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                  auVar79 = vaddps_avx512f(auVar80,*pauVar39);
                  *pauVar50 = auVar79;
                  pauVar39 = pauVar39 + 1;
                  pauVar50 = pauVar50 + 1;
                }
                pauVar42 = pauVar42 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        if (uVar35 != 1 || local_160[1].w != 1) {
          uVar68 = 0;
          uVar64 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar64 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = 0;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            auVar80 = *(undefined1 (*) [64])((long)local_160[1].data + uVar68 * 0x40);
            pvVar9 = local_160->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar64;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vaddps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        goto LAB_00385822;
      }
      uVar58 = uVar3 ^ uVar44;
      if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_160->data;
            auVar80 = *(undefined1 (*) [64])
                       ((long)local_160[1].data +
                       local_160[1].cstep * uVar64 * local_160[1].elemsize);
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar68;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vaddps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          iVar34 = (int)local_138;
          if ((int)local_138 < 1) {
            iVar34 = 0;
          }
          uVar64 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar64 = uVar68;
          }
          for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            pvVar9 = local_160[1].data;
            pvVar69 = local_160->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar75 = this_00->data;
            lVar66 = 0;
            for (lVar48 = 0; iVar34 != (int)lVar48; lVar48 = lVar48 + 1) {
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar48 * 4)));
              auVar80 = vaddps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar69 +
                                                lVar66 * 4 + sVar60 * sVar5 * uVar68));
              *(undefined1 (*) [64])((long)pvVar75 + lVar66 * 4 + sVar7 * sVar8 * uVar68) = auVar80;
              lVar66 = lVar66 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      }
      local_138 = sVar60;
      if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
        Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)local_130 & 0xffffffff;
          if ((int)local_130 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_160[1].data;
            auVar80 = *(undefined1 (*) [64])
                       ((long)local_160->data + local_160->cstep * uVar64 * local_160->elemsize);
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar68;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vaddps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((uVar62 == uVar57) && (iVar34 == 1)) && ((uVar37 == uVar70 && (uVar44 == 1)))) {
        Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          iVar34 = (int)local_130;
          if ((int)local_130 < 1) {
            iVar34 = 0;
          }
          uVar64 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar64 = uVar68;
          }
          for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160->data;
            pvVar69 = local_160[1].data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar75 = this_00->data;
            lVar48 = 0;
            for (lVar66 = 0; iVar34 != (int)lVar66; lVar66 = lVar66 + 1) {
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar66 * 4)));
              auVar80 = vaddps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar69 +
                                                lVar48 * 4 + sVar60 * sVar5 * uVar68));
              *(undefined1 (*) [64])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) = auVar80;
              lVar48 = lVar48 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      }
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          if ((int)uVar57 < 1) {
            uVar57 = 0;
          }
          uVar64 = (ulong)uVar70;
          if ((int)uVar70 < 1) {
            uVar64 = uVar68;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar68;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160[1].data;
            pauVar42 = (undefined1 (*) [64])
                       (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
            for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
              auVar80 = *(undefined1 (*) [64])
                         ((long)pvVar9 + uVar55 * 0x40 + sVar60 * uVar68 * sVar5);
              uVar35 = uVar57;
              while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                auVar79 = vaddps_avx512f(auVar80,*pauVar39);
                *pauVar42 = auVar79;
                pauVar39 = pauVar39 + 1;
                pauVar42 = pauVar42 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar57;
          if ((int)uVar57 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar70 < 1) {
            uVar70 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                              (long)local_160->data);
            sVar60 = local_160[1].cstep;
            pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160[1].data;
            for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
              for (lVar48 = 0; uVar68 * 0x40 != lVar48; lVar48 = lVar48 + 0x40) {
                auVar80 = vaddps_avx512f(*(undefined1 (*) [64])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64),
                                         *(undefined1 (*) [64])((long)pvVar69 + lVar48));
                *(undefined1 (*) [64])((long)pvVar75 + lVar48) = auVar80;
              }
              pvVar69 = (void *)((long)pvVar69 + lVar48);
              pvVar75 = (void *)((long)pvVar75 + lVar48);
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
        Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)uVar70;
          if ((int)uVar70 < 1) {
            uVar63 = uVar64;
          }
          uVar55 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar55 = uVar64;
          }
          for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            pvVar9 = local_160->data;
            pauVar39 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar42 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
              auVar80 = *(undefined1 (*) [64])
                         ((long)pvVar9 + uVar56 * 0x40 + sVar60 * uVar64 * sVar5);
              uVar61 = uVar68;
              while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vaddps_avx512f(auVar80,*pauVar39);
                *pauVar42 = auVar79;
                pauVar39 = pauVar39 + 1;
                pauVar42 = pauVar42 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
        Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar57;
          if ((int)uVar57 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                              (long)local_160[1].data);
            pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_160->elemsize;
            pvVar9 = local_160->data;
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              for (lVar48 = 0; uVar68 * 0x40 != lVar48; lVar48 = lVar48 + 0x40) {
                auVar80 = vaddps_avx512f(*(undefined1 (*) [64])((long)pvVar69 + lVar48),
                                         *(undefined1 (*) [64])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                *(undefined1 (*) [64])((long)pvVar75 + lVar48) = auVar80;
              }
              pvVar69 = (void *)((long)pvVar69 + lVar48);
              pvVar75 = (void *)((long)pvVar75 + lVar48);
            }
          }
          return 0;
        }
        return -100;
      }
LAB_003889f9:
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      break;
    case 4:
      if (a[1].dims != 4) {
        local_130 = opt;
        Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = local_160[1].dims;
        iVar38 = (int)local_158;
        if (iVar34 != 1) {
          if (iVar34 == 3) {
            uVar35 = 0;
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = uVar35;
            }
            if ((int)uVar70 < 1) {
              uVar70 = uVar35;
            }
            if ((int)uVar58 < 1) {
              uVar58 = uVar35;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                  auVar80 = *pauVar42;
                  uVar62 = uVar57;
                  while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                    auVar79 = vaddps_avx512f(auVar80,*pauVar39);
                    *pauVar50 = auVar79;
                    pauVar39 = pauVar39 + 1;
                    pauVar50 = pauVar50 + 1;
                  }
                  pauVar42 = pauVar42 + 1;
                }
              }
            }
            return 0;
          }
          if (iVar34 == 2) {
            uVar35 = 0;
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = uVar35;
            }
            if ((int)uVar70 < 1) {
              uVar70 = uVar35;
            }
            if ((int)uVar58 < 1) {
              uVar58 = uVar35;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                auVar80 = *pauVar42;
                for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                  while (uVar62 != 0) {
                    auVar79 = vaddps_avx512f(auVar80,*pauVar39);
                    *pauVar50 = auVar79;
                    pauVar39 = pauVar39 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar62 = uVar62 - 1;
                  }
                }
                pauVar42 = pauVar42 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        opt = local_130;
        if (uVar35 != 1 || local_160[1].w != 1) {
          uVar68 = 0;
          uVar64 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar64 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if (iVar38 < 1) {
            uVar63 = 0;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar9 = this_00->data;
            auVar80 = *(undefined1 (*) [64])((long)local_160[1].data + uVar68 * 0x40);
            sVar8 = local_160->elemsize;
            pvVar69 = local_160->data;
            lVar48 = 0;
            uVar55 = uVar64;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vaddps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68));
              *(undefined1 (*) [64])((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        goto LAB_00385822;
      }
    }
LAB_0037a150:
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
LAB_0037a15d:
    iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
                       (local_160,local_140,this_00,opt);
    return iVar34;
  case 1:
    pMVar49 = b;
    b = a;
    break;
  case 2:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
    uVar57 = a->w;
    uVar70 = a->h;
    uVar58 = a->d;
    uVar44 = a->c;
    local_158 = (__m512 *)(ulong)uVar44;
    local_138 = (size_t)(uVar70 * uVar57 * uVar58);
    sVar60 = a->elemsize;
    uVar62 = a[1].w;
    uVar37 = a[1].h;
    uVar59 = a[1].d;
    uVar3 = a[1].c;
    local_148 = (__m512 *)(ulong)uVar3;
    local_130 = (Option *)(ulong)(uVar37 * uVar62 * uVar59);
    sVar5 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar34 != 1 || uVar57 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_00375adb_caseD_1;
        case 2:
          Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
          pauVar39 = (undefined1 (*) [64])this_00->data;
          if (pauVar39 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pauVar42 = (undefined1 (*) [64])local_160->data;
            pauVar50 = (undefined1 (*) [64])local_160[1].data;
            if ((int)uVar62 < 1) {
              uVar62 = 0;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar42;
              uVar57 = uVar62;
              while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                auVar79 = vmulps_avx512f(auVar80,*pauVar50);
                *pauVar39 = auVar79;
                pauVar50 = pauVar50 + 1;
                pauVar39 = pauVar39 + 1;
              }
              pauVar42 = pauVar42 + 1;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              auVar80 = *(undefined1 (*) [64])((long)local_160->data + uVar64 * 0x40);
              pvVar9 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vmulps_avx512f(auVar80,*(undefined1 (*) [64])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                ;
                *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
                lVar48 = lVar48 + 0x40;
              }
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              auVar80 = *(undefined1 (*) [64])((long)local_160->data + uVar64 * 0x40);
              pvVar9 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vmulps_avx512f(auVar80,*(undefined1 (*) [64])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                ;
                *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
                lVar48 = lVar48 + 0x40;
              }
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_00376322;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          uVar63 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data);
            pauVar42 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar50 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar39;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vmulps_avx512f(auVar80,*pauVar42);
                *pauVar50 = auVar79;
                pauVar42 = pauVar42 + 1;
                pauVar50 = pauVar50 + 1;
              }
              pauVar39 = pauVar39 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar63 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data);
            pauVar42 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar50 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar39;
              for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                while ((int)uVar55 != 0) {
                  auVar79 = vmulps_avx512f(auVar80,*pauVar42);
                  *pauVar50 = auVar79;
                  pauVar42 = pauVar42 + 1;
                  pauVar50 = pauVar50 + 1;
                  uVar55 = (ulong)((int)uVar55 - 1);
                }
              }
              pauVar39 = pauVar39 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = local_160[1].dims;
      if (iVar34 == 1) {
        Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
        pauVar39 = (undefined1 (*) [64])this_00->data;
        if (pauVar39 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_118 != 1 || local_160[1].w != 1) {
          pauVar42 = (undefined1 (*) [64])local_160->data;
          pauVar50 = (undefined1 (*) [64])local_160[1].data;
          if ((int)uVar57 < 1) {
            uVar57 = 0;
          }
          if ((int)uVar70 < 1) {
            uVar70 = 0;
          }
          for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
            auVar80 = *pauVar50;
            uVar58 = uVar57;
            while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
              auVar79 = vmulps_avx512f(auVar80,*pauVar42);
              *pauVar39 = auVar79;
              pauVar42 = pauVar42 + 1;
              pauVar39 = pauVar39 + 1;
            }
            pauVar50 = pauVar50 + 1;
          }
          return 0;
        }
        goto LAB_0038571c;
      }
LAB_0037dd91:
      if (iVar34 != 2) {
        return 0;
      }
      goto LAB_00379f2a;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar64 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                  auVar80 = *pauVar39;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar79 = vmulps_avx512f(auVar80,*pauVar42);
                    *pauVar50 = auVar79;
                    pauVar42 = pauVar42 + 1;
                    pauVar50 = pauVar50 + 1;
                  }
                  pauVar39 = pauVar39 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_160[1].dims != 1) {
          if (local_160[1].dims == 2) {
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                auVar80 = *pauVar42;
                uVar58 = uVar57;
                while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                  auVar79 = vmulps_avx512f(auVar80,*pauVar39);
                  *pauVar50 = auVar79;
                  pauVar39 = pauVar39 + 1;
                  pauVar50 = pauVar50 + 1;
                }
                pauVar42 = pauVar42 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        if (uVar35 != 1 || local_160[1].w != 1) {
          uVar68 = 0;
          uVar64 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar64 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = 0;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            auVar80 = *(undefined1 (*) [64])((long)local_160[1].data + uVar68 * 0x40);
            pvVar9 = local_160->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar64;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vmulps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        goto LAB_0038571c;
      }
      uVar58 = uVar3 ^ uVar44;
      if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_160->data;
            auVar80 = *(undefined1 (*) [64])
                       ((long)local_160[1].data +
                       local_160[1].cstep * uVar64 * local_160[1].elemsize);
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar68;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vmulps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          iVar34 = (int)local_138;
          if ((int)local_138 < 1) {
            iVar34 = 0;
          }
          uVar64 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar64 = uVar68;
          }
          for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            pvVar9 = local_160[1].data;
            pvVar69 = local_160->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar75 = this_00->data;
            lVar66 = 0;
            for (lVar48 = 0; iVar34 != (int)lVar48; lVar48 = lVar48 + 1) {
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar48 * 4)));
              auVar80 = vmulps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar69 +
                                                lVar66 * 4 + sVar60 * sVar5 * uVar68));
              *(undefined1 (*) [64])((long)pvVar75 + lVar66 * 4 + sVar7 * sVar8 * uVar68) = auVar80;
              lVar66 = lVar66 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      }
      local_138 = sVar60;
      if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
        Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)local_130 & 0xffffffff;
          if ((int)local_130 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_160[1].data;
            auVar80 = *(undefined1 (*) [64])
                       ((long)local_160->data + local_160->cstep * uVar64 * local_160->elemsize);
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar68;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vmulps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar62 == uVar57) && (iVar34 == 1)) && (uVar37 == uVar70)) && (uVar44 == 1)) {
        Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          iVar34 = (int)local_130;
          if ((int)local_130 < 1) {
            iVar34 = 0;
          }
          uVar64 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar64 = uVar68;
          }
          for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160->data;
            pvVar69 = local_160[1].data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar75 = this_00->data;
            lVar48 = 0;
            for (lVar66 = 0; iVar34 != (int)lVar66; lVar66 = lVar66 + 1) {
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar66 * 4)));
              auVar80 = vmulps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar69 +
                                                lVar48 * 4 + sVar60 * sVar5 * uVar68));
              *(undefined1 (*) [64])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) = auVar80;
              lVar48 = lVar48 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      }
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          if ((int)uVar57 < 1) {
            uVar57 = 0;
          }
          uVar64 = (ulong)uVar70;
          if ((int)uVar70 < 1) {
            uVar64 = uVar68;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar68;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160[1].data;
            pauVar42 = (undefined1 (*) [64])
                       (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
            for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
              auVar80 = *(undefined1 (*) [64])
                         ((long)pvVar9 + uVar55 * 0x40 + sVar60 * uVar68 * sVar5);
              uVar35 = uVar57;
              while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                auVar79 = vmulps_avx512f(auVar80,*pauVar39);
                *pauVar42 = auVar79;
                pauVar39 = pauVar39 + 1;
                pauVar42 = pauVar42 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar57;
          if ((int)uVar57 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar70 < 1) {
            uVar70 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                              (long)local_160->data);
            sVar60 = local_160[1].cstep;
            pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160[1].data;
            for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
              for (lVar48 = 0; uVar68 * 0x40 != lVar48; lVar48 = lVar48 + 0x40) {
                auVar80 = vmulps_avx512f(*(undefined1 (*) [64])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64),
                                         *(undefined1 (*) [64])((long)pvVar69 + lVar48));
                *(undefined1 (*) [64])((long)pvVar75 + lVar48) = auVar80;
              }
              pvVar69 = (void *)((long)pvVar69 + lVar48);
              pvVar75 = (void *)((long)pvVar75 + lVar48);
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
        Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)uVar70;
          if ((int)uVar70 < 1) {
            uVar63 = uVar64;
          }
          uVar55 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar55 = uVar64;
          }
          for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            pvVar9 = local_160->data;
            pauVar39 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar42 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
              auVar80 = *(undefined1 (*) [64])
                         ((long)pvVar9 + uVar56 * 0x40 + sVar60 * uVar64 * sVar5);
              uVar61 = uVar68;
              while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vmulps_avx512f(auVar80,*pauVar39);
                *pauVar42 = auVar79;
                pauVar39 = pauVar39 + 1;
                pauVar42 = pauVar42 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
        Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar57;
          if ((int)uVar57 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                              (long)local_160[1].data);
            pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_160->elemsize;
            pvVar9 = local_160->data;
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              for (lVar48 = 0; uVar68 * 0x40 != lVar48; lVar48 = lVar48 + 0x40) {
                auVar80 = vmulps_avx512f(*(undefined1 (*) [64])((long)pvVar69 + lVar48),
                                         *(undefined1 (*) [64])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                *(undefined1 (*) [64])((long)pvVar75 + lVar48) = auVar80;
              }
              pvVar69 = (void *)((long)pvVar69 + lVar48);
              pvVar75 = (void *)((long)pvVar75 + lVar48);
            }
          }
          return 0;
        }
        return -100;
      }
LAB_003888f1:
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      break;
    case 4:
      if (a[1].dims != 4) {
        local_130 = opt;
        Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = local_160[1].dims;
        iVar38 = (int)local_158;
        if (iVar34 != 1) {
          if (iVar34 == 3) {
            uVar35 = 0;
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = uVar35;
            }
            if ((int)uVar70 < 1) {
              uVar70 = uVar35;
            }
            if ((int)uVar58 < 1) {
              uVar58 = uVar35;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                  auVar80 = *pauVar42;
                  uVar62 = uVar57;
                  while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                    auVar79 = vmulps_avx512f(auVar80,*pauVar39);
                    *pauVar50 = auVar79;
                    pauVar39 = pauVar39 + 1;
                    pauVar50 = pauVar50 + 1;
                  }
                  pauVar42 = pauVar42 + 1;
                }
              }
            }
            return 0;
          }
          if (iVar34 == 2) {
            uVar35 = 0;
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = uVar35;
            }
            if ((int)uVar70 < 1) {
              uVar70 = uVar35;
            }
            if ((int)uVar58 < 1) {
              uVar58 = uVar35;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                auVar80 = *pauVar42;
                for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                  while (uVar62 != 0) {
                    auVar79 = vmulps_avx512f(auVar80,*pauVar39);
                    *pauVar50 = auVar79;
                    pauVar39 = pauVar39 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar62 = uVar62 - 1;
                  }
                }
                pauVar42 = pauVar42 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        opt = local_130;
        if (uVar35 != 1 || local_160[1].w != 1) {
          uVar68 = 0;
          uVar64 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar64 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if (iVar38 < 1) {
            uVar63 = 0;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar9 = this_00->data;
            auVar80 = *(undefined1 (*) [64])((long)local_160[1].data + uVar68 * 0x40);
            sVar8 = local_160->elemsize;
            pvVar69 = local_160->data;
            lVar48 = 0;
            uVar55 = uVar64;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vmulps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68));
              *(undefined1 (*) [64])((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        goto LAB_0038571c;
      }
    }
LAB_00379f1d:
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
LAB_00379f2a:
    iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                       (local_160,local_140,this_00,opt);
    return iVar34;
  case 3:
    pMVar49 = b;
    b = a;
    goto LAB_00375d96;
  case 4:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
    uVar57 = a->w;
    uVar70 = a->h;
    uVar58 = a->d;
    uVar44 = a->c;
    local_158 = (__m512 *)(ulong)uVar44;
    local_138 = (size_t)(uVar70 * uVar57 * uVar58);
    sVar60 = a->elemsize;
    uVar62 = a[1].w;
    uVar37 = a[1].h;
    uVar59 = a[1].d;
    uVar3 = a[1].c;
    local_148 = (__m512 *)(ulong)uVar3;
    local_130 = (Option *)(ulong)(uVar37 * uVar62 * uVar59);
    sVar5 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar34 != 1 || uVar57 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_00375993_caseD_1;
        case 2:
          Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
          pauVar39 = (undefined1 (*) [64])this_00->data;
          if (pauVar39 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pauVar42 = (undefined1 (*) [64])local_160->data;
            pauVar50 = (undefined1 (*) [64])local_160[1].data;
            if ((int)uVar62 < 1) {
              uVar62 = 0;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar42;
              uVar57 = uVar62;
              while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                auVar79 = vmaxps_avx512f(auVar80,*pauVar50);
                *pauVar39 = auVar79;
                pauVar50 = pauVar50 + 1;
                pauVar39 = pauVar39 + 1;
              }
              pauVar42 = pauVar42 + 1;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              auVar80 = *(undefined1 (*) [64])((long)local_160->data + uVar64 * 0x40);
              pvVar9 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vmaxps_avx512f(auVar80,*(undefined1 (*) [64])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                ;
                *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
                lVar48 = lVar48 + 0x40;
              }
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              auVar80 = *(undefined1 (*) [64])((long)local_160->data + uVar64 * 0x40);
              pvVar9 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vmaxps_avx512f(auVar80,*(undefined1 (*) [64])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                ;
                *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
                lVar48 = lVar48 + 0x40;
              }
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_00376277;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          uVar63 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data);
            pauVar42 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar50 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar39;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vmaxps_avx512f(auVar80,*pauVar42);
                *pauVar50 = auVar79;
                pauVar42 = pauVar42 + 1;
                pauVar50 = pauVar50 + 1;
              }
              pauVar39 = pauVar39 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar63 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data);
            pauVar42 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar50 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar39;
              for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                while ((int)uVar55 != 0) {
                  auVar79 = vmaxps_avx512f(auVar80,*pauVar42);
                  *pauVar50 = auVar79;
                  pauVar42 = pauVar42 + 1;
                  pauVar50 = pauVar50 + 1;
                  uVar55 = (ulong)((int)uVar55 - 1);
                }
              }
              pauVar39 = pauVar39 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = local_160[1].dims;
      if (iVar34 == 1) {
        Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
        pauVar39 = (undefined1 (*) [64])this_00->data;
        if (pauVar39 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_118 != 1 || local_160[1].w != 1) {
          pauVar42 = (undefined1 (*) [64])local_160->data;
          pauVar50 = (undefined1 (*) [64])local_160[1].data;
          if ((int)uVar57 < 1) {
            uVar57 = 0;
          }
          if ((int)uVar70 < 1) {
            uVar70 = 0;
          }
          for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
            auVar80 = *pauVar50;
            uVar58 = uVar57;
            while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
              auVar79 = vmaxps_avx512f(auVar80,*pauVar42);
              *pauVar39 = auVar79;
              pauVar42 = pauVar42 + 1;
              pauVar39 = pauVar39 + 1;
            }
            pauVar50 = pauVar50 + 1;
          }
          return 0;
        }
        goto LAB_00385589;
      }
LAB_0037d90c:
      if (iVar34 != 2) {
        return 0;
      }
      goto LAB_00379cf7;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar64 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                  auVar80 = *pauVar39;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar79 = vmaxps_avx512f(auVar80,*pauVar42);
                    *pauVar50 = auVar79;
                    pauVar42 = pauVar42 + 1;
                    pauVar50 = pauVar50 + 1;
                  }
                  pauVar39 = pauVar39 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_160[1].dims != 1) {
          if (local_160[1].dims == 2) {
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                auVar80 = *pauVar42;
                uVar58 = uVar57;
                while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                  auVar79 = vmaxps_avx512f(auVar80,*pauVar39);
                  *pauVar50 = auVar79;
                  pauVar39 = pauVar39 + 1;
                  pauVar50 = pauVar50 + 1;
                }
                pauVar42 = pauVar42 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        if (uVar35 != 1 || local_160[1].w != 1) {
          uVar68 = 0;
          uVar64 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar64 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = 0;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            auVar80 = *(undefined1 (*) [64])((long)local_160[1].data + uVar68 * 0x40);
            pvVar9 = local_160->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar64;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vmaxps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        goto LAB_00385589;
      }
      uVar58 = uVar3 ^ uVar44;
      if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_160->data;
            auVar80 = *(undefined1 (*) [64])
                       ((long)local_160[1].data +
                       local_160[1].cstep * uVar64 * local_160[1].elemsize);
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar68;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vmaxps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          iVar34 = (int)local_138;
          if ((int)local_138 < 1) {
            iVar34 = 0;
          }
          uVar64 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar64 = uVar68;
          }
          for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            pvVar9 = local_160[1].data;
            pvVar69 = local_160->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar75 = this_00->data;
            lVar66 = 0;
            for (lVar48 = 0; iVar34 != (int)lVar48; lVar48 = lVar48 + 1) {
              uVar1 = *(undefined4 *)((long)pvVar9 + lVar48 * 4);
              auVar15._4_4_ = uVar1;
              auVar15._0_4_ = uVar1;
              auVar15._8_4_ = uVar1;
              auVar15._12_4_ = uVar1;
              auVar15._16_4_ = uVar1;
              auVar15._20_4_ = uVar1;
              auVar15._24_4_ = uVar1;
              auVar15._28_4_ = uVar1;
              auVar15._32_4_ = uVar1;
              auVar15._36_4_ = uVar1;
              auVar15._40_4_ = uVar1;
              auVar15._44_4_ = uVar1;
              auVar15._48_4_ = uVar1;
              auVar15._52_4_ = uVar1;
              auVar15._56_4_ = uVar1;
              auVar15._60_4_ = uVar1;
              auVar80 = vmaxps_avx512f(*(undefined1 (*) [64])
                                        ((long)pvVar69 + lVar66 * 4 + sVar60 * sVar5 * uVar68),
                                       auVar15);
              *(undefined1 (*) [64])((long)pvVar75 + lVar66 * 4 + sVar7 * sVar8 * uVar68) = auVar80;
              lVar66 = lVar66 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      }
      local_138 = sVar60;
      if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
        Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)local_130 & 0xffffffff;
          if ((int)local_130 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_160[1].data;
            auVar80 = *(undefined1 (*) [64])
                       ((long)local_160->data + local_160->cstep * uVar64 * local_160->elemsize);
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar68;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vmaxps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((uVar62 == uVar57) && (iVar34 == 1)) && ((uVar37 == uVar70 && (uVar44 == 1)))) {
        Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          iVar34 = (int)local_130;
          if ((int)local_130 < 1) {
            iVar34 = 0;
          }
          uVar64 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar64 = uVar68;
          }
          for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160->data;
            pvVar69 = local_160[1].data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar75 = this_00->data;
            lVar48 = 0;
            for (lVar66 = 0; iVar34 != (int)lVar66; lVar66 = lVar66 + 1) {
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar66 * 4)));
              auVar80 = vmaxps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar69 +
                                                lVar48 * 4 + sVar60 * sVar5 * uVar68));
              *(undefined1 (*) [64])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) = auVar80;
              lVar48 = lVar48 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      }
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          if ((int)uVar57 < 1) {
            uVar57 = 0;
          }
          uVar64 = (ulong)uVar70;
          if ((int)uVar70 < 1) {
            uVar64 = uVar68;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar68;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160[1].data;
            pauVar42 = (undefined1 (*) [64])
                       (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
            for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
              auVar80 = *(undefined1 (*) [64])
                         ((long)pvVar9 + uVar55 * 0x40 + sVar60 * uVar68 * sVar5);
              uVar35 = uVar57;
              while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                auVar79 = vmaxps_avx512f(auVar80,*pauVar39);
                *pauVar42 = auVar79;
                pauVar39 = pauVar39 + 1;
                pauVar42 = pauVar42 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar57;
          if ((int)uVar57 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar70 < 1) {
            uVar70 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                              (long)local_160->data);
            sVar60 = local_160[1].cstep;
            pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160[1].data;
            for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
              for (lVar48 = 0; uVar68 * 0x40 != lVar48; lVar48 = lVar48 + 0x40) {
                auVar80 = vmaxps_avx512f(*(undefined1 (*) [64])((long)pvVar69 + lVar48),
                                         *(undefined1 (*) [64])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                *(undefined1 (*) [64])((long)pvVar75 + lVar48) = auVar80;
              }
              pvVar69 = (void *)((long)pvVar69 + lVar48);
              pvVar75 = (void *)((long)pvVar75 + lVar48);
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
        Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)uVar70;
          if ((int)uVar70 < 1) {
            uVar63 = uVar64;
          }
          uVar55 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar55 = uVar64;
          }
          for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            pvVar9 = local_160->data;
            pauVar39 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar42 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
              auVar80 = *(undefined1 (*) [64])
                         ((long)pvVar9 + uVar56 * 0x40 + sVar60 * uVar64 * sVar5);
              uVar61 = uVar68;
              while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vmaxps_avx512f(auVar80,*pauVar39);
                *pauVar42 = auVar79;
                pauVar39 = pauVar39 + 1;
                pauVar42 = pauVar42 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
        Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar57;
          if ((int)uVar57 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                              (long)local_160[1].data);
            pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_160->elemsize;
            pvVar9 = local_160->data;
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              for (lVar48 = 0; uVar68 * 0x40 != lVar48; lVar48 = lVar48 + 0x40) {
                auVar80 = vmaxps_avx512f(*(undefined1 (*) [64])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64),
                                         *(undefined1 (*) [64])((long)pvVar69 + lVar48));
                *(undefined1 (*) [64])((long)pvVar75 + lVar48) = auVar80;
              }
              pvVar69 = (void *)((long)pvVar69 + lVar48);
              pvVar75 = (void *)((long)pvVar75 + lVar48);
            }
          }
          return 0;
        }
        return -100;
      }
LAB_003887e9:
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      break;
    case 4:
      if (a[1].dims != 4) {
        local_130 = opt;
        Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = local_160[1].dims;
        iVar38 = (int)local_158;
        if (iVar34 != 1) {
          if (iVar34 == 3) {
            uVar35 = 0;
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = uVar35;
            }
            if ((int)uVar70 < 1) {
              uVar70 = uVar35;
            }
            if ((int)uVar58 < 1) {
              uVar58 = uVar35;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                  auVar80 = *pauVar42;
                  uVar62 = uVar57;
                  while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                    auVar79 = vmaxps_avx512f(auVar80,*pauVar39);
                    *pauVar50 = auVar79;
                    pauVar39 = pauVar39 + 1;
                    pauVar50 = pauVar50 + 1;
                  }
                  pauVar42 = pauVar42 + 1;
                }
              }
            }
            return 0;
          }
          if (iVar34 == 2) {
            uVar35 = 0;
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = uVar35;
            }
            if ((int)uVar70 < 1) {
              uVar70 = uVar35;
            }
            if ((int)uVar58 < 1) {
              uVar58 = uVar35;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                auVar80 = *pauVar42;
                for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                  while (uVar62 != 0) {
                    auVar79 = vmaxps_avx512f(auVar80,*pauVar39);
                    *pauVar50 = auVar79;
                    pauVar39 = pauVar39 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar62 = uVar62 - 1;
                  }
                }
                pauVar42 = pauVar42 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        opt = local_130;
        if (uVar35 != 1 || local_160[1].w != 1) {
          uVar68 = 0;
          uVar64 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar64 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if (iVar38 < 1) {
            uVar63 = 0;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar9 = this_00->data;
            auVar80 = *(undefined1 (*) [64])((long)local_160[1].data + uVar68 * 0x40);
            sVar8 = local_160->elemsize;
            pvVar69 = local_160->data;
            lVar48 = 0;
            uVar55 = uVar64;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vmaxps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68));
              *(undefined1 (*) [64])((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        goto LAB_00385589;
      }
    }
LAB_00379cea:
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
LAB_00379cf7:
    iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                       (local_160,local_140,this_00,opt);
    return iVar34;
  case 5:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
    uVar57 = a->w;
    uVar70 = a->h;
    uVar58 = a->d;
    uVar44 = a->c;
    local_158 = (__m512 *)(ulong)uVar44;
    local_138 = (size_t)(uVar70 * uVar57 * uVar58);
    sVar60 = a->elemsize;
    uVar62 = a[1].w;
    uVar37 = a[1].h;
    uVar59 = a[1].d;
    uVar3 = a[1].c;
    local_148 = (__m512 *)(ulong)uVar3;
    local_130 = (Option *)(ulong)(uVar37 * uVar62 * uVar59);
    sVar5 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar34 != 1 || uVar57 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_00375c4c_caseD_1;
        case 2:
          Mat::create(this_00,uVar62,uVar37,sVar5,uVar35,opt->blob_allocator);
          pauVar39 = (undefined1 (*) [64])this_00->data;
          if (pauVar39 == (undefined1 (*) [64])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pauVar42 = (undefined1 (*) [64])local_160->data;
            pauVar50 = (undefined1 (*) [64])local_160[1].data;
            if ((int)uVar62 < 1) {
              uVar62 = 0;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar42;
              uVar57 = uVar62;
              while (bVar76 = uVar57 != 0, uVar57 = uVar57 - 1, bVar76) {
                auVar79 = vminps_avx512f(auVar80,*pauVar50);
                *pauVar39 = auVar79;
                pauVar50 = pauVar50 + 1;
                pauVar39 = pauVar39 + 1;
              }
              pauVar42 = pauVar42 + 1;
            }
            return 0;
          }
          return -100;
        case 3:
          Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              auVar80 = *(undefined1 (*) [64])((long)local_160->data + uVar64 * 0x40);
              pvVar9 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vminps_avx512f(auVar80,*(undefined1 (*) [64])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                ;
                *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
                lVar48 = lVar48 + 0x40;
              }
            }
            return 0;
          }
          return -100;
        case 4:
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)local_130 & 0xffffffff;
            if ((int)local_130 < 1) {
              uVar68 = uVar64;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              sVar60 = local_160[1].cstep;
              sVar5 = local_160[1].elemsize;
              auVar80 = *(undefined1 (*) [64])((long)local_160->data + uVar64 * 0x40);
              pvVar9 = local_160[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar69 = this_00->data;
              lVar48 = 0;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vminps_avx512f(auVar80,*(undefined1 (*) [64])
                                                  ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64))
                ;
                *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
                lVar48 = lVar48 + 0x40;
              }
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_003763f6;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar62,uVar37,uVar3,sVar5,uVar35,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          uVar63 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data);
            pauVar42 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar50 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar39;
              uVar55 = uVar68;
              while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vminps_avx512f(auVar80,*pauVar42);
                *pauVar50 = auVar79;
                pauVar42 = pauVar42 + 1;
                pauVar50 = pauVar50 + 1;
              }
              pauVar39 = pauVar39 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar63 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       ((long)local_160->w * uVar64 * local_160->elemsize + (long)local_160->data);
            pauVar42 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar50 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
              auVar80 = *pauVar39;
              for (uVar57 = 0; uVar55 = uVar68, uVar57 != uVar37; uVar57 = uVar57 + 1) {
                while ((int)uVar55 != 0) {
                  auVar79 = vminps_avx512f(auVar80,*pauVar42);
                  *pauVar50 = auVar79;
                  pauVar42 = pauVar42 + 1;
                  pauVar50 = pauVar50 + 1;
                  uVar55 = (ulong)((int)uVar55 - 1);
                }
              }
              pauVar39 = pauVar39 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      Mat::create(this_00,uVar57,uVar70,sVar60,iVar34,pAVar6);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar34 = local_160[1].dims;
      if (iVar34 == 1) {
        Mat::create(this_00,uVar57,uVar70,sVar60,(uint)local_150,opt->blob_allocator);
        pauVar39 = (undefined1 (*) [64])this_00->data;
        if (pauVar39 == (undefined1 (*) [64])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)local_118 != 1 || local_160[1].w != 1) {
          pauVar42 = (undefined1 (*) [64])local_160->data;
          pauVar50 = (undefined1 (*) [64])local_160[1].data;
          if ((int)uVar57 < 1) {
            uVar57 = 0;
          }
          if ((int)uVar70 < 1) {
            uVar70 = 0;
          }
          for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
            auVar80 = *pauVar50;
            uVar58 = uVar57;
            while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
              auVar79 = vminps_avx512f(auVar80,*pauVar42);
              *pauVar39 = auVar79;
              pauVar42 = pauVar42 + 1;
              pauVar39 = pauVar39 + 1;
            }
            pauVar50 = pauVar50 + 1;
          }
          return 0;
        }
        goto LAB_003858c6;
      }
LAB_0037e0ff:
      if (iVar34 != 2) {
        return 0;
      }
      goto LAB_0037a509;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar62,uVar37,uVar59,uVar3,sVar5,uVar35,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar64 = 0;
            uVar68 = (ulong)uVar62;
            if ((int)uVar62 < 1) {
              uVar68 = uVar64;
            }
            if ((int)uVar37 < 1) {
              uVar37 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar63 = (ulong)local_148 & 0xffffffff;
            if ((int)local_148 < 1) {
              uVar63 = uVar64;
            }
            for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar64 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar59; uVar35 = uVar35 + 1) {
                for (uVar57 = 0; uVar57 != uVar37; uVar57 = uVar57 + 1) {
                  auVar80 = *pauVar39;
                  uVar55 = uVar68;
                  while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    auVar79 = vminps_avx512f(auVar80,*pauVar42);
                    *pauVar50 = auVar79;
                    pauVar42 = pauVar42 + 1;
                    pauVar50 = pauVar50 + 1;
                  }
                  pauVar39 = pauVar39 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_160[1].dims != 1) {
          if (local_160[1].dims == 2) {
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = 0;
            }
            if ((int)uVar70 < 1) {
              uVar70 = 0;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if ((int)local_158 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
                auVar80 = *pauVar42;
                uVar58 = uVar57;
                while (bVar76 = uVar58 != 0, uVar58 = uVar58 - 1, bVar76) {
                  auVar79 = vminps_avx512f(auVar80,*pauVar39);
                  *pauVar50 = auVar79;
                  pauVar39 = pauVar39 + 1;
                  pauVar50 = pauVar50 + 1;
                }
                pauVar42 = pauVar42 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        if (uVar35 != 1 || local_160[1].w != 1) {
          uVar68 = 0;
          uVar64 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar64 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = 0;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            auVar80 = *(undefined1 (*) [64])((long)local_160[1].data + uVar68 * 0x40);
            pvVar9 = local_160->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar64;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vminps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar68));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar68) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        goto LAB_003858c6;
      }
      uVar58 = uVar3 ^ uVar44;
      if (((uVar62 ^ 1) == 0 && (uVar37 ^ 1) == 0) && uVar58 == 0) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_160->data;
            auVar80 = *(undefined1 (*) [64])
                       ((long)local_160[1].data +
                       local_160[1].cstep * uVar64 * local_160[1].elemsize);
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar68;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vminps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((uVar62 == uVar57) && (uVar35 == 1 && (uVar3 == 1 && uVar37 == uVar70))) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          iVar34 = (int)local_138;
          if ((int)local_138 < 1) {
            iVar34 = 0;
          }
          uVar64 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar64 = uVar68;
          }
          for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            pvVar9 = local_160[1].data;
            pvVar69 = local_160->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar75 = this_00->data;
            lVar66 = 0;
            for (lVar48 = 0; iVar34 != (int)lVar48; lVar48 = lVar48 + 1) {
              uVar1 = *(undefined4 *)((long)pvVar9 + lVar48 * 4);
              auVar14._4_4_ = uVar1;
              auVar14._0_4_ = uVar1;
              auVar14._8_4_ = uVar1;
              auVar14._12_4_ = uVar1;
              auVar14._16_4_ = uVar1;
              auVar14._20_4_ = uVar1;
              auVar14._24_4_ = uVar1;
              auVar14._28_4_ = uVar1;
              auVar14._32_4_ = uVar1;
              auVar14._36_4_ = uVar1;
              auVar14._40_4_ = uVar1;
              auVar14._44_4_ = uVar1;
              auVar14._48_4_ = uVar1;
              auVar14._52_4_ = uVar1;
              auVar14._56_4_ = uVar1;
              auVar14._60_4_ = uVar1;
              auVar80 = vminps_avx512f(*(undefined1 (*) [64])
                                        ((long)pvVar69 + lVar66 * 4 + sVar60 * sVar5 * uVar68),
                                       auVar14);
              *(undefined1 (*) [64])((long)pvVar75 + lVar66 * 4 + sVar7 * sVar8 * uVar68) = auVar80;
              lVar66 = lVar66 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      }
      local_138 = sVar60;
      if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) {
        Mat::create(this_00,uVar62,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)local_130 & 0xffffffff;
          if ((int)local_130 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_160[1].data;
            auVar80 = *(undefined1 (*) [64])
                       ((long)local_160->data + local_160->cstep * uVar64 * local_160->elemsize);
            sVar8 = this_00->elemsize;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar55 = uVar68;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vminps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
              *(undefined1 (*) [64])((long)pvVar69 + lVar48 + sVar7 * sVar8 * uVar64) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar62 == uVar57) && (iVar34 == 1)) && (uVar37 == uVar70)) && (uVar44 == 1)) {
        Mat::create(this_00,uVar57,uVar70,uVar3,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          iVar34 = (int)local_130;
          if ((int)local_130 < 1) {
            iVar34 = 0;
          }
          uVar64 = (ulong)local_148 & 0xffffffff;
          if ((int)local_148 < 1) {
            uVar64 = uVar68;
          }
          for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160->data;
            pvVar69 = local_160[1].data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar75 = this_00->data;
            lVar48 = 0;
            for (lVar66 = 0; iVar34 != (int)lVar66; lVar66 = lVar66 + 1) {
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar66 * 4)));
              auVar80 = vminps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar69 +
                                                lVar48 * 4 + sVar60 * sVar5 * uVar68));
              *(undefined1 (*) [64])((long)pvVar75 + lVar48 * 4 + sVar7 * sVar8 * uVar68) = auVar80;
              lVar48 = lVar48 + 0x10;
            }
          }
          return 0;
        }
        return -100;
      }
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      if ((((uVar62 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar57 != 1) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar68 = 0;
          if ((int)uVar57 < 1) {
            uVar57 = 0;
          }
          uVar64 = (ulong)uVar70;
          if ((int)uVar70 < 1) {
            uVar64 = uVar68;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar68;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            pauVar39 = (undefined1 (*) [64])
                       (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
            sVar60 = local_160[1].cstep;
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160[1].data;
            pauVar42 = (undefined1 (*) [64])
                       (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
            for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
              auVar80 = *(undefined1 (*) [64])
                         ((long)pvVar9 + uVar55 * 0x40 + sVar60 * uVar68 * sVar5);
              uVar35 = uVar57;
              while (bVar76 = uVar35 != 0, uVar35 = uVar35 - 1, bVar76) {
                auVar79 = vminps_avx512f(auVar80,*pauVar39);
                *pauVar42 = auVar79;
                pauVar39 = pauVar39 + 1;
                pauVar42 = pauVar42 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar37 ^ 1) == 0 && (uVar62 ^ uVar57) == 0) && uVar58 == 0) && uVar70 != 1) {
        Mat::create(this_00,uVar57,uVar70,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar57;
          if ((int)uVar57 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar70 < 1) {
            uVar70 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            pvVar69 = (void *)(local_160->cstep * uVar64 * local_160->elemsize +
                              (long)local_160->data);
            sVar60 = local_160[1].cstep;
            pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_160[1].elemsize;
            pvVar9 = local_160[1].data;
            for (uVar35 = 0; uVar35 != uVar70; uVar35 = uVar35 + 1) {
              for (lVar48 = 0; uVar68 * 0x40 != lVar48; lVar48 = lVar48 + 0x40) {
                auVar80 = vminps_avx512f(*(undefined1 (*) [64])((long)pvVar69 + lVar48),
                                         *(undefined1 (*) [64])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64));
                *(undefined1 (*) [64])((long)pvVar75 + lVar48) = auVar80;
              }
              pvVar69 = (void *)((long)pvVar69 + lVar48);
              pvVar75 = (void *)((long)pvVar75 + lVar48);
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar57 ^ 1) == 0 && (uVar37 ^ uVar70) == 0) && uVar58 == 0) && uVar62 != 1) {
        Mat::create(this_00,uVar62,uVar70,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar62;
          if ((int)uVar62 < 1) {
            uVar68 = uVar64;
          }
          uVar63 = (ulong)uVar70;
          if ((int)uVar70 < 1) {
            uVar63 = uVar64;
          }
          uVar55 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar55 = uVar64;
          }
          for (; uVar64 != uVar55; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = local_160->elemsize;
            pvVar9 = local_160->data;
            pauVar39 = (undefined1 (*) [64])
                       (local_160[1].cstep * uVar64 * local_160[1].elemsize +
                       (long)local_160[1].data);
            pauVar42 = (undefined1 (*) [64])
                       (this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            for (uVar56 = 0; uVar56 != uVar63; uVar56 = uVar56 + 1) {
              auVar80 = *(undefined1 (*) [64])
                         ((long)pvVar9 + uVar56 * 0x40 + sVar60 * uVar64 * sVar5);
              uVar61 = uVar68;
              while (iVar34 = (int)uVar61, uVar61 = (ulong)(iVar34 - 1), iVar34 != 0) {
                auVar79 = vminps_avx512f(auVar80,*pauVar39);
                *pauVar42 = auVar79;
                pauVar39 = pauVar39 + 1;
                pauVar42 = pauVar42 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar62 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar58 == 0) && uVar37 != 1) {
        Mat::create(this_00,uVar57,uVar37,uVar44,sVar5,uVar35,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          uVar64 = 0;
          uVar68 = (ulong)uVar57;
          if ((int)uVar57 < 1) {
            uVar68 = uVar64;
          }
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar63 = uVar64;
          }
          for (; uVar64 != uVar63; uVar64 = uVar64 + 1) {
            sVar60 = local_160->cstep;
            pvVar69 = (void *)(local_160[1].cstep * uVar64 * local_160[1].elemsize +
                              (long)local_160[1].data);
            pvVar75 = (void *)(this_00->cstep * uVar64 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_160->elemsize;
            pvVar9 = local_160->data;
            for (uVar35 = 0; uVar35 != uVar37; uVar35 = uVar35 + 1) {
              for (lVar48 = 0; uVar68 * 0x40 != lVar48; lVar48 = lVar48 + 0x40) {
                auVar80 = vminps_avx512f(*(undefined1 (*) [64])
                                          ((long)pvVar9 + lVar48 + sVar60 * sVar5 * uVar64),
                                         *(undefined1 (*) [64])((long)pvVar69 + lVar48));
                *(undefined1 (*) [64])((long)pvVar75 + lVar48) = auVar80;
              }
              pvVar69 = (void *)((long)pvVar69 + lVar48);
              pvVar75 = (void *)((long)pvVar75 + lVar48);
            }
          }
          return 0;
        }
        return -100;
      }
LAB_00388b01:
      local_118 = CONCAT44(local_118._4_4_,uVar35);
      break;
    case 4:
      if (a[1].dims != 4) {
        local_130 = opt;
        Mat::create(this_00,uVar57,uVar70,uVar58,uVar44,sVar60,iVar34,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar34 = local_160[1].dims;
        iVar38 = (int)local_158;
        if (iVar34 != 1) {
          if (iVar34 == 3) {
            uVar35 = 0;
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = uVar35;
            }
            if ((int)uVar70 < 1) {
              uVar70 = uVar35;
            }
            if ((int)uVar58 < 1) {
              uVar58 = uVar35;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         (local_160[1].cstep * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                for (uVar44 = 0; uVar44 != uVar70; uVar44 = uVar44 + 1) {
                  auVar80 = *pauVar42;
                  uVar62 = uVar57;
                  while (bVar76 = uVar62 != 0, uVar62 = uVar62 - 1, bVar76) {
                    auVar79 = vminps_avx512f(auVar80,*pauVar39);
                    *pauVar50 = auVar79;
                    pauVar39 = pauVar39 + 1;
                    pauVar50 = pauVar50 + 1;
                  }
                  pauVar42 = pauVar42 + 1;
                }
              }
            }
            return 0;
          }
          if (iVar34 == 2) {
            uVar35 = 0;
            uVar68 = 0;
            if ((int)uVar57 < 1) {
              uVar57 = uVar35;
            }
            if ((int)uVar70 < 1) {
              uVar70 = uVar35;
            }
            if ((int)uVar58 < 1) {
              uVar58 = uVar35;
            }
            uVar64 = (ulong)local_158 & 0xffffffff;
            if (iVar38 < 1) {
              uVar64 = 0;
            }
            for (; uVar68 != uVar64; uVar68 = uVar68 + 1) {
              pauVar39 = (undefined1 (*) [64])
                         (local_160->cstep * uVar68 * local_160->elemsize + (long)local_160->data);
              pauVar42 = (undefined1 (*) [64])
                         ((long)local_160[1].w * uVar68 * local_160[1].elemsize +
                         (long)local_160[1].data);
              pauVar50 = (undefined1 (*) [64])
                         (this_00->cstep * uVar68 * this_00->elemsize + (long)this_00->data);
              for (uVar35 = 0; uVar35 != uVar58; uVar35 = uVar35 + 1) {
                auVar80 = *pauVar42;
                for (uVar44 = 0; uVar62 = uVar57, uVar44 != uVar70; uVar44 = uVar44 + 1) {
                  while (uVar62 != 0) {
                    auVar79 = vminps_avx512f(auVar80,*pauVar39);
                    *pauVar50 = auVar79;
                    pauVar39 = pauVar39 + 1;
                    pauVar50 = pauVar50 + 1;
                    uVar62 = uVar62 - 1;
                  }
                }
                pauVar42 = pauVar42 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        opt = local_130;
        if (uVar35 != 1 || local_160[1].w != 1) {
          uVar68 = 0;
          uVar64 = local_138 & 0xffffffff;
          if ((int)local_138 < 1) {
            uVar64 = 0;
          }
          uVar63 = (ulong)local_158 & 0xffffffff;
          if (iVar38 < 1) {
            uVar63 = 0;
          }
          for (; uVar68 != uVar63; uVar68 = uVar68 + 1) {
            sVar60 = local_160->cstep;
            sVar5 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar9 = this_00->data;
            auVar80 = *(undefined1 (*) [64])((long)local_160[1].data + uVar68 * 0x40);
            sVar8 = local_160->elemsize;
            pvVar69 = local_160->data;
            lVar48 = 0;
            uVar55 = uVar64;
            while (iVar34 = (int)uVar55, uVar55 = (ulong)(iVar34 - 1), iVar34 != 0) {
              auVar79 = vminps_avx512f(auVar80,*(undefined1 (*) [64])
                                                ((long)pvVar69 + lVar48 + sVar60 * sVar8 * uVar68));
              *(undefined1 (*) [64])((long)pvVar9 + lVar48 + sVar5 * sVar7 * uVar68) = auVar79;
              lVar48 = lVar48 + 0x40;
            }
          }
          return 0;
        }
        goto LAB_003858c6;
      }
    }
LAB_0037a4fc:
    local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
LAB_0037a509:
    iVar34 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                       (local_160,local_140,this_00,opt);
    return iVar34;
  case 6:
    local_110 = 0;
    if (3 < a->dims - 1U) goto switchD_0037877e_default;
    uVar57 = a->w;
    pafVar65 = (__m512 *)(ulong)uVar57;
    uVar70 = a->h;
    pafVar54 = (__m512 *)(ulong)uVar70;
    iVar38 = a->d;
    uVar58 = a->c;
    local_120 = (ulong)uVar58;
    local_138 = (size_t)(uVar70 * uVar57 * iVar38);
    local_108 = a->elemsize;
    uVar44 = a[1].w;
    local_150._0_4_ = a[1].h;
    iVar41 = a[1].d;
    uVar62 = a[1].c;
    local_128 = (ulong)uVar62;
    local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
    local_130 = (Option *)CONCAT44(local_130._4_4_,iVar41);
    local_118 = (ulong)((uint)local_150 * uVar44 * iVar41);
    sVar60 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar34 == 1 && uVar57 == 1) {
        uVar35 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                           (a,b,this_00,opt);
        local_110 = (ulong)uVar35;
        goto switchD_0037877e_default;
      }
      switch(a[1].dims) {
      case 1:
        Mat::create(this_00,uVar57,local_108,iVar34,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) break;
        if (uVar35 != 1 || a[1].w != 1) {
          binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>(a,b,this_00,opt);
          local_110 = 0;
          break;
        }
        goto LAB_003818ed;
      case 2:
        Mat::create(this_00,uVar44,(uint)local_150,sVar60,uVar35,opt->blob_allocator);
        puVar71 = (undefined8 *)this_00->data;
        local_110 = 0xffffffffffffff9c;
        if ((puVar71 != (undefined8 *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          local_148 = (__m512 *)a->data;
          if ((int)uVar44 < 1) {
            uVar44 = 0;
          }
          pafVar65 = (__m512 *)a[1].data;
          local_110 = 0;
          if ((int)(uint)local_150 < 1) {
            local_150._0_4_ = 0;
          }
          local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
          iVar34 = 0;
          while (iVar34 != (uint)local_150) {
            local_158 = (__m512 *)CONCAT44(local_158._4_4_,iVar34);
            local_c0 = *local_148;
            while (bVar76 = uVar44 != 0, uVar44 = uVar44 - 1, bVar76) {
              uVar109 = *(undefined8 *)*pafVar65;
              uVar108 = *(undefined8 *)(*pafVar65 + 2);
              uVar111 = *(undefined8 *)(*pafVar65 + 4);
              uVar112 = *(undefined8 *)(*pafVar65 + 6);
              uVar113 = *(undefined8 *)(*pafVar65 + 8);
              uVar114 = *(undefined8 *)(*pafVar65 + 10);
              uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
              uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
              local_100 = *pafVar65;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_161,&local_c0,&local_100);
              *puVar71 = uVar109;
              puVar71[1] = uVar108;
              puVar71[2] = uVar111;
              puVar71[3] = uVar112;
              puVar71[4] = uVar113;
              puVar71[5] = uVar114;
              puVar71[6] = uVar115;
              puVar71[7] = uVar116;
              pafVar65 = pafVar65 + 1;
              puVar71 = puVar71 + 8;
            }
            local_148 = local_148 + 1;
            uVar44 = (uint)local_140;
            iVar34 = (int)local_158 + 1;
          }
        }
        break;
      case 3:
        Mat::create(this_00,uVar44,(uint)local_150,uVar62,sVar60,uVar35,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar34 = (int)local_118;
          local_118 = local_118 & 0xffffffff;
          if (iVar34 < 1) {
            local_118 = 0;
          }
          iVar34 = (int)local_128;
          local_110 = 0;
          local_128 = local_128 & 0xffffffff;
          if (iVar34 < 1) {
            local_128 = 0;
          }
          for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
              local_150 = (__m512 *)((long)local_150 + 1)) {
            local_c0 = *(__m512 *)((long)a->data + (long)local_150 * 0x40);
            lVar66 = a[1].cstep * a[1].elemsize * (long)local_150;
            pvVar9 = a[1].data;
            lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
            pvVar69 = this_00->data;
            uVar68 = local_118 & 0xffffffff;
            lVar67 = 0;
            while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
              pafVar65 = (__m512 *)((long)pvVar9 + lVar67 + lVar66);
              uVar109 = *(undefined8 *)*pafVar65;
              uVar108 = *(undefined8 *)(*pafVar65 + 2);
              uVar111 = *(undefined8 *)(*pafVar65 + 4);
              uVar112 = *(undefined8 *)(*pafVar65 + 6);
              uVar113 = *(undefined8 *)(*pafVar65 + 8);
              uVar114 = *(undefined8 *)(*pafVar65 + 10);
              uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
              uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
              local_100 = *pafVar65;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_161,&local_c0,&local_100);
              puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
              *puVar71 = uVar109;
              puVar71[1] = uVar108;
              puVar71[2] = uVar111;
              puVar71[3] = uVar112;
              puVar71[4] = uVar113;
              puVar71[5] = uVar114;
              puVar71[6] = uVar115;
              puVar71[7] = uVar116;
              lVar67 = lVar67 + 0x40;
            }
            a = local_160;
          }
        }
        break;
      case 4:
        Mat::create(this_00,uVar44,(uint)local_150,iVar41,uVar62,sVar60,uVar35,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar34 = (int)local_118;
          local_118 = local_118 & 0xffffffff;
          if (iVar34 < 1) {
            local_118 = 0;
          }
          iVar34 = (int)local_128;
          local_110 = 0;
          local_128 = local_128 & 0xffffffff;
          if (iVar34 < 1) {
            local_128 = 0;
          }
          for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
              local_150 = (__m512 *)((long)local_150 + 1)) {
            local_c0 = *(__m512 *)((long)a->data + (long)local_150 * 0x40);
            lVar66 = a[1].cstep * a[1].elemsize * (long)local_150;
            pvVar9 = a[1].data;
            lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
            pvVar69 = this_00->data;
            uVar68 = local_118 & 0xffffffff;
            lVar67 = 0;
            while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
              pafVar65 = (__m512 *)((long)pvVar9 + lVar67 + lVar66);
              uVar109 = *(undefined8 *)*pafVar65;
              uVar108 = *(undefined8 *)(*pafVar65 + 2);
              uVar111 = *(undefined8 *)(*pafVar65 + 4);
              uVar112 = *(undefined8 *)(*pafVar65 + 6);
              uVar113 = *(undefined8 *)(*pafVar65 + 8);
              uVar114 = *(undefined8 *)(*pafVar65 + 10);
              uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
              uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
              local_100 = *pafVar65;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_161,&local_c0,&local_100);
              puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
              *puVar71 = uVar109;
              puVar71[1] = uVar108;
              puVar71[2] = uVar111;
              puVar71[3] = uVar112;
              puVar71[4] = uVar113;
              puVar71[5] = uVar114;
              puVar71[6] = uVar115;
              puVar71[7] = uVar116;
              lVar67 = lVar67 + 0x40;
            }
            a = local_160;
          }
        }
      }
      goto switchD_0037877e_default;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar44,(uint)local_150,uVar62,sVar60,uVar35,pAVar6);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if ((int)uVar44 < 1) {
            uVar44 = 0;
          }
          if ((int)(uint)local_150 < 1) {
            local_150._0_4_ = 0;
          }
          iVar34 = (int)local_128;
          local_110 = 0;
          local_128 = local_128 & 0xffffffff;
          if (iVar34 < 1) {
            local_128 = 0;
          }
          local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
          for (local_130 = (Option *)0x0; local_130 != (Option *)local_128;
              local_130 = (Option *)((long)local_130 + 1)) {
            local_148 = (__m512 *)
                        ((long)local_160->w * (long)local_130 * local_160->elemsize +
                        (long)local_160->data);
            pafVar65 = (__m512 *)
                       (local_160[1].cstep * (long)local_130 * local_160[1].elemsize +
                       (long)local_160[1].data);
            puVar71 = (undefined8 *)
                      (this_00->cstep * (long)local_130 * this_00->elemsize + (long)this_00->data);
            iVar34 = 0;
            while (iVar34 != (uint)local_150) {
              local_158 = (__m512 *)CONCAT44(local_158._4_4_,iVar34);
              local_c0 = *local_148;
              while (bVar76 = uVar44 != 0, uVar44 = uVar44 - 1, bVar76) {
                uVar109 = *(undefined8 *)*pafVar65;
                uVar108 = *(undefined8 *)(*pafVar65 + 2);
                uVar111 = *(undefined8 *)(*pafVar65 + 4);
                uVar112 = *(undefined8 *)(*pafVar65 + 6);
                uVar113 = *(undefined8 *)(*pafVar65 + 8);
                uVar114 = *(undefined8 *)(*pafVar65 + 10);
                uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
                uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
                local_100 = *pafVar65;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          (&local_161,&local_c0,&local_100);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                puVar71[4] = uVar113;
                puVar71[5] = uVar114;
                puVar71[6] = uVar115;
                puVar71[7] = uVar116;
                pafVar65 = pafVar65 + 1;
                puVar71 = puVar71 + 8;
              }
              local_148 = local_148 + 1;
              uVar44 = (uint)local_140;
              iVar34 = (int)local_158 + 1;
            }
          }
        }
        goto switchD_0037877e_default;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar44,(uint)local_150,iVar41,uVar62,sVar60,uVar35,pAVar6);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if ((int)uVar44 < 1) {
            uVar44 = 0;
          }
          if ((int)(uint)local_150 < 1) {
            local_150._0_4_ = 0;
          }
          iVar34 = (uint)local_130;
          if ((int)(uint)local_130 < 1) {
            iVar34 = 0;
          }
          local_130 = (Option *)CONCAT44(local_130._4_4_,iVar34);
          iVar34 = (int)local_128;
          local_110 = 0;
          local_128 = local_128 & 0xffffffff;
          if (iVar34 < 1) {
            local_128 = 0;
          }
          local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
          for (local_138 = 0; local_138 != local_128; local_138 = local_138 + 1) {
            local_158 = (__m512 *)
                        ((long)local_160->w * local_138 * local_160->elemsize +
                        (long)local_160->data);
            pafVar65 = (__m512 *)
                       (local_160[1].cstep * local_138 * local_160[1].elemsize +
                       (long)local_160[1].data);
            puVar71 = (undefined8 *)
                      (this_00->cstep * local_138 * this_00->elemsize + (long)this_00->data);
            for (iVar34 = 0; iVar34 != (uint)local_130; iVar34 = iVar34 + 1) {
              local_c0 = *local_158;
              local_148 = (__m512 *)CONCAT44(local_148._4_4_,iVar34);
              for (iVar38 = 0; iVar38 != (uint)local_150; iVar38 = iVar38 + 1) {
                while (bVar76 = uVar44 != 0, uVar44 = uVar44 - 1, bVar76) {
                  uVar109 = *(undefined8 *)*pafVar65;
                  uVar108 = *(undefined8 *)(*pafVar65 + 2);
                  uVar111 = *(undefined8 *)(*pafVar65 + 4);
                  uVar112 = *(undefined8 *)(*pafVar65 + 6);
                  uVar113 = *(undefined8 *)(*pafVar65 + 8);
                  uVar114 = *(undefined8 *)(*pafVar65 + 10);
                  uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
                  uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
                  local_100 = *pafVar65;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                            (&local_161,&local_c0,&local_100);
                  *puVar71 = uVar109;
                  puVar71[1] = uVar108;
                  puVar71[2] = uVar111;
                  puVar71[3] = uVar112;
                  puVar71[4] = uVar113;
                  puVar71[5] = uVar114;
                  puVar71[6] = uVar115;
                  puVar71[7] = uVar116;
                  pafVar65 = pafVar65 + 1;
                  puVar71 = puVar71 + 8;
                }
                iVar34 = (int)local_148;
                uVar44 = (uint)local_140;
              }
              local_158 = local_158 + 1;
            }
          }
        }
        goto switchD_0037877e_default;
      }
      local_158 = pafVar65;
      local_148 = pafVar54;
      local_140 = b;
      Mat::create(this_00,uVar57,uVar70,local_108,iVar34,pAVar6);
      local_110 = 0xffffffffffffff9c;
      if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
      goto switchD_0037877e_default;
      if (a[1].dims == 1) {
        Mat::create(this_00,(int)local_158,(int)local_148,local_108,iVar34,opt->blob_allocator);
        puVar71 = (undefined8 *)this_00->data;
        if ((puVar71 == (undefined8 *)0x0) || ((long)this_00->c * this_00->cstep == 0))
        goto switchD_0037877e_default;
        b = local_140;
        if (uVar35 != 1 || a[1].w != 1) {
          pafVar65 = (__m512 *)a->data;
          iVar34 = (int)local_158;
          local_158 = (__m512 *)((ulong)local_158 & 0xffffffff);
          if (iVar34 < 1) {
            local_158 = (__m512 *)0x0;
          }
          local_140 = (Mat *)a[1].data;
          iVar34 = (int)local_148;
          local_110 = 0;
          local_148 = (__m512 *)((ulong)local_148 & 0xffffffff);
          if (iVar34 < 1) {
            local_148 = (__m512 *)0x0;
          }
          for (local_150._0_4_ = 0; (uint)local_150 != (int)local_148;
              local_150._0_4_ = (uint)local_150 + 1) {
            local_c0 = *(__m512 *)local_140;
            uVar68 = (ulong)local_158 & 0xffffffff;
            while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
              uVar109 = *(undefined8 *)*pafVar65;
              uVar108 = *(undefined8 *)(*pafVar65 + 2);
              uVar111 = *(undefined8 *)(*pafVar65 + 4);
              uVar112 = *(undefined8 *)(*pafVar65 + 6);
              uVar113 = *(undefined8 *)(*pafVar65 + 8);
              uVar114 = *(undefined8 *)(*pafVar65 + 10);
              uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
              uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
              local_100 = *pafVar65;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_161,&local_100,&local_c0);
              *puVar71 = uVar109;
              puVar71[1] = uVar108;
              puVar71[2] = uVar111;
              puVar71[3] = uVar112;
              puVar71[4] = uVar113;
              puVar71[5] = uVar114;
              puVar71[6] = uVar115;
              puVar71[7] = uVar116;
              pafVar65 = pafVar65 + 1;
              puVar71 = puVar71 + 8;
            }
            local_140 = (Mat *)((long)local_140 + 0x40);
          }
          goto switchD_0037877e_default;
        }
        goto LAB_003818ed;
      }
      local_110 = 0;
      b = local_140;
      if (a[1].dims != 2) goto switchD_0037877e_default;
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          Mat::create(this_00,uVar44,(uint)local_150,iVar41,uVar62,sVar60,uVar35,opt->blob_allocator
                     );
          local_110 = 0xffffffffffffff9c;
          if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
            if ((int)uVar44 < 1) {
              uVar44 = 0;
            }
            if ((int)(uint)local_150 < 1) {
              local_150._0_4_ = 0;
            }
            iVar34 = (uint)local_130;
            if ((int)(uint)local_130 < 1) {
              iVar34 = 0;
            }
            local_130 = (Option *)CONCAT44(local_130._4_4_,iVar34);
            iVar34 = (int)local_128;
            local_110 = 0;
            local_128 = local_128 & 0xffffffff;
            if (iVar34 < 1) {
              local_128 = 0;
            }
            local_140 = (Mat *)CONCAT44(local_140._4_4_,uVar44);
            for (local_138 = 0; local_138 != local_128; local_138 = local_138 + 1) {
              local_148 = (__m512 *)
                          (local_160->cstep * local_138 * local_160->elemsize +
                          (long)local_160->data);
              pafVar65 = (__m512 *)
                         (local_160[1].cstep * local_138 * local_160[1].elemsize +
                         (long)local_160[1].data);
              puVar71 = (undefined8 *)
                        (this_00->cstep * local_138 * this_00->elemsize + (long)this_00->data);
              for (iVar34 = 0; iVar34 != (uint)local_130; iVar34 = iVar34 + 1) {
                local_158 = (__m512 *)CONCAT44(local_158._4_4_,iVar34);
                for (iVar38 = 0; iVar38 != (uint)local_150; iVar38 = iVar38 + 1) {
                  local_c0 = *local_148;
                  while (bVar76 = uVar44 != 0, uVar44 = uVar44 - 1, bVar76) {
                    uVar109 = *(undefined8 *)*pafVar65;
                    uVar108 = *(undefined8 *)(*pafVar65 + 2);
                    uVar111 = *(undefined8 *)(*pafVar65 + 4);
                    uVar112 = *(undefined8 *)(*pafVar65 + 6);
                    uVar113 = *(undefined8 *)(*pafVar65 + 8);
                    uVar114 = *(undefined8 *)(*pafVar65 + 10);
                    uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
                    uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
                    local_100 = *pafVar65;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_161,&local_c0,&local_100);
                    *puVar71 = uVar109;
                    puVar71[1] = uVar108;
                    puVar71[2] = uVar111;
                    puVar71[3] = uVar112;
                    puVar71[4] = uVar113;
                    puVar71[5] = uVar114;
                    puVar71[6] = uVar115;
                    puVar71[7] = uVar116;
                    pafVar65 = pafVar65 + 1;
                    puVar71 = puVar71 + 8;
                  }
                  local_148 = local_148 + 1;
                  iVar34 = (int)local_158;
                  uVar44 = (uint)local_140;
                }
              }
            }
          }
          goto switchD_0037877e_default;
        }
        local_118 = (ulong)uVar35;
        local_130 = opt;
        Mat::create(this_00,uVar57,uVar70,uVar58,local_108,iVar34,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
        goto switchD_0037877e_default;
        iVar34 = (int)local_120;
        if (a[1].dims != 1) {
          local_110 = 0;
          if (a[1].dims == 2) {
            if ((int)uVar57 < 1) {
              pafVar65 = (__m512 *)0x0;
            }
            if ((int)uVar70 < 1) {
              pafVar54 = (__m512 *)0x0;
            }
            local_110 = 0;
            local_120 = local_120 & 0xffffffff;
            if (iVar34 < 1) {
              local_120 = 0;
            }
            local_158 = pafVar65;
            local_148 = pafVar54;
            for (local_130 = (Option *)0x0; local_130 != (Option *)local_120;
                local_130 = (Option *)((long)local_130 + 1)) {
              pafVar45 = (__m512 *)
                         (local_160->cstep * (long)local_130 * local_160->elemsize +
                         (long)local_160->data);
              local_150 = (__m512 *)
                          ((long)local_160[1].w * (long)local_130 * local_160[1].elemsize +
                          (long)local_160[1].data);
              puVar71 = (undefined8 *)
                        (this_00->cstep * (long)local_130 * this_00->elemsize + (long)this_00->data)
              ;
              iVar34 = 0;
              while (iVar34 != (int)pafVar54) {
                local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
                local_c0 = *local_150;
                uVar68 = (ulong)pafVar65 & 0xffffffff;
                while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                  uVar109 = *(undefined8 *)*pafVar45;
                  uVar108 = *(undefined8 *)(*pafVar45 + 2);
                  uVar111 = *(undefined8 *)(*pafVar45 + 4);
                  uVar112 = *(undefined8 *)(*pafVar45 + 6);
                  uVar113 = *(undefined8 *)(*pafVar45 + 8);
                  uVar114 = *(undefined8 *)(*pafVar45 + 10);
                  uVar115 = *(undefined8 *)(*pafVar45 + 0xc);
                  uVar116 = *(undefined8 *)(*pafVar45 + 0xe);
                  local_100 = *pafVar45;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                            (&local_161,&local_100,&local_c0);
                  *puVar71 = uVar109;
                  puVar71[1] = uVar108;
                  puVar71[2] = uVar111;
                  puVar71[3] = uVar112;
                  puVar71[4] = uVar113;
                  puVar71[5] = uVar114;
                  puVar71[6] = uVar115;
                  puVar71[7] = uVar116;
                  pafVar45 = pafVar45 + 1;
                  puVar71 = puVar71 + 8;
                }
                local_150 = local_150 + 1;
                pafVar65 = local_158;
                pafVar54 = local_148;
                iVar34 = (uint)local_140 + 1;
              }
            }
          }
          goto switchD_0037877e_default;
        }
        if ((int)local_118 != 1 || a[1].w != 1) {
          iVar38 = (int)local_138;
          local_138 = local_138 & 0xffffffff;
          if (iVar38 < 1) {
            local_138 = 0;
          }
          local_110 = 0;
          local_120 = local_120 & 0xffffffff;
          if (iVar34 < 1) {
            local_120 = 0;
          }
          for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_120;
              local_150 = (__m512 *)((long)local_150 + 1)) {
            lVar66 = a->cstep * a->elemsize * (long)local_150;
            pvVar9 = a->data;
            local_c0 = *(__m512 *)((long)a[1].data + (long)local_150 * 0x40);
            lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
            pvVar69 = this_00->data;
            uVar68 = local_138 & 0xffffffff;
            lVar67 = 0;
            while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
              pafVar65 = (__m512 *)((long)pvVar9 + lVar67 + lVar66);
              uVar109 = *(undefined8 *)*pafVar65;
              uVar108 = *(undefined8 *)(*pafVar65 + 2);
              uVar111 = *(undefined8 *)(*pafVar65 + 4);
              uVar112 = *(undefined8 *)(*pafVar65 + 6);
              uVar113 = *(undefined8 *)(*pafVar65 + 8);
              uVar114 = *(undefined8 *)(*pafVar65 + 10);
              uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
              uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
              local_100 = *pafVar65;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_161,&local_100,&local_c0);
              puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
              *puVar71 = uVar109;
              puVar71[1] = uVar108;
              puVar71[2] = uVar111;
              puVar71[3] = uVar112;
              puVar71[4] = uVar113;
              puVar71[5] = uVar114;
              puVar71[6] = uVar115;
              puVar71[7] = uVar116;
              lVar67 = lVar67 + 0x40;
            }
            a = local_160;
          }
          goto switchD_0037877e_default;
        }
LAB_003818df:
        local_110 = 0xffffffffffffff9c;
        opt = local_130;
LAB_003818ed:
        uVar35 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
                           (a,b,this_00,opt);
        local_110 = (ulong)uVar35;
        goto switchD_0037877e_default;
      }
      uVar37 = uVar62 ^ uVar58;
      if (((uVar44 ^ 1) == 0 && ((uint)local_150 ^ 1) == 0) && uVar37 == 0) {
        local_158 = pafVar65;
        local_148 = pafVar54;
        Mat::create(this_00,uVar57,uVar70,uVar58,local_108,iVar34,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar34 = (int)local_138;
          local_138 = local_138 & 0xffffffff;
          if (iVar34 < 1) {
            local_138 = 0;
          }
          iVar34 = (int)local_120;
          local_110 = 0;
          local_120 = local_120 & 0xffffffff;
          if (iVar34 < 1) {
            local_120 = 0;
          }
          for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_120;
              local_150 = (__m512 *)((long)local_150 + 1)) {
            lVar66 = a->cstep * a->elemsize * (long)local_150;
            pvVar9 = a->data;
            lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
            pvVar69 = this_00->data;
            local_c0 = *(__m512 *)((long)a[1].data + a[1].cstep * (long)local_150 * a[1].elemsize);
            uVar68 = local_138 & 0xffffffff;
            lVar67 = 0;
            while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
              pafVar65 = (__m512 *)((long)pvVar9 + lVar67 + lVar66);
              uVar109 = *(undefined8 *)*pafVar65;
              uVar108 = *(undefined8 *)(*pafVar65 + 2);
              uVar111 = *(undefined8 *)(*pafVar65 + 4);
              uVar112 = *(undefined8 *)(*pafVar65 + 6);
              uVar113 = *(undefined8 *)(*pafVar65 + 8);
              uVar114 = *(undefined8 *)(*pafVar65 + 10);
              uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
              uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
              local_100 = *pafVar65;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_161,&local_100,&local_c0);
              puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
              *puVar71 = uVar109;
              puVar71[1] = uVar108;
              puVar71[2] = uVar111;
              puVar71[3] = uVar112;
              puVar71[4] = uVar113;
              puVar71[5] = uVar114;
              puVar71[6] = uVar115;
              puVar71[7] = uVar116;
              lVar67 = lVar67 + 0x40;
            }
            a = local_160;
          }
        }
        goto switchD_0037877e_default;
      }
      if ((uVar44 == uVar57) && (uVar35 == 1 && (uVar62 == 1 && (uint)local_150 == uVar70))) {
        local_158 = pafVar65;
        local_148 = pafVar54;
        Mat::create(this_00,uVar57,uVar70,uVar58,local_108,iVar34,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar34 = (int)local_138;
          local_138 = local_138 & 0xffffffff;
          if (iVar34 < 1) {
            local_138 = 0;
          }
          iVar34 = (int)local_120;
          local_110 = 0;
          local_120 = local_120 & 0xffffffff;
          if (iVar34 < 1) {
            local_120 = 0;
          }
          for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_120;
              local_150 = (__m512 *)((long)local_150 + 1)) {
            pvVar9 = a[1].data;
            lVar66 = a->cstep * a->elemsize * (long)local_150;
            pvVar69 = a->data;
            lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
            pvVar75 = this_00->data;
            lVar73 = 0;
            for (lVar67 = 0; (int)local_138 != (int)lVar67; lVar67 = lVar67 + 1) {
              local_c0 = *(__m512 *)((long)pvVar69 + lVar73 * 4 + lVar66);
              afVar81 = (__m512)vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar67 * 4)));
              local_100 = afVar81;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_161,&local_c0,&local_100);
              *(__m512 *)((long)pvVar75 + lVar73 * 4 + lVar48) = afVar81;
              lVar73 = lVar73 + 0x10;
            }
            a = local_160;
          }
        }
        goto switchD_0037877e_default;
      }
      if (((uVar57 ^ 1) == 0 && (uVar70 ^ 1) == 0) && uVar37 == 0) {
        local_158 = pafVar65;
        local_148 = pafVar54;
        Mat::create(this_00,uVar44,(uint)local_150,uVar58,sVar60,uVar35,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar34 = (int)local_118;
          local_118 = local_118 & 0xffffffff;
          if (iVar34 < 1) {
            local_118 = 0;
          }
          iVar34 = (int)local_120;
          local_110 = 0;
          local_120 = local_120 & 0xffffffff;
          if (iVar34 < 1) {
            local_120 = 0;
          }
          for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_120;
              local_150 = (__m512 *)((long)local_150 + 1)) {
            lVar66 = a[1].cstep * a[1].elemsize * (long)local_150;
            pvVar9 = a[1].data;
            lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
            pvVar69 = this_00->data;
            local_c0 = *(__m512 *)((long)a->data + a->cstep * (long)local_150 * a->elemsize);
            uVar68 = local_118 & 0xffffffff;
            lVar67 = 0;
            while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
              pafVar65 = (__m512 *)((long)pvVar9 + lVar67 + lVar66);
              uVar109 = *(undefined8 *)*pafVar65;
              uVar108 = *(undefined8 *)(*pafVar65 + 2);
              uVar111 = *(undefined8 *)(*pafVar65 + 4);
              uVar112 = *(undefined8 *)(*pafVar65 + 6);
              uVar113 = *(undefined8 *)(*pafVar65 + 8);
              uVar114 = *(undefined8 *)(*pafVar65 + 10);
              uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
              uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
              local_100 = *pafVar65;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_161,&local_c0,&local_100);
              puVar71 = (undefined8 *)((long)pvVar69 + lVar67 + lVar48);
              *puVar71 = uVar109;
              puVar71[1] = uVar108;
              puVar71[2] = uVar111;
              puVar71[3] = uVar112;
              puVar71[4] = uVar113;
              puVar71[5] = uVar114;
              puVar71[6] = uVar115;
              puVar71[7] = uVar116;
              lVar67 = lVar67 + 0x40;
            }
            a = local_160;
          }
        }
        goto switchD_0037877e_default;
      }
      if ((((uVar44 == uVar57) && (iVar34 == 1)) && ((uint)local_150 == uVar70)) && (uVar58 == 1)) {
        local_158 = pafVar65;
        local_148 = pafVar54;
        Mat::create(this_00,uVar57,uVar70,uVar62,sVar60,uVar35,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar34 = (int)local_118;
          local_118 = local_118 & 0xffffffff;
          if (iVar34 < 1) {
            local_118 = 0;
          }
          iVar34 = (int)local_128;
          local_110 = 0;
          local_128 = local_128 & 0xffffffff;
          if (iVar34 < 1) {
            local_128 = 0;
          }
          for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_128;
              local_150 = (__m512 *)((long)local_150 + 1)) {
            pvVar9 = a->data;
            lVar66 = a[1].cstep * a[1].elemsize * (long)local_150;
            pvVar69 = a[1].data;
            lVar48 = this_00->cstep * this_00->elemsize * (long)local_150;
            pvVar75 = this_00->data;
            lVar67 = 0;
            for (lVar73 = 0; (int)local_118 != (int)lVar73; lVar73 = lVar73 + 1) {
              local_c0 = (__m512)vbroadcastss_avx512f(ZEXT416(*(uint *)((long)pvVar9 + lVar73 * 4)))
              ;
              pafVar65 = (__m512 *)((long)pvVar69 + lVar67 * 4 + lVar66);
              uVar109 = *(undefined8 *)*pafVar65;
              uVar108 = *(undefined8 *)(*pafVar65 + 2);
              uVar111 = *(undefined8 *)(*pafVar65 + 4);
              uVar112 = *(undefined8 *)(*pafVar65 + 6);
              uVar113 = *(undefined8 *)(*pafVar65 + 8);
              uVar114 = *(undefined8 *)(*pafVar65 + 10);
              uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
              uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
              local_100 = *pafVar65;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_161,&local_c0,&local_100);
              puVar71 = (undefined8 *)((long)pvVar75 + lVar67 * 4 + lVar48);
              *puVar71 = uVar109;
              puVar71[1] = uVar108;
              puVar71[2] = uVar111;
              puVar71[3] = uVar112;
              puVar71[4] = uVar113;
              puVar71[5] = uVar114;
              puVar71[6] = uVar115;
              puVar71[7] = uVar116;
              lVar67 = lVar67 + 0x10;
            }
            a = local_160;
          }
        }
        goto switchD_0037877e_default;
      }
      local_118 = (ulong)uVar35;
      if ((((uVar44 ^ 1) == 0 && ((uint)local_150 ^ uVar70) == 0) && uVar37 == 0) && uVar57 != 1) {
        local_158 = pafVar65;
        local_148 = pafVar54;
        Mat::create(this_00,uVar57,uVar70,uVar58,local_108,iVar34,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          pafVar65 = (__m512 *)((ulong)local_158 & 0xffffffff);
          if ((int)local_158 < 1) {
            pafVar65 = (__m512 *)0x0;
          }
          pafVar54 = (__m512 *)((ulong)local_148 & 0xffffffff);
          if ((int)local_148 < 1) {
            pafVar54 = (__m512 *)0x0;
          }
          iVar34 = (int)local_120;
          local_110 = 0;
          local_120 = local_120 & 0xffffffff;
          if (iVar34 < 1) {
            local_120 = 0;
          }
          local_158 = pafVar65;
          local_148 = pafVar54;
          for (local_130 = (Option *)0x0; local_130 != (Option *)local_120;
              local_130 = (Option *)((long)local_130 + 1)) {
            pafVar45 = (__m512 *)
                       (local_160->cstep * (long)local_130 * local_160->elemsize +
                       (long)local_160->data);
            local_140 = (Mat *)(local_160[1].cstep * (long)local_130 * local_160[1].elemsize +
                               (long)local_160[1].data);
            puVar71 = (undefined8 *)
                      (this_00->cstep * (long)local_130 * this_00->elemsize + (long)this_00->data);
            for (local_150 = (__m512 *)0x0; local_150 != pafVar54;
                local_150 = (__m512 *)((long)local_150 + 1)) {
              local_c0 = *(__m512 *)((long)local_140 + (long)local_150 * 0x40);
              uVar68 = (ulong)pafVar65 & 0xffffffff;
              while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                uVar109 = *(undefined8 *)*pafVar45;
                uVar108 = *(undefined8 *)(*pafVar45 + 2);
                uVar111 = *(undefined8 *)(*pafVar45 + 4);
                uVar112 = *(undefined8 *)(*pafVar45 + 6);
                uVar113 = *(undefined8 *)(*pafVar45 + 8);
                uVar114 = *(undefined8 *)(*pafVar45 + 10);
                uVar115 = *(undefined8 *)(*pafVar45 + 0xc);
                uVar116 = *(undefined8 *)(*pafVar45 + 0xe);
                local_100 = *pafVar45;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          (&local_161,&local_100,&local_c0);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                puVar71[4] = uVar113;
                puVar71[5] = uVar114;
                puVar71[6] = uVar115;
                puVar71[7] = uVar116;
                pafVar45 = pafVar45 + 1;
                puVar71 = puVar71 + 8;
              }
              pafVar65 = local_158;
              pafVar54 = local_148;
            }
          }
        }
        goto switchD_0037877e_default;
      }
      if (((((uint)local_150 ^ 1) == 0 && (uVar44 ^ uVar57) == 0) && uVar37 == 0) && uVar70 != 1) {
        local_158 = pafVar65;
        local_148 = pafVar54;
        Mat::create(this_00,uVar57,uVar70,uVar58,local_108,iVar34,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          uVar68 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar68 = 0;
          }
          iVar34 = (int)local_148;
          local_148 = (__m512 *)((ulong)local_148 & 0xffffffff);
          if (iVar34 < 1) {
            local_148 = (__m512 *)0x0;
          }
          iVar34 = (int)local_120;
          local_110 = 0;
          local_120 = local_120 & 0xffffffff;
          if (iVar34 < 1) {
            local_120 = 0;
          }
          for (local_140 = (Mat *)0x0; local_140 != (Mat *)local_120;
              local_140 = (Mat *)((long)local_140 + 1)) {
            pvVar75 = (void *)(local_160->cstep * (long)local_140 * local_160->elemsize +
                              (long)local_160->data);
            pvVar69 = (void *)(this_00->cstep * (long)local_140 * this_00->elemsize +
                              (long)this_00->data);
            lVar48 = local_160[1].cstep * local_160[1].elemsize * (long)local_140;
            pvVar9 = local_160[1].data;
            for (local_150._0_4_ = 0; (uint)local_150 != (int)local_148;
                local_150._0_4_ = (uint)local_150 + 1) {
              for (lVar66 = 0; uVar68 * 0x40 != lVar66; lVar66 = lVar66 + 0x40) {
                local_c0 = *(__m512 *)((long)pvVar75 + lVar66);
                pafVar65 = (__m512 *)((long)pvVar9 + lVar66 + lVar48);
                uVar109 = *(undefined8 *)*pafVar65;
                uVar108 = *(undefined8 *)(*pafVar65 + 2);
                uVar111 = *(undefined8 *)(*pafVar65 + 4);
                uVar112 = *(undefined8 *)(*pafVar65 + 6);
                uVar113 = *(undefined8 *)(*pafVar65 + 8);
                uVar114 = *(undefined8 *)(*pafVar65 + 10);
                uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
                uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
                local_100 = *pafVar65;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          (&local_161,&local_c0,&local_100);
                puVar71 = (undefined8 *)((long)pvVar69 + lVar66);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                puVar71[4] = uVar113;
                puVar71[5] = uVar114;
                puVar71[6] = uVar115;
                puVar71[7] = uVar116;
              }
              pvVar75 = (void *)((long)pvVar75 + lVar66);
              pvVar69 = (void *)((long)pvVar69 + lVar66);
            }
          }
        }
        goto switchD_0037877e_default;
      }
      if ((((uVar57 ^ 1) == 0 && ((uint)local_150 ^ uVar70) == 0) && uVar37 == 0) && uVar44 != 1) {
        local_158 = pafVar65;
        local_148 = pafVar54;
        Mat::create(this_00,uVar44,uVar70,uVar58,sVar60,uVar35,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar34 = (uint)local_140;
          if ((int)(uint)local_140 < 1) {
            iVar34 = 0;
          }
          iVar38 = (int)local_148;
          local_148 = (__m512 *)((ulong)local_148 & 0xffffffff);
          if (iVar38 < 1) {
            local_148 = (__m512 *)0x0;
          }
          iVar38 = (int)local_120;
          local_110 = 0;
          local_120 = local_120 & 0xffffffff;
          if (iVar38 < 1) {
            local_120 = 0;
          }
          local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
          for (local_130 = (Option *)0x0; local_130 != (Option *)local_120;
              local_130 = (Option *)((long)local_130 + 1)) {
            local_158 = (__m512 *)
                        (local_160->cstep * (long)local_130 * local_160->elemsize +
                        (long)local_160->data);
            pafVar65 = (__m512 *)
                       (local_160[1].cstep * (long)local_130 * local_160[1].elemsize +
                       (long)local_160[1].data);
            puVar71 = (undefined8 *)
                      (this_00->cstep * (long)local_130 * this_00->elemsize + (long)this_00->data);
            for (local_150 = (__m512 *)0x0; local_150 != local_148;
                local_150 = (__m512 *)((long)local_150 + 1)) {
              local_c0 = *(__m512 *)((long)local_158 + (long)local_150 * 0x40);
              while (bVar76 = iVar34 != 0, iVar34 = iVar34 + -1, bVar76) {
                uVar109 = *(undefined8 *)*pafVar65;
                uVar108 = *(undefined8 *)(*pafVar65 + 2);
                uVar111 = *(undefined8 *)(*pafVar65 + 4);
                uVar112 = *(undefined8 *)(*pafVar65 + 6);
                uVar113 = *(undefined8 *)(*pafVar65 + 8);
                uVar114 = *(undefined8 *)(*pafVar65 + 10);
                uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
                uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
                local_100 = *pafVar65;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          (&local_161,&local_c0,&local_100);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                puVar71[4] = uVar113;
                puVar71[5] = uVar114;
                puVar71[6] = uVar115;
                puVar71[7] = uVar116;
                pafVar65 = pafVar65 + 1;
                puVar71 = puVar71 + 8;
              }
              iVar34 = (uint)local_140;
            }
          }
        }
        goto switchD_0037877e_default;
      }
      local_158 = pafVar65;
      local_148 = pafVar54;
      if ((((uVar44 ^ uVar57) == 0 && (uVar70 ^ 1) == 0) && uVar37 == 0) && (uint)local_150 != 1) {
        Mat::create(this_00,uVar57,(uint)local_150,uVar58,sVar60,uVar35,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          uVar68 = (ulong)local_158 & 0xffffffff;
          if ((int)local_158 < 1) {
            uVar68 = 0;
          }
          if ((int)(uint)local_150 < 1) {
            local_150._0_4_ = 0;
          }
          iVar34 = (int)local_120;
          local_110 = 0;
          local_120 = local_120 & 0xffffffff;
          if (iVar34 < 1) {
            local_120 = 0;
          }
          for (local_148 = (__m512 *)0x0; local_148 != (__m512 *)local_120;
              local_148 = (__m512 *)((long)local_148 + 1)) {
            pvVar69 = (void *)(local_160[1].cstep * (long)local_148 * local_160[1].elemsize +
                              (long)local_160[1].data);
            pvVar75 = (void *)(this_00->cstep * (long)local_148 * this_00->elemsize +
                              (long)this_00->data);
            lVar48 = local_160->cstep * local_160->elemsize * (long)local_148;
            pvVar9 = local_160->data;
            iVar34 = 0;
            while (iVar34 != (uint)local_150) {
              local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
              for (lVar66 = 0; uVar68 * 0x40 != lVar66; lVar66 = lVar66 + 0x40) {
                local_c0 = *(__m512 *)((long)pvVar9 + lVar66 + lVar48);
                pafVar65 = (__m512 *)((long)pvVar69 + lVar66);
                uVar109 = *(undefined8 *)*pafVar65;
                uVar108 = *(undefined8 *)(*pafVar65 + 2);
                uVar111 = *(undefined8 *)(*pafVar65 + 4);
                uVar112 = *(undefined8 *)(*pafVar65 + 6);
                uVar113 = *(undefined8 *)(*pafVar65 + 8);
                uVar114 = *(undefined8 *)(*pafVar65 + 10);
                uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
                uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
                local_100 = *pafVar65;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          (&local_161,&local_c0,&local_100);
                puVar71 = (undefined8 *)((long)pvVar75 + lVar66);
                *puVar71 = uVar109;
                puVar71[1] = uVar108;
                puVar71[2] = uVar111;
                puVar71[3] = uVar112;
                puVar71[4] = uVar113;
                puVar71[5] = uVar114;
                puVar71[6] = uVar115;
                puVar71[7] = uVar116;
              }
              pvVar69 = (void *)((long)pvVar69 + lVar66);
              pvVar75 = (void *)((long)pvVar75 + lVar66);
              iVar34 = (uint)local_140 + 1;
            }
          }
        }
        goto switchD_0037877e_default;
      }
      break;
    case 4:
      if (a[1].dims != 4) {
        local_118 = (ulong)uVar35;
        local_148 = pafVar54;
        local_130 = opt;
        Mat::create(this_00,uVar57,uVar70,iVar38,uVar58,local_108,iVar34,opt->blob_allocator);
        local_110 = 0xffffffffffffff9c;
        if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
        goto switchD_0037877e_default;
        iVar34 = a[1].dims;
        iVar41 = (int)local_120;
        if (iVar34 != 1) {
          if (iVar34 == 3) {
            if ((int)uVar57 < 1) {
              pafVar65 = (__m512 *)0x0;
            }
            pafVar54 = (__m512 *)((ulong)local_148 & 0xffffffff);
            if ((int)local_148 < 1) {
              pafVar54 = (__m512 *)0x0;
            }
            if (iVar38 < 1) {
              iVar38 = 0;
            }
            local_138 = CONCAT44(local_138._4_4_,iVar38);
            local_110 = 0;
            local_120 = local_120 & 0xffffffff;
            if (iVar41 < 1) {
              local_120 = 0;
            }
            local_158 = pafVar65;
            local_148 = pafVar54;
            for (local_128 = 0; local_128 != local_120; local_128 = local_128 + 1) {
              pafVar45 = (__m512 *)
                         (local_160->cstep * local_128 * local_160->elemsize + (long)local_160->data
                         );
              local_150 = (__m512 *)
                          (local_160[1].cstep * local_128 * local_160[1].elemsize +
                          (long)local_160[1].data);
              puVar71 = (undefined8 *)
                        (this_00->cstep * local_128 * this_00->elemsize + (long)this_00->data);
              for (iVar34 = 0; iVar34 != (int)local_138; iVar34 = iVar34 + 1) {
                local_130 = (Option *)CONCAT44(local_130._4_4_,iVar34);
                iVar38 = 0;
                while (iVar38 != (int)pafVar54) {
                  local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar38);
                  local_c0 = *local_150;
                  uVar68 = (ulong)pafVar65 & 0xffffffff;
                  while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                    uVar109 = *(undefined8 *)*pafVar45;
                    uVar108 = *(undefined8 *)(*pafVar45 + 2);
                    uVar111 = *(undefined8 *)(*pafVar45 + 4);
                    uVar112 = *(undefined8 *)(*pafVar45 + 6);
                    uVar113 = *(undefined8 *)(*pafVar45 + 8);
                    uVar114 = *(undefined8 *)(*pafVar45 + 10);
                    uVar115 = *(undefined8 *)(*pafVar45 + 0xc);
                    uVar116 = *(undefined8 *)(*pafVar45 + 0xe);
                    local_100 = *pafVar45;
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              (&local_161,&local_100,&local_c0);
                    *puVar71 = uVar109;
                    puVar71[1] = uVar108;
                    puVar71[2] = uVar111;
                    puVar71[3] = uVar112;
                    puVar71[4] = uVar113;
                    puVar71[5] = uVar114;
                    puVar71[6] = uVar115;
                    puVar71[7] = uVar116;
                    pafVar45 = pafVar45 + 1;
                    puVar71 = puVar71 + 8;
                  }
                  local_150 = local_150 + 1;
                  pafVar65 = local_158;
                  pafVar54 = local_148;
                  iVar34 = (uint)local_130;
                  iVar38 = (uint)local_140 + 1;
                }
              }
            }
          }
          else {
            local_110 = 0;
            if (iVar34 == 2) {
              if ((int)uVar57 < 1) {
                pafVar65 = (__m512 *)0x0;
              }
              pafVar54 = (__m512 *)((ulong)local_148 & 0xffffffff);
              if ((int)local_148 < 1) {
                pafVar54 = (__m512 *)0x0;
              }
              if (iVar38 < 1) {
                iVar38 = 0;
              }
              local_138 = CONCAT44(local_138._4_4_,iVar38);
              local_110 = 0;
              local_120 = local_120 & 0xffffffff;
              if (iVar41 < 1) {
                local_120 = 0;
              }
              local_158 = pafVar65;
              local_148 = pafVar54;
              for (local_128 = 0; local_128 != local_120; local_128 = local_128 + 1) {
                pafVar45 = (__m512 *)
                           (local_160->cstep * local_128 * local_160->elemsize +
                           (long)local_160->data);
                local_130 = (Option *)
                            ((long)local_160[1].w * local_128 * local_160[1].elemsize +
                            (long)local_160[1].data);
                puVar71 = (undefined8 *)
                          (this_00->cstep * local_128 * this_00->elemsize + (long)this_00->data);
                for (iVar34 = 0; iVar34 != (int)local_138; iVar34 = iVar34 + 1) {
                  local_c0 = *(__m512 *)local_130;
                  local_140 = (Mat *)CONCAT44(local_140._4_4_,iVar34);
                  for (local_150._0_4_ = 0; (uint)local_150 != (int)pafVar54;
                      local_150._0_4_ = (uint)local_150 + 1) {
                    uVar68 = (ulong)pafVar65 & 0xffffffff;
                    while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
                      uVar109 = *(undefined8 *)*pafVar45;
                      uVar108 = *(undefined8 *)(*pafVar45 + 2);
                      uVar111 = *(undefined8 *)(*pafVar45 + 4);
                      uVar112 = *(undefined8 *)(*pafVar45 + 6);
                      uVar113 = *(undefined8 *)(*pafVar45 + 8);
                      uVar114 = *(undefined8 *)(*pafVar45 + 10);
                      uVar115 = *(undefined8 *)(*pafVar45 + 0xc);
                      uVar116 = *(undefined8 *)(*pafVar45 + 0xe);
                      local_100 = *pafVar45;
                      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                                (&local_161,&local_100,&local_c0);
                      *puVar71 = uVar109;
                      puVar71[1] = uVar108;
                      puVar71[2] = uVar111;
                      puVar71[3] = uVar112;
                      puVar71[4] = uVar113;
                      puVar71[5] = uVar114;
                      puVar71[6] = uVar115;
                      puVar71[7] = uVar116;
                      pafVar45 = pafVar45 + 1;
                      puVar71 = puVar71 + 8;
                    }
                    pafVar65 = local_158;
                    pafVar54 = local_148;
                    iVar34 = (uint)local_140;
                  }
                  local_130 = (Option *)((__m512 *)local_130 + 1);
                }
              }
            }
          }
          goto switchD_0037877e_default;
        }
        if ((int)local_118 != 1 || a[1].w != 1) {
          iVar34 = (int)local_138;
          local_138 = local_138 & 0xffffffff;
          if (iVar34 < 1) {
            local_138 = 0;
          }
          local_110 = 0;
          local_120 = local_120 & 0xffffffff;
          if (iVar41 < 1) {
            local_120 = 0;
          }
          for (local_150 = (__m512 *)0x0; local_150 != (__m512 *)local_120;
              local_150 = (__m512 *)((long)local_150 + 1)) {
            lVar67 = a->cstep * a->elemsize * (long)local_150;
            pvVar9 = a->data;
            local_c0 = *(__m512 *)((long)a[1].data + (long)local_150 * 0x40);
            lVar66 = this_00->cstep * this_00->elemsize * (long)local_150;
            pvVar69 = this_00->data;
            lVar48 = 0;
            uVar68 = local_138 & 0xffffffff;
            while (iVar34 = (int)uVar68, uVar68 = (ulong)(iVar34 - 1), iVar34 != 0) {
              pafVar65 = (__m512 *)((long)pvVar9 + lVar48 + lVar67);
              uVar109 = *(undefined8 *)*pafVar65;
              uVar108 = *(undefined8 *)(*pafVar65 + 2);
              uVar111 = *(undefined8 *)(*pafVar65 + 4);
              uVar112 = *(undefined8 *)(*pafVar65 + 6);
              uVar113 = *(undefined8 *)(*pafVar65 + 8);
              uVar114 = *(undefined8 *)(*pafVar65 + 10);
              uVar115 = *(undefined8 *)(*pafVar65 + 0xc);
              uVar116 = *(undefined8 *)(*pafVar65 + 0xe);
              local_100 = *pafVar65;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                        (&local_161,&local_100,&local_c0);
              puVar71 = (undefined8 *)((long)pvVar69 + lVar48 + lVar66);
              *puVar71 = uVar109;
              puVar71[1] = uVar108;
              puVar71[2] = uVar111;
              puVar71[3] = uVar112;
              puVar71[4] = uVar113;
              puVar71[5] = uVar114;
              puVar71[6] = uVar115;
              puVar71[7] = uVar116;
              lVar48 = lVar48 + 0x40;
            }
            a = local_160;
          }
          goto switchD_0037877e_default;
        }
        goto LAB_003818df;
      }
    }
    local_110 = 0;
    uVar35 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>(a,b,this_00,opt)
    ;
    local_110 = (ulong)uVar35;
switchD_0037877e_default:
    return (int)local_110;
  case 7:
    pMVar49 = a;
    break;
  case 8:
    pMVar49 = a;
LAB_00375d96:
    iVar34 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
                       (b,pMVar49,this_00,opt);
    return iVar34;
  default:
    goto switchD_0037553d_default;
  }
  iVar34 = binary_op_pack16<ncnn::BinaryOp_x86_avx512_functor::binary_op_sub>(b,pMVar49,this_00,opt)
  ;
  return iVar34;
switchD_0037ca62_caseD_1:
  Mat::create(this_00,uVar57,sVar60,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (uVar35 != 1 || local_160[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
              (local_160,local_140,this_00,opt);
    return 0;
  }
  goto LAB_003858c6;
switchD_0037c3a0_caseD_1:
  Mat::create(this_00,uVar57,sVar60,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (uVar35 != 1 || local_160[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
              (local_160,local_140,this_00,opt);
    return 0;
  }
  goto LAB_00385589;
switchD_0037c555_caseD_1:
  Mat::create(this_00,uVar57,sVar60,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (uVar35 != 1 || local_160[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
              (local_160,local_140,this_00,opt);
    return 0;
  }
  goto LAB_0038571c;
switchD_003755f6_caseD_1:
  Mat::create(this_00,uVar57,sVar60,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (uVar35 != 1 || local_160[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
              (local_160,local_140,this_00,opt);
    return 0;
  }
  goto LAB_00385822;
switchD_00375c4c_caseD_1:
  local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
  Mat::create(this_00,uVar57,sVar60,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (uVar35 != 1 || local_160[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
              (local_160,local_140,this_00,opt);
    return 0;
  }
LAB_003858c6:
  iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
                     (local_160,local_140,this_00,opt);
  return iVar34;
switchD_00375993_caseD_1:
  local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
  Mat::create(this_00,uVar57,sVar60,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (uVar35 != 1 || local_160[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
              (local_160,local_140,this_00,opt);
    return 0;
  }
LAB_00385589:
  iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
                     (local_160,local_140,this_00,opt);
  return iVar34;
switchD_00375adb_caseD_1:
  local_150 = (__m512 *)CONCAT44(local_150._4_4_,iVar34);
  Mat::create(this_00,uVar57,sVar60,iVar34,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (uVar35 != 1 || local_160[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
              (local_160,local_140,this_00,opt);
    return 0;
  }
LAB_0038571c:
  iVar34 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
                     (local_160,local_140,this_00,opt);
  return iVar34;
}

Assistant:

int BinaryOp_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    using namespace BinaryOp_x86_avx512_functor;

    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16 || elempack1 == 16)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack16<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack16<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack16<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack16<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack16<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack16<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack16<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX512F__

    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}